

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar48;
  ulong uVar49;
  bool bVar50;
  float *pfVar51;
  float *pfVar52;
  long in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long *in_RDI;
  int iVar53;
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar63;
  ulong uVar61;
  ulong uVar62;
  float fVar64;
  float fVar67;
  ulong uVar65;
  ulong uVar66;
  float wt;
  float val;
  int k_3;
  float *sptr_3;
  int q_3;
  float *kptr_3;
  float sum_1;
  int j_3;
  float *outptr_3;
  int p_3;
  __m128 _s4;
  __m128 _w_1;
  __m128 _val_1;
  int k_2;
  float *sptr_2;
  int q_2;
  float *kptr_2;
  float sum;
  int j_2;
  float *outptr_2;
  int p_2;
  __m128 _w;
  __m128 _val;
  int k_1;
  float *sptr_1;
  int q_1;
  float *kptr_1;
  __m128 _sum_1;
  int j_1;
  float *outptr_1;
  int p_1;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  int k;
  float *sptr;
  int q;
  float *kptr;
  __m128 _sum;
  int j;
  float *outptr;
  int p;
  int outh;
  int outw;
  size_t out_elemsize;
  int out_elempack;
  Mat bottom_blob_bordered;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int h;
  int w;
  __m128 _b_1;
  __m128 _a_1;
  __m128 max_1;
  __m128 min_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 x32;
  __m128 x64;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_3;
  float min_3;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max_2;
  float min_2;
  float slope;
  __m128 neg;
  __m128 pos;
  __m128 neg_1;
  __m128 pos_1;
  __m128 one;
  __m128 one_8;
  __m128 one_7;
  __m128 one_15;
  v4sf pow2n_4;
  v4sf y_5;
  v4sf z_5;
  v4sf mask_5;
  v4sf one_10;
  v4si emm0_5;
  v4sf fx_4;
  v4sf tmp_5;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf z_1;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n_3;
  v4sf y_4;
  v4sf z_4;
  v4sf mask_4;
  v4sf one_9;
  v4si emm0_4;
  v4sf fx_3;
  v4sf tmp_4;
  v4sf pow2n;
  v4sf y;
  v4sf z;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two_1;
  __m128 one_12;
  __m128 one_13;
  v4sf pow2n_5;
  v4sf y_7;
  v4sf z_7;
  v4sf mask_7;
  v4sf one_14;
  v4si emm0_7;
  v4sf fx_5;
  v4sf tmp_7;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_6;
  v4sf z_6;
  v4sf tmp_6;
  v4sf mask_6;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_11;
  v4si emm0_6;
  v4sf y_2;
  v4sf z_2;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  Option *in_stack_ffffffffffffc298;
  undefined4 in_stack_ffffffffffffc2a0;
  undefined4 in_stack_ffffffffffffc2a4;
  undefined4 in_stack_ffffffffffffc2a8;
  int in_stack_ffffffffffffc2ac;
  Convolution1D *in_stack_ffffffffffffc2b0;
  undefined8 in_stack_ffffffffffffc2b8;
  Mat *in_stack_ffffffffffffc2c0;
  Mat *in_stack_ffffffffffffc2c8;
  float local_3d1c;
  int local_391c;
  float *local_3918;
  int local_390c;
  float *local_3908;
  float local_3900;
  int local_38fc;
  int local_38ec;
  int local_38b4;
  float *local_38b0;
  int local_38a4;
  Mat local_38a0;
  float *local_3858;
  float local_3850;
  int local_384c;
  float *local_3848;
  int local_383c;
  undefined8 local_3838;
  undefined8 uStack_3830;
  undefined8 local_3828;
  undefined8 uStack_3820;
  int local_380c;
  float *local_3808;
  int local_37fc;
  Mat local_37f8;
  float *local_37b0;
  undefined8 local_37a8;
  undefined8 uStack_37a0;
  int local_378c;
  float *local_3788;
  int local_377c;
  undefined8 local_3778;
  undefined8 uStack_3770;
  undefined8 local_3768;
  undefined8 uStack_3760;
  undefined8 local_3758;
  undefined8 uStack_3750;
  undefined8 local_3748;
  undefined8 uStack_3740;
  undefined8 local_3738;
  undefined8 uStack_3730;
  undefined8 local_3728;
  undefined8 uStack_3720;
  undefined8 local_3718;
  undefined8 uStack_3710;
  undefined8 local_3708;
  undefined8 uStack_3700;
  int local_36ec;
  float *local_36e8;
  int local_36dc;
  Mat local_36d8;
  float *local_3690;
  undefined8 local_3688;
  undefined8 uStack_3680;
  int local_366c;
  float *local_3668;
  int local_365c;
  int local_3658;
  int local_3654;
  long local_3650;
  int local_3644;
  undefined4 local_3640;
  Mat local_3630;
  int local_35e8;
  int local_35e4;
  ulong local_35e0;
  int local_35d8;
  int local_35d4;
  long local_35d0;
  Mat *local_35c8;
  int local_35ac;
  float local_35a8;
  float fStack_35a4;
  float fStack_35a0;
  float fStack_359c;
  float local_3598;
  undefined4 local_3588;
  undefined4 uStack_3584;
  undefined4 uStack_3580;
  undefined4 uStack_357c;
  undefined4 local_3578;
  float local_3568;
  float fStack_3564;
  float fStack_3560;
  float fStack_355c;
  float local_3558;
  float local_3548;
  float fStack_3544;
  float fStack_3540;
  float fStack_353c;
  float local_3538;
  float local_3528;
  float fStack_3524;
  float fStack_3520;
  float fStack_351c;
  float local_3518;
  float local_3508;
  float fStack_3504;
  float fStack_3500;
  float fStack_34fc;
  float local_34f8;
  undefined4 local_34e8;
  undefined4 uStack_34e4;
  undefined4 uStack_34e0;
  undefined4 uStack_34dc;
  undefined4 local_34d8;
  float *pfStack_34d0;
  float *local_34c8;
  float *local_34c0;
  float *local_34b8;
  float *local_34b0;
  float *local_34a8;
  float *local_34a0;
  float *local_3498;
  float *local_3490;
  undefined8 local_3488;
  undefined8 uStack_3480;
  undefined1 local_3478 [16];
  undefined8 local_3468;
  undefined8 uStack_3460;
  undefined1 local_3458 [16];
  undefined8 local_3448;
  undefined8 uStack_3440;
  undefined8 local_3438;
  undefined8 uStack_3430;
  undefined8 local_3428;
  undefined8 uStack_3420;
  undefined8 local_3418;
  undefined8 uStack_3410;
  undefined8 local_3408;
  undefined8 uStack_3400;
  undefined8 local_33f8;
  undefined8 uStack_33f0;
  undefined8 local_33e8;
  undefined8 uStack_33e0;
  undefined8 local_33d8;
  undefined8 uStack_33d0;
  undefined8 local_33c8;
  undefined8 uStack_33c0;
  undefined8 local_33b8;
  undefined8 uStack_33b0;
  undefined8 local_33a8;
  undefined8 uStack_33a0;
  undefined8 local_3398;
  undefined8 uStack_3390;
  undefined8 local_3388;
  undefined8 uStack_3380;
  undefined8 local_3378;
  undefined8 uStack_3370;
  undefined8 local_3368;
  undefined8 uStack_3360;
  undefined8 local_3358;
  undefined8 uStack_3350;
  undefined8 local_3348;
  undefined8 uStack_3340;
  undefined8 local_3338;
  undefined8 uStack_3330;
  undefined8 local_3328;
  undefined8 uStack_3320;
  undefined8 local_3318;
  undefined8 uStack_3310;
  undefined8 local_3308;
  undefined8 uStack_3300;
  undefined8 local_32f8;
  undefined8 uStack_32f0;
  Mat *local_32e8;
  undefined4 local_32dc;
  undefined8 local_32d8;
  undefined8 uStack_32d0;
  undefined1 local_32c8 [8];
  undefined8 uStack_32c0;
  float local_32b8;
  float fStack_32b4;
  float fStack_32b0;
  float fStack_32ac;
  float local_329c;
  float local_3298;
  float fStack_3294;
  float fStack_3290;
  float fStack_328c;
  float local_327c;
  float local_3278;
  float fStack_3274;
  float fStack_3270;
  float fStack_326c;
  float local_3268;
  float local_3258;
  float fStack_3254;
  float fStack_3250;
  float fStack_324c;
  float local_323c;
  undefined8 local_3238;
  undefined8 uStack_3230;
  undefined8 local_3228;
  undefined8 uStack_3220;
  undefined8 local_3218;
  undefined8 uStack_3210;
  undefined8 local_3208;
  undefined8 uStack_3200;
  Mat *local_31f8;
  undefined4 local_31ec;
  undefined8 local_31e8;
  undefined8 uStack_31e0;
  undefined1 local_31d8 [8];
  undefined8 uStack_31d0;
  float local_31c8;
  float fStack_31c4;
  float fStack_31c0;
  float fStack_31bc;
  float local_31ac;
  float local_31a8;
  float fStack_31a4;
  float fStack_31a0;
  float fStack_319c;
  float local_318c;
  float local_3188;
  float fStack_3184;
  float fStack_3180;
  float fStack_317c;
  float local_3178;
  float local_3168;
  float fStack_3164;
  float fStack_3160;
  float fStack_315c;
  float local_314c;
  undefined8 local_3148;
  undefined8 uStack_3140;
  float *local_3130;
  undefined8 local_3128;
  undefined8 uStack_3120;
  float *local_3110;
  undefined8 local_3108;
  undefined8 uStack_3100;
  float local_30f8;
  float fStack_30f4;
  float fStack_30f0;
  float fStack_30ec;
  undefined8 local_30e8;
  undefined8 uStack_30e0;
  undefined8 local_30d8;
  undefined8 uStack_30d0;
  undefined8 local_30c8;
  undefined8 uStack_30c0;
  float local_30b4;
  float local_30b0;
  float local_30ac;
  float local_30a8;
  float local_30a4;
  float local_30a0;
  float local_309c;
  Mat *local_3098;
  undefined4 local_308c;
  float local_3088;
  float local_3084;
  float local_3080;
  float local_307c;
  float local_3078;
  float local_3074;
  float local_3070;
  float local_306c;
  Mat *local_3068;
  undefined4 local_3060;
  float local_305c;
  undefined8 local_3058;
  undefined8 uStack_3050;
  undefined8 local_3048;
  undefined8 uStack_3040;
  undefined8 local_3038;
  undefined8 uStack_3030;
  undefined8 local_3028;
  undefined8 uStack_3020;
  undefined8 local_3018;
  undefined8 uStack_3010;
  undefined8 local_3008;
  undefined8 uStack_3000;
  undefined8 local_2ff8;
  undefined8 uStack_2ff0;
  undefined8 local_2fe8;
  undefined8 uStack_2fe0;
  undefined8 local_2fd8;
  undefined8 uStack_2fd0;
  undefined8 local_2fc8;
  undefined8 uStack_2fc0;
  undefined1 local_2fb8 [16];
  undefined1 local_2fa8 [16];
  float local_2f8c;
  undefined8 local_2f88;
  undefined8 uStack_2f80;
  float local_2f78;
  float fStack_2f74;
  float fStack_2f70;
  float fStack_2f6c;
  float local_2f68;
  float local_2f58;
  float fStack_2f54;
  float fStack_2f50;
  float fStack_2f4c;
  undefined1 local_2f48 [8];
  float fStack_2f40;
  float fStack_2f3c;
  undefined8 local_2f38;
  undefined8 uStack_2f30;
  undefined8 local_2f28;
  undefined8 uStack_2f20;
  undefined8 local_2f18;
  undefined8 uStack_2f10;
  undefined8 local_2f08;
  undefined8 uStack_2f00;
  undefined8 local_2ef8;
  undefined8 uStack_2ef0;
  undefined8 local_2ee8;
  undefined8 uStack_2ee0;
  undefined1 local_2ed8 [16];
  undefined1 local_2ec8 [16];
  float local_2eac;
  undefined8 local_2ea8;
  undefined8 uStack_2ea0;
  float local_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  float local_2e88;
  float local_2e78;
  float fStack_2e74;
  float fStack_2e70;
  float fStack_2e6c;
  undefined1 local_2e68 [8];
  float fStack_2e60;
  float fStack_2e5c;
  undefined8 local_2e58;
  undefined8 uStack_2e50;
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  undefined8 local_2e38;
  undefined8 uStack_2e30;
  undefined8 local_2e28;
  undefined8 uStack_2e20;
  undefined8 local_2e18;
  undefined8 uStack_2e10;
  undefined8 local_2e08;
  undefined8 uStack_2e00;
  undefined8 local_2df8;
  undefined8 uStack_2df0;
  undefined8 local_2de8;
  undefined8 uStack_2de0;
  undefined8 local_2dd8;
  undefined8 uStack_2dd0;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  undefined8 local_2db8;
  undefined8 uStack_2db0;
  undefined1 local_2da8 [16];
  undefined8 local_2d98;
  undefined8 uStack_2d90;
  undefined1 local_2d88 [16];
  undefined8 local_2d78;
  undefined8 uStack_2d70;
  undefined8 local_2d68;
  undefined8 uStack_2d60;
  undefined4 local_2d58;
  undefined4 uStack_2d54;
  undefined4 uStack_2d50;
  undefined4 uStack_2d4c;
  undefined4 local_2d3c;
  undefined8 local_2d38;
  undefined8 uStack_2d30;
  undefined8 local_2d28;
  undefined8 uStack_2d20;
  undefined8 local_2d18;
  undefined8 uStack_2d10;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  undefined8 local_2cf8;
  undefined8 uStack_2cf0;
  undefined4 local_2ce8;
  undefined4 uStack_2ce4;
  undefined4 uStack_2ce0;
  undefined4 uStack_2cdc;
  undefined4 local_2ccc;
  undefined8 local_2cc8;
  undefined8 uStack_2cc0;
  undefined8 local_2cb8;
  undefined8 uStack_2cb0;
  undefined8 local_2ca8;
  undefined8 uStack_2ca0;
  undefined8 local_2c98;
  undefined8 uStack_2c90;
  undefined4 local_2c88;
  undefined4 uStack_2c84;
  undefined4 uStack_2c80;
  undefined4 uStack_2c7c;
  undefined4 local_2c6c;
  undefined8 local_2c68;
  undefined8 uStack_2c60;
  undefined8 local_2c58;
  undefined8 uStack_2c50;
  undefined8 local_2c48;
  undefined8 uStack_2c40;
  undefined1 local_2c38 [16];
  undefined8 local_2c28;
  undefined8 uStack_2c20;
  undefined4 local_2c18;
  undefined4 uStack_2c14;
  undefined4 uStack_2c10;
  undefined4 uStack_2c0c;
  undefined4 local_2bfc;
  undefined8 local_2bf8;
  undefined8 uStack_2bf0;
  undefined8 local_2be8;
  undefined8 uStack_2be0;
  undefined8 local_2bd8;
  undefined8 uStack_2bd0;
  undefined1 local_2bc8 [16];
  undefined8 local_2bb8;
  undefined8 uStack_2bb0;
  undefined1 local_2ba8 [8];
  undefined8 uStack_2ba0;
  undefined8 local_2b98;
  undefined8 uStack_2b90;
  undefined8 local_2b88;
  undefined8 uStack_2b80;
  undefined4 local_2b78;
  undefined4 uStack_2b74;
  undefined4 uStack_2b70;
  undefined4 uStack_2b6c;
  undefined4 local_2b5c;
  undefined8 local_2b58;
  undefined8 uStack_2b50;
  float local_2b48;
  float fStack_2b44;
  float fStack_2b40;
  float fStack_2b3c;
  undefined8 local_2b38;
  undefined8 uStack_2b30;
  undefined1 local_2b28 [8];
  float fStack_2b20;
  float fStack_2b1c;
  undefined8 local_2b18;
  undefined8 uStack_2b10;
  undefined8 local_2b08;
  undefined8 uStack_2b00;
  undefined8 local_2af8;
  undefined8 uStack_2af0;
  undefined8 local_2ae8;
  undefined8 uStack_2ae0;
  undefined8 local_2ad8;
  undefined8 uStack_2ad0;
  undefined8 local_2ac8;
  undefined8 uStack_2ac0;
  undefined8 local_2ab8;
  undefined8 uStack_2ab0;
  undefined8 local_2aa8;
  undefined8 uStack_2aa0;
  undefined1 local_2a98 [8];
  undefined8 uStack_2a90;
  undefined8 local_2a88;
  undefined8 uStack_2a80;
  undefined8 local_2a78;
  undefined8 uStack_2a70;
  undefined4 local_2a68;
  undefined4 uStack_2a64;
  undefined4 uStack_2a60;
  undefined4 uStack_2a5c;
  undefined4 local_2a4c;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  float local_2a38;
  float fStack_2a34;
  float fStack_2a30;
  float fStack_2a2c;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  undefined1 local_2a18 [8];
  float fStack_2a10;
  float fStack_2a0c;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined8 local_29f8;
  undefined8 uStack_29f0;
  undefined8 local_29e8;
  undefined8 uStack_29e0;
  undefined8 local_29d8;
  undefined8 uStack_29d0;
  undefined8 local_29c8;
  undefined8 uStack_29c0;
  undefined8 local_29b8;
  undefined8 uStack_29b0;
  undefined8 local_29a8;
  undefined8 uStack_29a0;
  float local_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  undefined1 local_2988 [16];
  float local_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  undefined1 local_2968 [16];
  undefined8 local_2958;
  undefined8 uStack_2950;
  undefined8 local_2948;
  undefined8 uStack_2940;
  float local_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  undefined8 local_2928;
  undefined8 uStack_2920;
  undefined8 local_2918;
  undefined8 uStack_2910;
  float local_2908;
  float fStack_2904;
  float fStack_2900;
  float fStack_28fc;
  float local_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  undefined8 local_28e8;
  undefined8 uStack_28e0;
  undefined8 local_28d8;
  undefined8 uStack_28d0;
  undefined8 local_28c8;
  undefined8 uStack_28c0;
  undefined8 local_28b8;
  undefined8 uStack_28b0;
  undefined8 local_28a8;
  undefined8 uStack_28a0;
  undefined8 local_2898;
  undefined8 uStack_2890;
  undefined8 local_2888;
  undefined8 uStack_2880;
  undefined8 local_2878;
  undefined8 uStack_2870;
  undefined8 local_2868;
  undefined8 uStack_2860;
  undefined8 local_2858;
  undefined8 uStack_2850;
  undefined8 local_2848;
  undefined8 uStack_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  undefined8 local_2828;
  undefined8 uStack_2820;
  undefined8 local_2818;
  undefined8 uStack_2810;
  undefined8 local_2808;
  undefined8 uStack_2800;
  undefined8 local_27f8;
  undefined8 uStack_27f0;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  undefined8 local_27a8;
  undefined8 uStack_27a0;
  undefined8 local_2798;
  undefined8 uStack_2790;
  undefined8 local_2788;
  undefined8 uStack_2780;
  undefined8 local_2778;
  undefined8 uStack_2770;
  undefined8 local_2768;
  undefined8 uStack_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  undefined8 local_2748;
  undefined8 uStack_2740;
  undefined8 local_2738;
  undefined8 uStack_2730;
  undefined8 local_2728;
  undefined8 uStack_2720;
  undefined8 local_2718;
  undefined8 uStack_2710;
  undefined8 local_2708;
  undefined8 uStack_2700;
  undefined8 local_26f8;
  undefined8 uStack_26f0;
  undefined8 local_26e8;
  undefined8 uStack_26e0;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  undefined8 local_26b8;
  undefined8 uStack_26b0;
  undefined8 local_26a8;
  undefined8 uStack_26a0;
  undefined8 local_2698;
  undefined8 uStack_2690;
  undefined8 local_2688;
  undefined8 uStack_2680;
  undefined8 local_2678;
  undefined8 uStack_2670;
  undefined8 local_2668;
  undefined8 uStack_2660;
  undefined8 local_2658;
  undefined8 uStack_2650;
  undefined8 local_2648;
  undefined8 uStack_2640;
  undefined8 local_2638;
  undefined8 uStack_2630;
  undefined8 local_2628;
  undefined8 uStack_2620;
  undefined8 local_2618;
  undefined8 uStack_2610;
  undefined8 local_2608;
  undefined8 uStack_2600;
  float local_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  undefined8 local_25e8;
  undefined8 uStack_25e0;
  undefined8 local_25d8;
  undefined8 uStack_25d0;
  float local_25c8;
  float fStack_25c4;
  float fStack_25c0;
  float fStack_25bc;
  float local_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  undefined8 local_25a8;
  undefined8 uStack_25a0;
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined8 local_2588;
  undefined8 uStack_2580;
  undefined8 local_2578;
  undefined8 uStack_2570;
  undefined8 local_2568;
  undefined8 uStack_2560;
  undefined8 local_2558;
  undefined8 uStack_2550;
  undefined8 local_2548;
  undefined8 uStack_2540;
  undefined8 local_2538;
  undefined8 uStack_2530;
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined8 local_2518;
  undefined8 uStack_2510;
  undefined8 local_2508;
  undefined8 uStack_2500;
  undefined8 local_24f8;
  undefined8 uStack_24f0;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  undefined8 local_24d8;
  undefined8 uStack_24d0;
  undefined8 local_24c8;
  undefined8 uStack_24c0;
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  undefined8 local_24a8;
  undefined8 uStack_24a0;
  undefined8 local_2498;
  undefined8 uStack_2490;
  undefined8 local_2488;
  undefined8 uStack_2480;
  undefined8 local_2478;
  undefined8 uStack_2470;
  undefined8 local_2468;
  undefined8 uStack_2460;
  undefined8 local_2458;
  undefined8 uStack_2450;
  undefined8 local_2448;
  undefined8 uStack_2440;
  undefined8 local_2438;
  undefined8 uStack_2430;
  undefined8 local_2428;
  undefined8 uStack_2420;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined8 local_23f8;
  undefined8 uStack_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined8 local_23b8;
  undefined8 uStack_23b0;
  undefined8 local_23a8;
  undefined8 uStack_23a0;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2388;
  undefined8 uStack_2380;
  undefined8 local_2378;
  undefined8 uStack_2370;
  undefined8 local_2368;
  undefined8 uStack_2360;
  undefined8 local_2358;
  undefined8 uStack_2350;
  undefined8 local_2348;
  undefined8 uStack_2340;
  undefined8 local_2338;
  undefined8 uStack_2330;
  undefined8 local_2328;
  undefined8 uStack_2320;
  undefined8 local_2318;
  undefined8 uStack_2310;
  undefined8 local_2308;
  undefined8 uStack_2300;
  undefined8 local_22f8;
  undefined8 uStack_22f0;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  undefined8 local_22d8;
  undefined8 uStack_22d0;
  undefined8 local_22c8;
  undefined8 uStack_22c0;
  float local_22b8;
  float fStack_22b4;
  float fStack_22b0;
  float fStack_22ac;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  undefined8 local_2298;
  undefined8 uStack_2290;
  float local_2288;
  float fStack_2284;
  float fStack_2280;
  float fStack_227c;
  float local_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined8 local_2258;
  undefined8 uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined8 local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined8 local_2118;
  undefined8 uStack_2110;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 local_20c8;
  undefined8 uStack_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  undefined8 local_2098;
  undefined8 uStack_2090;
  undefined8 local_2088;
  undefined8 uStack_2080;
  undefined8 local_2078;
  undefined8 uStack_2070;
  undefined8 local_2068;
  undefined8 uStack_2060;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined8 local_2048;
  undefined8 uStack_2040;
  undefined8 local_2038;
  undefined8 uStack_2030;
  undefined8 local_2028;
  undefined8 uStack_2020;
  undefined8 local_2018;
  undefined8 uStack_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  undefined8 local_1fe8;
  undefined8 uStack_1fe0;
  undefined8 local_1fd8;
  undefined8 uStack_1fd0;
  undefined8 local_1fc8;
  undefined8 uStack_1fc0;
  undefined8 local_1fb8;
  undefined8 uStack_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  float local_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  float local_1f48;
  float fStack_1f44;
  float fStack_1f40;
  float fStack_1f3c;
  float local_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  ulong local_1948;
  ulong uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  ulong local_1928;
  ulong uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  ulong local_1908;
  ulong uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  ulong local_18e8;
  ulong uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined4 local_184c;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined4 local_182c;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined4 local_180c;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined4 local_17ec;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  ulong local_1778;
  ulong uStack_1770;
  undefined4 local_1768;
  undefined4 uStack_1764;
  undefined4 uStack_1760;
  undefined4 uStack_175c;
  undefined4 local_174c;
  undefined4 local_1748;
  undefined4 uStack_1744;
  undefined4 uStack_1740;
  undefined4 uStack_173c;
  undefined4 local_172c;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined1 local_1718 [8];
  float fStack_1710;
  float fStack_170c;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  float local_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  undefined4 local_16c8;
  undefined4 uStack_16c4;
  undefined4 uStack_16c0;
  undefined4 uStack_16bc;
  undefined4 local_16ac;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  float local_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  float local_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  float local_1608;
  float fStack_1604;
  float fStack_1600;
  float fStack_15fc;
  float local_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  ulong local_1218;
  ulong uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined4 local_11dc;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  ulong local_1198;
  ulong uStack_1190;
  undefined4 local_1188;
  undefined4 uStack_1184;
  undefined4 uStack_1180;
  undefined4 uStack_117c;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined4 uStack_1164;
  undefined4 uStack_1160;
  undefined4 uStack_115c;
  undefined4 local_114c;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined4 local_10e8;
  undefined4 uStack_10e4;
  undefined4 uStack_10e0;
  undefined4 uStack_10dc;
  undefined4 local_10cc;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  ulong local_c38;
  ulong uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined4 local_bfc;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  int local_ba8;
  int iStack_ba4;
  int iStack_ba0;
  int iStack_b9c;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  int local_b88;
  int iStack_b84;
  int iStack_b80;
  int iStack_b7c;
  undefined8 local_b78;
  undefined8 uStack_b70;
  int local_b68;
  int iStack_b64;
  int iStack_b60;
  int iStack_b5c;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  ulong local_768;
  ulong uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  ulong local_748;
  ulong uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  ulong local_728;
  ulong uStack_720;
  ulong local_718;
  ulong uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  ulong local_6f8;
  ulong uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  ulong local_278;
  ulong uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  ulong local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  ulong local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_128;
  ulong uStack_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  local_35d4 = *(int *)(in_RSI + 0x2c);
  local_35d8 = *(int *)(in_RSI + 0x30);
  local_35e0 = *(ulong *)(in_RSI + 0x10);
  local_35e4 = *(int *)(in_RSI + 0x18);
  local_35e8 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) *
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) + -1) + 1;
  local_35d0 = in_RCX;
  local_35c8 = in_RDX;
  ncnn::Mat::Mat(&local_3630);
  Convolution1D::make_padding
            (in_stack_ffffffffffffc2b0,
             (Mat *)CONCAT44(in_stack_ffffffffffffc2ac,in_stack_ffffffffffffc2a8),
             (Mat *)CONCAT44(in_stack_ffffffffffffc2a4,in_stack_ffffffffffffc2a0),
             in_stack_ffffffffffffc298);
  bVar50 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffc2a4,in_stack_ffffffffffffc2a0));
  if (bVar50) {
    local_35ac = -100;
  }
  else {
    local_35d4 = local_3630.w;
    local_35d8 = local_3630.h;
    local_3644 = 1;
    if (((*(byte *)(local_35d0 + 0x27) & 1) != 0) &&
       (local_3644 = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0)) {
      local_3644 = 4;
    }
    local_3650 = (local_35e0 / (ulong)(long)local_35e4) * (long)local_3644;
    local_3654 = (local_3630.w - local_35e8) /
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + 1;
    local_3658 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) / local_3644;
    ncnn::Mat::create(in_stack_ffffffffffffc2c0,(int)((ulong)in_stack_ffffffffffffc2b8 >> 0x20),
                      (int)in_stack_ffffffffffffc2b8,(size_t)in_stack_ffffffffffffc2b0,
                      in_stack_ffffffffffffc2ac,
                      (Allocator *)CONCAT44(in_stack_ffffffffffffc2a4,in_stack_ffffffffffffc2a0));
    bVar50 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffc2a4,in_stack_ffffffffffffc2a0));
    if (bVar50) {
      local_35ac = -100;
    }
    else {
      if ((local_35e4 == 4) && (local_3644 == 4)) {
        for (local_365c = 0; local_365c < local_3658; local_365c = local_365c + 1) {
          local_3668 = ncnn::Mat::row(local_35c8,local_365c);
          for (local_366c = 0; local_366c < local_3654; local_366c = local_366c + 1) {
            local_34d8 = 0;
            local_34e8 = 0;
            uStack_34e4 = 0;
            uStack_34e0 = 0;
            uStack_34dc = 0;
            local_3688 = 0;
            uStack_3680 = 0;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) != 0) {
              local_3490 = ncnn::Mat::operator_cast_to_float_
                                     ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 400));
              local_3490 = local_3490 + (local_365c << 2);
              local_3688 = *(undefined8 *)local_3490;
              uStack_3680 = *(undefined8 *)(local_3490 + 2);
            }
            ncnn::Mat::channel(in_stack_ffffffffffffc2c8,
                               (int)((ulong)in_stack_ffffffffffffc2c0 >> 0x20));
            pfVar51 = ncnn::Mat::operator_cast_to_float_(&local_36d8);
            ncnn::Mat::~Mat((Mat *)0x913a09);
            local_3690 = pfVar51;
            for (local_36dc = 0; uVar4 = uStack_1ab0, uVar3 = local_1ab8, uVar2 = uStack_3680,
                uVar1 = local_3688, local_36dc < local_35d8; local_36dc = local_36dc + 1) {
              local_36e8 = ncnn::Mat::row(&local_3630,local_36dc);
              local_36e8 = local_36e8 +
                           local_366c * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
                           4;
              for (local_36ec = 0;
                  local_36ec < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_36ec = local_36ec + 1) {
                local_3508 = *local_36e8;
                local_3708 = CONCAT44(local_3508,local_3508);
                uStack_3700 = CONCAT44(local_3508,local_3508);
                local_3528 = local_36e8[1];
                local_3718 = CONCAT44(local_3528,local_3528);
                uStack_3710 = CONCAT44(local_3528,local_3528);
                local_3548 = local_36e8[2];
                local_3728 = CONCAT44(local_3548,local_3548);
                uStack_3720 = CONCAT44(local_3548,local_3548);
                local_3568 = local_36e8[3];
                local_3738 = CONCAT44(local_3568,local_3568);
                uStack_3730 = CONCAT44(local_3568,local_3568);
                local_3498 = local_3690;
                local_3748 = *(undefined8 *)local_3690;
                uStack_3740 = *(undefined8 *)(local_3690 + 2);
                local_3348._0_4_ = (float)local_3748;
                local_3348._4_4_ = (float)((ulong)local_3748 >> 0x20);
                uStack_3340._0_4_ = (float)uStack_3740;
                uStack_3340._4_4_ = (float)((ulong)uStack_3740 >> 0x20);
                local_33f8 = CONCAT44(local_3508 * local_3348._4_4_,local_3508 * (float)local_3348);
                uStack_33f0 = CONCAT44(local_3508 * uStack_3340._4_4_,
                                       local_3508 * (float)uStack_3340);
                uVar1 = local_3688;
                uVar2 = uStack_3680;
                local_3408._0_4_ = (float)local_3688;
                local_3408._4_4_ = (float)((ulong)local_3688 >> 0x20);
                uStack_3400._0_4_ = (float)uStack_3680;
                uStack_3400._4_4_ = (float)((ulong)uStack_3680 >> 0x20);
                local_3408._0_4_ = local_3508 * (float)local_3348 + (float)local_3408;
                local_3408._4_4_ = local_3508 * local_3348._4_4_ + local_3408._4_4_;
                uStack_3400._0_4_ = local_3508 * (float)uStack_3340 + (float)uStack_3400;
                uStack_3400._4_4_ = local_3508 * uStack_3340._4_4_ + uStack_3400._4_4_;
                local_3428 = CONCAT44(local_3408._4_4_,(float)local_3408);
                uStack_3420 = CONCAT44(uStack_3400._4_4_,(float)uStack_3400);
                local_34a0 = local_3690 + 4;
                local_3758 = *(undefined8 *)local_34a0;
                uStack_3750 = *(undefined8 *)(local_3690 + 6);
                local_3368._0_4_ = (float)local_3758;
                local_3368._4_4_ = (float)((ulong)local_3758 >> 0x20);
                uStack_3360._0_4_ = (float)uStack_3750;
                uStack_3360._4_4_ = (float)((ulong)uStack_3750 >> 0x20);
                local_3418 = CONCAT44(local_3528 * local_3368._4_4_,local_3528 * (float)local_3368);
                uStack_3410 = CONCAT44(local_3528 * uStack_3360._4_4_,
                                       local_3528 * (float)uStack_3360);
                local_3408._0_4_ = local_3528 * (float)local_3368 + (float)local_3408;
                local_3408._4_4_ = local_3528 * local_3368._4_4_ + local_3408._4_4_;
                uStack_3400._0_4_ = local_3528 * (float)uStack_3360 + (float)uStack_3400;
                uStack_3400._4_4_ = local_3528 * uStack_3360._4_4_ + uStack_3400._4_4_;
                local_3448 = CONCAT44(local_3408._4_4_,(float)local_3408);
                uStack_3440 = CONCAT44(uStack_3400._4_4_,(float)uStack_3400);
                local_34a8 = local_3690 + 8;
                local_3768 = *(undefined8 *)local_34a8;
                uStack_3760 = *(undefined8 *)(local_3690 + 10);
                local_3388._0_4_ = (float)local_3768;
                local_3388._4_4_ = (float)((ulong)local_3768 >> 0x20);
                uStack_3380._0_4_ = (float)uStack_3760;
                uStack_3380._4_4_ = (float)((ulong)uStack_3760 >> 0x20);
                local_3438 = CONCAT44(local_3548 * local_3388._4_4_,local_3548 * (float)local_3388);
                uStack_3430 = CONCAT44(local_3548 * uStack_3380._4_4_,
                                       local_3548 * (float)uStack_3380);
                local_3408._0_4_ = local_3548 * (float)local_3388 + (float)local_3408;
                local_3408._4_4_ = local_3548 * local_3388._4_4_ + local_3408._4_4_;
                uStack_3400._0_4_ = local_3548 * (float)uStack_3380 + (float)uStack_3400;
                uStack_3400._4_4_ = local_3548 * uStack_3380._4_4_ + uStack_3400._4_4_;
                local_3468 = CONCAT44(local_3408._4_4_,(float)local_3408);
                uStack_3460 = CONCAT44(uStack_3400._4_4_,(float)uStack_3400);
                local_34b0 = local_3690 + 0xc;
                local_3778 = *(undefined8 *)local_34b0;
                uStack_3770 = *(undefined8 *)(local_3690 + 0xe);
                local_33a8._0_4_ = (float)local_3778;
                local_33a8._4_4_ = (float)((ulong)local_3778 >> 0x20);
                uStack_33a0._0_4_ = (float)uStack_3770;
                uStack_33a0._4_4_ = (float)((ulong)uStack_3770 >> 0x20);
                local_3458._4_4_ = local_3568 * local_33a8._4_4_;
                local_3458._0_4_ = local_3568 * (float)local_33a8;
                local_3458._8_4_ = local_3568 * (float)uStack_33a0;
                local_3458._12_4_ = local_3568 * uStack_33a0._4_4_;
                local_3688 = CONCAT44(local_3568 * local_33a8._4_4_ + local_3408._4_4_,
                                      local_3568 * (float)local_33a8 + (float)local_3408);
                uStack_3680 = CONCAT44(local_3568 * uStack_33a0._4_4_ + uStack_3400._4_4_,
                                       local_3568 * (float)uStack_33a0 + (float)uStack_3400);
                local_36e8 = local_36e8 +
                             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) << 2);
                local_3690 = local_3690 + 0x10;
                fStack_3564 = local_3568;
                fStack_3560 = local_3568;
                fStack_355c = local_3568;
                local_3558 = local_3568;
                fStack_3544 = local_3548;
                fStack_3540 = local_3548;
                fStack_353c = local_3548;
                local_3538 = local_3548;
                fStack_3524 = local_3528;
                fStack_3520 = local_3528;
                fStack_351c = local_3528;
                local_3518 = local_3528;
                fStack_3504 = local_3508;
                fStack_3500 = local_3508;
                fStack_34fc = local_3508;
                local_34f8 = local_3508;
                local_3408 = uVar1;
                uStack_3400 = uVar2;
                local_33a8 = local_3778;
                uStack_33a0 = uStack_3770;
                local_3398 = local_3738;
                uStack_3390 = uStack_3730;
                local_3388 = local_3768;
                uStack_3380 = uStack_3760;
                local_3378 = local_3728;
                uStack_3370 = uStack_3720;
                local_3368 = local_3758;
                uStack_3360 = uStack_3750;
                local_3358 = local_3718;
                uStack_3350 = uStack_3710;
                local_3348 = local_3748;
                uStack_3340 = uStack_3740;
                local_3338 = local_3708;
                uStack_3330 = uStack_3700;
              }
            }
            local_31ec = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
            local_31f8 = (Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
            local_31e8 = local_3688;
            uStack_31e0 = uStack_3680;
            uStack_1ab0._0_4_ = (float)uStack_3680;
            fVar64 = (float)uStack_1ab0;
            uStack_1ab0._4_4_ = (float)((ulong)uStack_3680 >> 0x20);
            fVar67 = uStack_1ab0._4_4_;
            local_1ab8._0_4_ = (float)local_3688;
            fVar60 = (float)local_1ab8;
            local_1ab8._4_4_ = (float)((ulong)local_3688 >> 0x20);
            fVar63 = local_1ab8._4_4_;
            local_1ab8 = uVar3;
            uStack_1ab0 = uVar4;
            switch(local_31ec) {
            case 1:
              local_2fd8 = 0;
              uStack_2fd0 = 0;
              local_3048 = local_3688;
              uStack_3040 = uStack_3680;
              local_3058 = 0;
              uStack_3050 = 0;
              auVar5._8_8_ = uStack_3680;
              auVar5._0_8_ = local_3688;
              _local_31d8 = maxps(auVar5,ZEXT816(0));
              break;
            case 2:
              pfVar51 = ncnn::Mat::operator[](local_31f8,0);
              local_2f8c = *pfVar51;
              local_2f88 = uVar1;
              uStack_2f80 = uVar2;
              local_2ee8 = 0;
              uStack_2ee0 = 0;
              local_2f08 = 0;
              uStack_2f00 = 0;
              local_2f18 = uVar1;
              uStack_2f10 = uVar2;
              auVar11._8_8_ = uVar2;
              auVar11._0_8_ = uVar1;
              local_2fa8 = maxps(ZEXT816(0),auVar11);
              local_2ef8 = 0;
              uStack_2ef0 = 0;
              local_2dc8 = 0;
              uStack_2dc0 = 0;
              local_2dd8 = uVar1;
              uStack_2dd0 = uVar2;
              auVar14._8_8_ = uVar2;
              auVar14._0_8_ = uVar1;
              local_2fb8 = minps(ZEXT816(0),auVar14);
              local_2f28 = CONCAT44(local_2f8c,local_2f8c);
              uStack_2f20 = CONCAT44(local_2f8c,local_2f8c);
              local_2f38 = local_2fb8._0_8_;
              uVar1 = local_2f38;
              uStack_2f30 = local_2fb8._8_8_;
              uVar2 = uStack_2f30;
              local_2f38._0_4_ = local_2fb8._0_4_;
              local_2f38._4_4_ = local_2fb8._4_4_;
              uStack_2f30._0_4_ = local_2fb8._8_4_;
              uStack_2f30._4_4_ = local_2fb8._12_4_;
              local_2f58 = local_2f8c * (float)local_2f38;
              fStack_2f54 = local_2f8c * local_2f38._4_4_;
              fStack_2f50 = local_2f8c * (float)uStack_2f30;
              fStack_2f4c = local_2f8c * uStack_2f30._4_4_;
              local_2f48._0_4_ = local_2fa8._0_4_;
              local_2f48._4_4_ = local_2fa8._4_4_;
              fStack_2f40 = local_2fa8._8_4_;
              fStack_2f3c = local_2fa8._12_4_;
              local_31d8._4_4_ = (float)local_2f48._4_4_ + fStack_2f54;
              local_31d8._0_4_ = (float)local_2f48._0_4_ + local_2f58;
              uStack_31d0._4_4_ = fStack_2f3c + fStack_2f4c;
              uStack_31d0._0_4_ = fStack_2f40 + fStack_2f50;
              local_2f78 = local_2f8c;
              fStack_2f74 = local_2f8c;
              fStack_2f70 = local_2f8c;
              fStack_2f6c = local_2f8c;
              local_2f68 = local_2f8c;
              _local_2f48 = local_2fa8;
              local_2f38 = uVar1;
              uStack_2f30 = uVar2;
              break;
            case 3:
              pfVar51 = ncnn::Mat::operator[](local_31f8,0);
              local_3168 = *pfVar51;
              local_3208 = CONCAT44(local_3168,local_3168);
              uStack_3200 = CONCAT44(local_3168,local_3168);
              fStack_3164 = local_3168;
              fStack_3160 = local_3168;
              fStack_315c = local_3168;
              local_314c = local_3168;
              pfVar51 = ncnn::Mat::operator[](local_31f8,1);
              local_3188 = *pfVar51;
              local_3218 = CONCAT44(local_3188,local_3188);
              uStack_3210 = CONCAT44(local_3188,local_3188);
              local_3028 = local_31e8;
              uStack_3020 = uStack_31e0;
              local_3038 = local_3208;
              uStack_3030 = uStack_3200;
              auVar7._8_8_ = uStack_31e0;
              auVar7._0_8_ = local_31e8;
              auVar6._8_8_ = uStack_3200;
              auVar6._0_8_ = local_3208;
              local_2da8 = maxps(auVar7,auVar6);
              auVar15._8_8_ = uStack_3210;
              auVar15._0_8_ = local_3218;
              _local_31d8 = minps(local_2da8,auVar15);
              fStack_3184 = local_3188;
              fStack_3180 = local_3188;
              fStack_317c = local_3188;
              local_3178 = local_3188;
              local_2db8 = local_3218;
              uStack_2db0 = uStack_3210;
              break;
            case 4:
              local_2d68 = local_3688;
              uStack_2d60 = uStack_3680;
              local_2d3c = 0x3f800000;
              local_2d58 = 0x3f800000;
              uStack_2d54 = 0x3f800000;
              uStack_2d50 = 0x3f800000;
              uStack_2d4c = 0x3f800000;
              local_2d78 = 0x3f8000003f800000;
              uStack_2d70 = 0x3f8000003f800000;
              local_2d18 = 0;
              uStack_2d10 = 0;
              local_1aa8 = 0;
              uStack_1aa0 = 0;
              local_1ab8 = local_3688;
              uStack_1ab0 = uStack_3680;
              local_1f18 = CONCAT44(0.0 - fVar63,0.0 - fVar60);
              uStack_1f10._0_4_ = 0.0 - fVar64;
              uStack_1f10._4_4_ = 0.0 - fVar67;
              local_1c88 = 0;
              uStack_1c80 = 0;
              local_1f58 = 0x3f8000003f800000;
              uStack_1f50 = 0x3f8000003f800000;
              local_1c68 = local_1f18;
              uStack_1c60 = uStack_1f10;
              local_1c78 = 0x42b0c0a542b0c0a5;
              uStack_1c70 = 0x42b0c0a542b0c0a5;
              auVar33._8_8_ = uStack_1f10;
              auVar33._0_8_ = local_1f18;
              auVar32._8_8_ = 0x42b0c0a542b0c0a5;
              auVar32._0_8_ = 0x42b0c0a542b0c0a5;
              auVar55 = minps(auVar33,auVar32);
              local_1f18 = auVar55._0_8_;
              uStack_1f10 = auVar55._8_8_;
              local_1c98 = local_1f18;
              uStack_1c90 = uStack_1f10;
              local_1ca8 = 0xc2b0c0a5c2b0c0a5;
              uStack_1ca0 = 0xc2b0c0a5c2b0c0a5;
              auVar31._8_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar55 = maxps(auVar55,auVar31);
              local_1f18 = auVar55._0_8_;
              uStack_1f10 = auVar55._8_8_;
              local_1cb8 = local_1f18;
              uVar1 = local_1cb8;
              uStack_1cb0 = uStack_1f10;
              uVar2 = uStack_1cb0;
              local_1cc8 = 0x3fb8aa3b3fb8aa3b;
              uStack_1cc0 = 0x3fb8aa3b3fb8aa3b;
              local_1cb8._0_4_ = auVar55._0_4_;
              local_1cb8._4_4_ = auVar55._4_4_;
              uStack_1cb0._0_4_ = auVar55._8_4_;
              uStack_1cb0._4_4_ = auVar55._12_4_;
              local_1e18 = CONCAT44(local_1cb8._4_4_ * 1.442695,(float)local_1cb8 * 1.442695);
              uStack_1e10 = CONCAT44(uStack_1cb0._4_4_ * 1.442695,(float)uStack_1cb0 * 1.442695);
              local_1e28 = 0x3f0000003f000000;
              uStack_1e20 = 0x3f0000003f000000;
              fVar60 = (float)local_1cb8 * 1.442695 + 0.5;
              fVar63 = local_1cb8._4_4_ * 1.442695 + 0.5;
              fVar64 = (float)uStack_1cb0 * 1.442695 + 0.5;
              fVar67 = uStack_1cb0._4_4_ * 1.442695 + 0.5;
              local_1a88 = CONCAT44(fVar63,fVar60);
              uStack_1a80 = CONCAT44(fVar67,fVar64);
              local_1a18 = CONCAT44((int)fVar63,(int)fVar60);
              uStack_1a10 = CONCAT44((int)fVar67,(int)fVar64);
              local_1f38 = (float)(int)fVar60;
              fStack_1f34 = (float)(int)fVar63;
              fStack_1f30 = (float)(int)fVar64;
              fStack_1f2c = (float)(int)fVar67;
              local_1f28 = CONCAT44(fStack_1f34,local_1f38);
              uStack_1f20 = CONCAT44(fStack_1f2c,fStack_1f30);
              local_19d8 = CONCAT44(fVar63,fVar60);
              uStack_19d0 = CONCAT44(fVar67,fVar64);
              local_19c8 = local_1f28;
              uStack_19c0 = uStack_1f20;
              local_1f68 = CONCAT44(-(uint)(fVar63 < fStack_1f34),-(uint)(fVar60 < local_1f38));
              uStack_1f60 = CONCAT44(-(uint)(fVar67 < fStack_1f2c),-(uint)(fVar64 < fStack_1f30));
              local_1948 = local_1f68;
              uStack_1940 = uStack_1f60;
              local_1958 = 0x3f8000003f800000;
              uStack_1950 = 0x3f8000003f800000;
              local_1f68 = local_1f68 & 0x3f8000003f800000;
              uStack_1f60 = uStack_1f60 & 0x3f8000003f800000;
              local_1c08 = local_1f28;
              uStack_1c00 = uStack_1f20;
              local_1c18._0_4_ = (float)local_1f68;
              local_1c18._4_4_ = (float)(local_1f68 >> 0x20);
              uStack_1c10._0_4_ = (float)uStack_1f60;
              uStack_1c10._4_4_ = (float)(uStack_1f60 >> 0x20);
              local_1f38 = local_1f38 - (float)local_1c18;
              fStack_1f34 = fStack_1f34 - local_1c18._4_4_;
              fStack_1f30 = fStack_1f30 - (float)uStack_1c10;
              fStack_1f2c = fStack_1f2c - uStack_1c10._4_4_;
              local_1cd8 = CONCAT44(fStack_1f34,local_1f38);
              uStack_1cd0 = CONCAT44(fStack_1f2c,fStack_1f30);
              local_1ce8 = 0x3f3180003f318000;
              uStack_1ce0 = 0x3f3180003f318000;
              local_1f28 = CONCAT44(fStack_1f34 * 0.6933594,local_1f38 * 0.6933594);
              uStack_1f20 = CONCAT44(fStack_1f2c * 0.6933594,fStack_1f30 * 0.6933594);
              local_1cf8 = CONCAT44(fStack_1f34,local_1f38);
              uStack_1cf0 = CONCAT44(fStack_1f2c,fStack_1f30);
              local_1d08 = 0xb95e8083b95e8083;
              uStack_1d00 = 0xb95e8083b95e8083;
              local_1c28 = local_1f18;
              uStack_1c20 = uStack_1f10;
              local_1c38 = local_1f28;
              uStack_1c30 = uStack_1f20;
              local_1cb8._0_4_ = (float)local_1cb8 - local_1f38 * 0.6933594;
              local_1cb8._4_4_ = local_1cb8._4_4_ - fStack_1f34 * 0.6933594;
              uStack_1cb0._0_4_ = (float)uStack_1cb0 - fStack_1f30 * 0.6933594;
              uStack_1cb0._4_4_ = uStack_1cb0._4_4_ - fStack_1f2c * 0.6933594;
              local_1f18 = CONCAT44(local_1cb8._4_4_,(float)local_1cb8);
              uStack_1f10._0_4_ = (float)uStack_1cb0;
              uStack_1f10._4_4_ = uStack_1cb0._4_4_;
              local_1c58 = CONCAT44(fStack_1f34 * -0.00021219444,local_1f38 * -0.00021219444);
              uStack_1c50 = CONCAT44(fStack_1f2c * -0.00021219444,fStack_1f30 * -0.00021219444);
              local_1c48 = local_1f18;
              uStack_1c40 = uStack_1f10;
              local_1cb8._0_4_ = (float)local_1cb8 - local_1f38 * -0.00021219444;
              local_1cb8._4_4_ = local_1cb8._4_4_ - fStack_1f34 * -0.00021219444;
              uStack_1cb0._0_4_ = (float)uStack_1cb0 - fStack_1f30 * -0.00021219444;
              uStack_1cb0._4_4_ = uStack_1cb0._4_4_ - fStack_1f2c * -0.00021219444;
              local_1f18 = CONCAT44(local_1cb8._4_4_,(float)local_1cb8);
              uStack_1f10._0_4_ = (float)uStack_1cb0;
              uStack_1f10._4_4_ = uStack_1cb0._4_4_;
              local_1d18 = local_1f18;
              uStack_1d10 = uStack_1f10;
              local_1d28 = local_1f18;
              uStack_1d20 = uStack_1f10;
              local_1f78 = (float)local_1cb8 * (float)local_1cb8;
              fStack_1f74 = local_1cb8._4_4_ * local_1cb8._4_4_;
              fStack_1f70 = (float)uStack_1cb0 * (float)uStack_1cb0;
              fStack_1f6c = uStack_1cb0._4_4_ * uStack_1cb0._4_4_;
              local_1d38 = 0x3950696739506967;
              uStack_1d30 = 0x3950696739506967;
              local_1d48 = local_1f18;
              uStack_1d40 = uStack_1f10;
              local_1f88 = CONCAT44(local_1cb8._4_4_ * 0.00019875691,
                                    (float)local_1cb8 * 0.00019875691);
              uStack_1f80 = CONCAT44(uStack_1cb0._4_4_ * 0.00019875691,
                                     (float)uStack_1cb0 * 0.00019875691);
              local_1e38 = local_1f88;
              uStack_1e30 = uStack_1f80;
              local_1e48 = 0x3ab743ce3ab743ce;
              uStack_1e40 = 0x3ab743ce3ab743ce;
              local_2978 = (float)local_1cb8 * 0.00019875691 + 0.0013981999;
              fStack_2974 = local_1cb8._4_4_ * 0.00019875691 + 0.0013981999;
              fStack_2970 = (float)uStack_1cb0 * 0.00019875691 + 0.0013981999;
              fStack_296c = uStack_1cb0._4_4_ * 0.00019875691 + 0.0013981999;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1d58 = local_1f88;
              uStack_1d50 = uStack_1f80;
              local_1d68 = local_1f18;
              uStack_1d60 = uStack_1f10;
              local_2978 = local_2978 * (float)local_1cb8;
              fStack_2974 = fStack_2974 * local_1cb8._4_4_;
              fStack_2970 = fStack_2970 * (float)uStack_1cb0;
              fStack_296c = fStack_296c * uStack_1cb0._4_4_;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1e58 = local_1f88;
              uStack_1e50 = uStack_1f80;
              local_1e68 = 0x3c0889083c088908;
              uStack_1e60 = 0x3c0889083c088908;
              local_2978 = local_2978 + 0.008333452;
              fStack_2974 = fStack_2974 + 0.008333452;
              fStack_2970 = fStack_2970 + 0.008333452;
              fStack_296c = fStack_296c + 0.008333452;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1d78 = local_1f88;
              uStack_1d70 = uStack_1f80;
              local_1d88 = local_1f18;
              uStack_1d80 = uStack_1f10;
              local_2978 = local_2978 * (float)local_1cb8;
              fStack_2974 = fStack_2974 * local_1cb8._4_4_;
              fStack_2970 = fStack_2970 * (float)uStack_1cb0;
              fStack_296c = fStack_296c * uStack_1cb0._4_4_;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1e78 = local_1f88;
              uStack_1e70 = uStack_1f80;
              local_1e88 = 0x3d2aa9c13d2aa9c1;
              uStack_1e80 = 0x3d2aa9c13d2aa9c1;
              local_2978 = local_2978 + 0.041665796;
              fStack_2974 = fStack_2974 + 0.041665796;
              fStack_2970 = fStack_2970 + 0.041665796;
              fStack_296c = fStack_296c + 0.041665796;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1d98 = local_1f88;
              uStack_1d90 = uStack_1f80;
              local_1da8 = local_1f18;
              uStack_1da0 = uStack_1f10;
              local_2978 = local_2978 * (float)local_1cb8;
              fStack_2974 = fStack_2974 * local_1cb8._4_4_;
              fStack_2970 = fStack_2970 * (float)uStack_1cb0;
              fStack_296c = fStack_296c * uStack_1cb0._4_4_;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1e98 = local_1f88;
              uStack_1e90 = uStack_1f80;
              local_1ea8 = 0x3e2aaaaa3e2aaaaa;
              uStack_1ea0 = 0x3e2aaaaa3e2aaaaa;
              local_2978 = local_2978 + 0.16666666;
              fStack_2974 = fStack_2974 + 0.16666666;
              fStack_2970 = fStack_2970 + 0.16666666;
              fStack_296c = fStack_296c + 0.16666666;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1db8 = local_1f88;
              uStack_1db0 = uStack_1f80;
              local_1dc8 = local_1f18;
              uStack_1dc0 = uStack_1f10;
              local_2978 = local_2978 * (float)local_1cb8;
              fStack_2974 = fStack_2974 * local_1cb8._4_4_;
              fStack_2970 = fStack_2970 * (float)uStack_1cb0;
              fStack_296c = fStack_296c * uStack_1cb0._4_4_;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1eb8 = local_1f88;
              uStack_1eb0 = uStack_1f80;
              local_1ec8 = 0x3f0000003f000000;
              uStack_1ec0 = 0x3f0000003f000000;
              local_2978 = local_2978 + 0.5;
              fStack_2974 = fStack_2974 + 0.5;
              fStack_2970 = fStack_2970 + 0.5;
              fStack_296c = fStack_296c + 0.5;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1de8 = CONCAT44(fStack_1f74,local_1f78);
              uStack_1de0 = CONCAT44(fStack_1f6c,fStack_1f70);
              local_1dd8 = local_1f88;
              uStack_1dd0 = uStack_1f80;
              local_2978 = local_2978 * local_1f78;
              fStack_2974 = fStack_2974 * fStack_1f74;
              fStack_2970 = fStack_2970 * fStack_1f70;
              fStack_296c = fStack_296c * fStack_1f6c;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1ed8 = local_1f88;
              uStack_1ed0 = uStack_1f80;
              local_1ee8 = local_1f18;
              uStack_1ee0 = uStack_1f10;
              local_2978 = local_2978 + (float)local_1cb8;
              fStack_2974 = fStack_2974 + local_1cb8._4_4_;
              fStack_2970 = fStack_2970 + (float)uStack_1cb0;
              fStack_296c = fStack_296c + uStack_1cb0._4_4_;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1ef8 = local_1f88;
              uStack_1ef0 = uStack_1f80;
              local_1f08 = 0x3f8000003f800000;
              uStack_1f00 = 0x3f8000003f800000;
              local_2978 = local_2978 + 1.0;
              fStack_2974 = fStack_2974 + 1.0;
              fStack_2970 = fStack_2970 + 1.0;
              fStack_296c = fStack_296c + 1.0;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_1a98 = CONCAT44(fStack_1f34,local_1f38);
              uStack_1a90 = CONCAT44(fStack_1f2c,fStack_1f30);
              local_18c8 = CONCAT44((int)fStack_1f34,(int)local_1f38);
              uStack_18c0 = CONCAT44((int)fStack_1f2c,(int)fStack_1f30);
              local_18d8 = 0x7f0000007f;
              uStack_18d0 = 0x7f0000007f;
              iVar53 = (int)local_1f38 + 0x7f;
              fStack_1f44 = (float)((int)fStack_1f34 + 0x7f);
              fStack_1f40 = (float)((int)fStack_1f30 + 0x7f);
              fStack_1f3c = (float)((int)fStack_1f2c + 0x7f);
              local_1848 = CONCAT44(fStack_1f44,iVar53);
              uStack_1840 = CONCAT44(fStack_1f3c,fStack_1f40);
              local_184c = 0x17;
              local_1f48 = (float)(iVar53 * 0x800000);
              local_1f98 = CONCAT44(fStack_1f44,local_1f48);
              uStack_1f90 = CONCAT44(fStack_1f3c,fStack_1f40);
              local_1df8 = local_1f88;
              uStack_1df0 = uStack_1f80;
              local_2978 = local_2978 * local_1f48;
              fStack_2974 = fStack_2974 * fStack_1f44;
              fStack_2970 = fStack_2970 * fStack_1f40;
              fStack_296c = fStack_296c * fStack_1f3c;
              local_1f88 = CONCAT44(fStack_2974,local_2978);
              uStack_1f80 = CONCAT44(fStack_296c,fStack_2970);
              local_2968._8_8_ = 0x3f8000003f800000;
              local_2968._0_8_ = 0x3f8000003f800000;
              local_2d38 = local_1f88;
              uStack_2d30 = uStack_1f80;
              local_2978 = local_2978 + 1.0;
              fStack_2974 = fStack_2974 + 1.0;
              fStack_2970 = fStack_2970 + 1.0;
              fStack_296c = fStack_296c + 1.0;
              auVar21._4_4_ = fStack_2974;
              auVar21._0_4_ = local_2978;
              auVar21._8_4_ = fStack_2970;
              auVar21._12_4_ = fStack_296c;
              _local_31d8 = divps(local_2968,auVar21);
              local_2d28 = local_2d78;
              uStack_2d20 = uStack_2d70;
              local_1e08 = local_1f98;
              uStack_1e00 = uStack_1f90;
              local_1cb8 = uVar1;
              uStack_1cb0 = uVar2;
              local_1c18 = local_1f68;
              uStack_1c10 = uStack_1f60;
              local_17d8 = local_1f98;
              uStack_17d0 = uStack_1f90;
              break;
            case 5:
              local_2c98 = local_3688;
              uStack_2c90 = uStack_3680;
              local_2308 = 0;
              uStack_2300 = 0;
              local_25d8 = 0x3f8000003f800000;
              uStack_25d0 = 0x3f8000003f800000;
              local_22e8 = local_3688;
              uStack_22e0 = uStack_3680;
              local_22f8 = 0x42b0c0a542b0c0a5;
              uStack_22f0 = 0x42b0c0a542b0c0a5;
              auVar27._8_8_ = uStack_3680;
              auVar27._0_8_ = local_3688;
              auVar26._8_8_ = 0x42b0c0a542b0c0a5;
              auVar26._0_8_ = 0x42b0c0a542b0c0a5;
              auVar55 = minps(auVar27,auVar26);
              local_2598 = auVar55._0_8_;
              uStack_2590 = auVar55._8_8_;
              local_2318 = local_2598;
              uStack_2310 = uStack_2590;
              local_2328 = 0xc2b0c0a5c2b0c0a5;
              uStack_2320 = 0xc2b0c0a5c2b0c0a5;
              auVar25._8_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar55 = maxps(auVar55,auVar25);
              local_2598 = auVar55._0_8_;
              uStack_2590 = auVar55._8_8_;
              local_2338 = local_2598;
              uVar1 = local_2338;
              uStack_2330 = uStack_2590;
              uVar2 = uStack_2330;
              local_2348 = 0x3fb8aa3b3fb8aa3b;
              uStack_2340 = 0x3fb8aa3b3fb8aa3b;
              local_2338._0_4_ = auVar55._0_4_;
              local_2338._4_4_ = auVar55._4_4_;
              uStack_2330._0_4_ = auVar55._8_4_;
              uStack_2330._4_4_ = auVar55._12_4_;
              local_2498 = CONCAT44(local_2338._4_4_ * 1.442695,(float)local_2338 * 1.442695);
              uStack_2490 = CONCAT44(uStack_2330._4_4_ * 1.442695,(float)uStack_2330 * 1.442695);
              local_24a8 = 0x3f0000003f000000;
              uStack_24a0 = 0x3f0000003f000000;
              fVar60 = (float)local_2338 * 1.442695 + 0.5;
              fVar63 = local_2338._4_4_ * 1.442695 + 0.5;
              fVar64 = (float)uStack_2330 * 1.442695 + 0.5;
              fVar67 = uStack_2330._4_4_ * 1.442695 + 0.5;
              local_1a48 = CONCAT44(fVar63,fVar60);
              uStack_1a40 = CONCAT44(fVar67,fVar64);
              local_19f8 = CONCAT44((int)fVar63,(int)fVar60);
              uStack_19f0 = CONCAT44((int)fVar67,(int)fVar64);
              local_25b8 = (float)(int)fVar60;
              fStack_25b4 = (float)(int)fVar63;
              fStack_25b0 = (float)(int)fVar64;
              fStack_25ac = (float)(int)fVar67;
              local_25a8 = CONCAT44(fStack_25b4,local_25b8);
              uStack_25a0 = CONCAT44(fStack_25ac,fStack_25b0);
              local_1998 = CONCAT44(fVar63,fVar60);
              uStack_1990 = CONCAT44(fVar67,fVar64);
              local_1988 = local_25a8;
              uStack_1980 = uStack_25a0;
              local_25e8 = CONCAT44(-(uint)(fVar63 < fStack_25b4),-(uint)(fVar60 < local_25b8));
              uStack_25e0 = CONCAT44(-(uint)(fVar67 < fStack_25ac),-(uint)(fVar64 < fStack_25b0));
              local_1908 = local_25e8;
              uStack_1900 = uStack_25e0;
              local_1918 = 0x3f8000003f800000;
              uStack_1910 = 0x3f8000003f800000;
              local_25e8 = local_25e8 & 0x3f8000003f800000;
              uStack_25e0 = uStack_25e0 & 0x3f8000003f800000;
              local_1b48 = local_25a8;
              uStack_1b40 = uStack_25a0;
              local_1b58._0_4_ = (float)local_25e8;
              local_1b58._4_4_ = (float)(local_25e8 >> 0x20);
              uStack_1b50._0_4_ = (float)uStack_25e0;
              uStack_1b50._4_4_ = (float)(uStack_25e0 >> 0x20);
              local_25b8 = local_25b8 - (float)local_1b58;
              fStack_25b4 = fStack_25b4 - local_1b58._4_4_;
              fStack_25b0 = fStack_25b0 - (float)uStack_1b50;
              fStack_25ac = fStack_25ac - uStack_1b50._4_4_;
              local_2358 = CONCAT44(fStack_25b4,local_25b8);
              uStack_2350 = CONCAT44(fStack_25ac,fStack_25b0);
              local_2368 = 0x3f3180003f318000;
              uStack_2360 = 0x3f3180003f318000;
              local_25a8 = CONCAT44(fStack_25b4 * 0.6933594,local_25b8 * 0.6933594);
              uStack_25a0 = CONCAT44(fStack_25ac * 0.6933594,fStack_25b0 * 0.6933594);
              local_2378 = CONCAT44(fStack_25b4,local_25b8);
              uStack_2370 = CONCAT44(fStack_25ac,fStack_25b0);
              local_2388 = 0xb95e8083b95e8083;
              uStack_2380 = 0xb95e8083b95e8083;
              local_1b68 = local_2598;
              uStack_1b60 = uStack_2590;
              local_1b78 = local_25a8;
              uStack_1b70 = uStack_25a0;
              local_2338._0_4_ = (float)local_2338 - local_25b8 * 0.6933594;
              local_2338._4_4_ = local_2338._4_4_ - fStack_25b4 * 0.6933594;
              uStack_2330._0_4_ = (float)uStack_2330 - fStack_25b0 * 0.6933594;
              uStack_2330._4_4_ = uStack_2330._4_4_ - fStack_25ac * 0.6933594;
              local_2598 = CONCAT44(local_2338._4_4_,(float)local_2338);
              uStack_2590._0_4_ = (float)uStack_2330;
              uStack_2590._4_4_ = uStack_2330._4_4_;
              local_1b98 = CONCAT44(fStack_25b4 * -0.00021219444,local_25b8 * -0.00021219444);
              uStack_1b90 = CONCAT44(fStack_25ac * -0.00021219444,fStack_25b0 * -0.00021219444);
              local_1b88 = local_2598;
              uStack_1b80 = uStack_2590;
              local_2338._0_4_ = (float)local_2338 - local_25b8 * -0.00021219444;
              local_2338._4_4_ = local_2338._4_4_ - fStack_25b4 * -0.00021219444;
              uStack_2330._0_4_ = (float)uStack_2330 - fStack_25b0 * -0.00021219444;
              uStack_2330._4_4_ = uStack_2330._4_4_ - fStack_25ac * -0.00021219444;
              local_2598 = CONCAT44(local_2338._4_4_,(float)local_2338);
              uStack_2590._0_4_ = (float)uStack_2330;
              uStack_2590._4_4_ = uStack_2330._4_4_;
              local_2398 = local_2598;
              uStack_2390 = uStack_2590;
              local_23a8 = local_2598;
              uStack_23a0 = uStack_2590;
              local_25f8 = (float)local_2338 * (float)local_2338;
              fStack_25f4 = local_2338._4_4_ * local_2338._4_4_;
              fStack_25f0 = (float)uStack_2330 * (float)uStack_2330;
              fStack_25ec = uStack_2330._4_4_ * uStack_2330._4_4_;
              local_23b8 = 0x3950696739506967;
              uStack_23b0 = 0x3950696739506967;
              local_23c8 = local_2598;
              uStack_23c0 = uStack_2590;
              local_2608 = CONCAT44(local_2338._4_4_ * 0.00019875691,
                                    (float)local_2338 * 0.00019875691);
              uStack_2600 = CONCAT44(uStack_2330._4_4_ * 0.00019875691,
                                     (float)uStack_2330 * 0.00019875691);
              local_24b8 = local_2608;
              uStack_24b0 = uStack_2600;
              local_24c8 = 0x3ab743ce3ab743ce;
              uStack_24c0 = 0x3ab743ce3ab743ce;
              fVar60 = (float)local_2338 * 0.00019875691 + 0.0013981999;
              fVar63 = local_2338._4_4_ * 0.00019875691 + 0.0013981999;
              fVar64 = (float)uStack_2330 * 0.00019875691 + 0.0013981999;
              fVar67 = uStack_2330._4_4_ * 0.00019875691 + 0.0013981999;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_23d8 = local_2608;
              uStack_23d0 = uStack_2600;
              local_23e8 = local_2598;
              uStack_23e0 = uStack_2590;
              fVar60 = fVar60 * (float)local_2338;
              fVar63 = fVar63 * local_2338._4_4_;
              fVar64 = fVar64 * (float)uStack_2330;
              fVar67 = fVar67 * uStack_2330._4_4_;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_24d8 = local_2608;
              uStack_24d0 = uStack_2600;
              local_24e8 = 0x3c0889083c088908;
              uStack_24e0 = 0x3c0889083c088908;
              fVar60 = fVar60 + 0.008333452;
              fVar63 = fVar63 + 0.008333452;
              fVar64 = fVar64 + 0.008333452;
              fVar67 = fVar67 + 0.008333452;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_23f8 = local_2608;
              uStack_23f0 = uStack_2600;
              local_2408 = local_2598;
              uStack_2400 = uStack_2590;
              fVar60 = fVar60 * (float)local_2338;
              fVar63 = fVar63 * local_2338._4_4_;
              fVar64 = fVar64 * (float)uStack_2330;
              fVar67 = fVar67 * uStack_2330._4_4_;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_24f8 = local_2608;
              uStack_24f0 = uStack_2600;
              local_2508 = 0x3d2aa9c13d2aa9c1;
              uStack_2500 = 0x3d2aa9c13d2aa9c1;
              fVar60 = fVar60 + 0.041665796;
              fVar63 = fVar63 + 0.041665796;
              fVar64 = fVar64 + 0.041665796;
              fVar67 = fVar67 + 0.041665796;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_2418 = local_2608;
              uStack_2410 = uStack_2600;
              local_2428 = local_2598;
              uStack_2420 = uStack_2590;
              fVar60 = fVar60 * (float)local_2338;
              fVar63 = fVar63 * local_2338._4_4_;
              fVar64 = fVar64 * (float)uStack_2330;
              fVar67 = fVar67 * uStack_2330._4_4_;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_2518 = local_2608;
              uStack_2510 = uStack_2600;
              local_2528 = 0x3e2aaaaa3e2aaaaa;
              uStack_2520 = 0x3e2aaaaa3e2aaaaa;
              fVar60 = fVar60 + 0.16666666;
              fVar63 = fVar63 + 0.16666666;
              fVar64 = fVar64 + 0.16666666;
              fVar67 = fVar67 + 0.16666666;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_2438 = local_2608;
              uStack_2430 = uStack_2600;
              local_2448 = local_2598;
              uStack_2440 = uStack_2590;
              fVar60 = fVar60 * (float)local_2338;
              fVar63 = fVar63 * local_2338._4_4_;
              fVar64 = fVar64 * (float)uStack_2330;
              fVar67 = fVar67 * uStack_2330._4_4_;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_2538 = local_2608;
              uStack_2530 = uStack_2600;
              local_2548 = 0x3f0000003f000000;
              uStack_2540 = 0x3f0000003f000000;
              fVar60 = fVar60 + 0.5;
              fVar63 = fVar63 + 0.5;
              fVar64 = fVar64 + 0.5;
              fVar67 = fVar67 + 0.5;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_2468 = CONCAT44(fStack_25f4,local_25f8);
              uStack_2460 = CONCAT44(fStack_25ec,fStack_25f0);
              local_2458 = local_2608;
              uStack_2450 = uStack_2600;
              fVar60 = fVar60 * local_25f8;
              fVar63 = fVar63 * fStack_25f4;
              fVar64 = fVar64 * fStack_25f0;
              fVar67 = fVar67 * fStack_25ec;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_2558 = local_2608;
              uStack_2550 = uStack_2600;
              local_2568 = local_2598;
              uStack_2560 = uStack_2590;
              fVar60 = fVar60 + (float)local_2338;
              fVar63 = fVar63 + local_2338._4_4_;
              fVar64 = fVar64 + (float)uStack_2330;
              fVar67 = fVar67 + uStack_2330._4_4_;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_2578 = local_2608;
              uStack_2570 = uStack_2600;
              local_2588 = 0x3f8000003f800000;
              uStack_2580 = 0x3f8000003f800000;
              fVar60 = fVar60 + 1.0;
              fVar63 = fVar63 + 1.0;
              fVar64 = fVar64 + 1.0;
              fVar67 = fVar67 + 1.0;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_1a58 = CONCAT44(fStack_25b4,local_25b8);
              uStack_1a50 = CONCAT44(fStack_25ac,fStack_25b0);
              local_1888 = CONCAT44((int)fStack_25b4,(int)local_25b8);
              uStack_1880 = CONCAT44((int)fStack_25ac,(int)fStack_25b0);
              local_1898 = 0x7f0000007f;
              uStack_1890 = 0x7f0000007f;
              iVar53 = (int)local_25b8 + 0x7f;
              fStack_25c4 = (float)((int)fStack_25b4 + 0x7f);
              fStack_25c0 = (float)((int)fStack_25b0 + 0x7f);
              fStack_25bc = (float)((int)fStack_25ac + 0x7f);
              local_1808 = CONCAT44(fStack_25c4,iVar53);
              uStack_1800 = CONCAT44(fStack_25bc,fStack_25c0);
              local_180c = 0x17;
              local_25c8 = (float)(iVar53 * 0x800000);
              local_2618 = CONCAT44(fStack_25c4,local_25c8);
              uStack_2610 = CONCAT44(fStack_25bc,fStack_25c0);
              local_2478 = local_2608;
              uStack_2470 = uStack_2600;
              fVar60 = fVar60 * local_25c8;
              fVar63 = fVar63 * fStack_25c4;
              fVar64 = fVar64 * fStack_25c0;
              fVar67 = fVar67 * fStack_25bc;
              local_2608 = CONCAT44(fVar63,fVar60);
              uStack_2600 = CONCAT44(fVar67,fVar64);
              local_2c6c = 0x3f800000;
              local_2c88 = 0x3f800000;
              uStack_2c84 = 0x3f800000;
              uStack_2c80 = 0x3f800000;
              uStack_2c7c = 0x3f800000;
              local_2c68 = 0x3f8000003f800000;
              uStack_2c60 = 0x3f8000003f800000;
              local_2c58 = local_2608;
              uStack_2c50 = uStack_2600;
              fVar60 = fVar60 + 1.0;
              fVar63 = fVar63 + 1.0;
              fVar64 = fVar64 + 1.0;
              fVar67 = fVar67 + 1.0;
              local_668 = CONCAT44(fVar63,fVar60);
              uStack_660._0_4_ = fVar64;
              uStack_660._4_4_ = fVar67;
              local_688 = 0x3f8000003f800000;
              uStack_680 = 0x3f8000003f800000;
              local_2d8 = 0;
              uStack_2d0 = 0;
              local_1e8 = local_668;
              uStack_1e0 = uStack_660;
              local_1f8 = 0;
              uStack_1f0 = 0;
              local_698 = -(uint)(fVar60 <= 0.0);
              iStack_694 = -(uint)(fVar63 <= 0.0);
              iStack_690 = -(uint)(fVar64 <= 0.0);
              iStack_68c = -(uint)(fVar67 <= 0.0);
              local_2e8 = local_668;
              uStack_2e0 = uStack_660;
              local_2f8 = 0x80000000800000;
              uStack_2f0 = 0x80000000800000;
              auVar47._8_8_ = uStack_660;
              auVar47._0_8_ = local_668;
              auVar46._8_8_ = 0x80000000800000;
              auVar46._0_8_ = 0x80000000800000;
              auVar55 = maxps(auVar47,auVar46);
              local_668 = auVar55._0_8_;
              uStack_660 = auVar55._8_8_;
              local_178 = local_668;
              uStack_170 = uStack_660;
              local_1a8 = local_668;
              uVar48 = local_1a8;
              uStack_1a0 = uStack_660;
              uVar49 = uStack_1a0;
              local_1ac = 0x17;
              local_1a8._0_4_ = auVar55._0_4_;
              local_1a8._4_4_ = auVar55._4_4_;
              uStack_1a0._0_4_ = auVar55._8_4_;
              uStack_1a0._4_4_ = auVar55._12_4_;
              local_208 = local_668;
              uStack_200 = uStack_660;
              local_218 = 0x807fffff807fffff;
              uStack_210 = 0x807fffff807fffff;
              local_128 = local_668 & 0x807fffff807fffff;
              uStack_120 = uStack_660 & 0x807fffff807fffff;
              local_138 = 0x3f0000003f000000;
              uStack_130 = 0x3f0000003f000000;
              local_278 = local_128 | 0x3f0000003f000000;
              uStack_270 = uStack_120 | 0x3f0000003f000000;
              local_c8 = CONCAT44(local_1a8._4_4_ >> 0x17,(uint)local_1a8 >> 0x17);
              uStack_c0 = CONCAT44(uStack_1a0._4_4_ >> 0x17,(uint)uStack_1a0 >> 0x17);
              local_d8 = 0x7f0000007f;
              uStack_d0 = 0x7f0000007f;
              local_678 = ((uint)local_1a8 >> 0x17) - 0x7f;
              iStack_674 = (local_1a8._4_4_ >> 0x17) - 0x7f;
              iStack_670 = ((uint)uStack_1a0 >> 0x17) - 0x7f;
              iStack_66c = (uStack_1a0._4_4_ >> 0x17) - 0x7f;
              local_268 = CONCAT44(iStack_674,local_678);
              uStack_260 = CONCAT44(iStack_66c,iStack_670);
              local_4c8 = CONCAT44((float)iStack_674,(float)local_678);
              uStack_4c0 = CONCAT44((float)iStack_66c,(float)iStack_670);
              local_4d8 = 0x3f8000003f800000;
              uStack_4d0 = 0x3f8000003f800000;
              local_6a8 = (float)local_678 + 1.0;
              fStack_6a4 = (float)iStack_674 + 1.0;
              fStack_6a0 = (float)iStack_670 + 1.0;
              fStack_69c = (float)iStack_66c + 1.0;
              local_98 = 0x3f3504f33f3504f3;
              uStack_90 = 0x3f3504f33f3504f3;
              local_88._0_4_ = (float)local_278;
              local_88._4_4_ = (float)(local_278 >> 0x20);
              uStack_80._0_4_ = (float)uStack_270;
              uStack_80._4_4_ = (float)(uStack_270 >> 0x20);
              local_6b8 = -(uint)((float)local_88 < 0.70710677);
              iStack_6b4 = -(uint)(local_88._4_4_ < 0.70710677);
              iStack_6b0 = -(uint)((float)uStack_80 < 0.70710677);
              iStack_6ac = -(uint)(uStack_80._4_4_ < 0.70710677);
              local_238 = CONCAT44(iStack_6b4,local_6b8);
              uStack_230 = CONCAT44(iStack_6ac,iStack_6b0);
              uVar61 = local_278 & local_238;
              uVar65 = uStack_270 & uStack_230;
              local_288 = 0x3f8000003f800000;
              uStack_280 = 0x3f8000003f800000;
              local_668 = CONCAT44(local_88._4_4_ - 1.0,(float)local_88 - 1.0);
              uStack_660._0_4_ = (float)uStack_80 - 1.0;
              uStack_660._4_4_ = uStack_80._4_4_ - 1.0;
              local_298 = CONCAT44(fStack_6a4,local_6a8);
              uStack_290 = CONCAT44(fStack_69c,fStack_6a0);
              local_258 = CONCAT44(iStack_6b4,local_6b8);
              uStack_250 = CONCAT44(iStack_6ac,iStack_6b0);
              local_248 = 0x3f8000003f800000;
              uStack_240 = 0x3f8000003f800000;
              uVar62 = local_258 & 0x3f8000003f800000;
              uVar66 = uStack_250 & 0x3f8000003f800000;
              local_2a8._0_4_ = (float)uVar62;
              local_2a8._4_4_ = (float)(uVar62 >> 0x20);
              uStack_2a0._0_4_ = (float)uVar66;
              uStack_2a0._4_4_ = (float)(uVar66 >> 0x20);
              local_6a8 = local_6a8 - (float)local_2a8;
              fStack_6a4 = fStack_6a4 - local_2a8._4_4_;
              fStack_6a0 = fStack_6a0 - (float)uStack_2a0;
              fStack_69c = fStack_69c - uStack_2a0._4_4_;
              local_4e8 = local_668;
              uStack_4e0 = uStack_660;
              local_4f8._0_4_ = (float)uVar61;
              local_4f8._4_4_ = (float)(uVar61 >> 0x20);
              uStack_4f0._0_4_ = (float)uVar65;
              uStack_4f0._4_4_ = (float)(uVar65 >> 0x20);
              local_4f8._0_4_ = ((float)local_88 - 1.0) + (float)local_4f8;
              local_4f8._4_4_ = (local_88._4_4_ - 1.0) + local_4f8._4_4_;
              uStack_4f0._0_4_ = ((float)uStack_80 - 1.0) + (float)uStack_4f0;
              uStack_4f0._4_4_ = (uStack_80._4_4_ - 1.0) + uStack_4f0._4_4_;
              local_668 = CONCAT44(local_4f8._4_4_,(float)local_4f8);
              uStack_660._0_4_ = (float)uStack_4f0;
              uStack_660._4_4_ = uStack_4f0._4_4_;
              local_308 = local_668;
              uStack_300 = uStack_660;
              local_318 = local_668;
              uStack_310 = uStack_660;
              local_6d8 = (float)local_4f8 * (float)local_4f8;
              fStack_6d4 = local_4f8._4_4_ * local_4f8._4_4_;
              fStack_6d0 = (float)uStack_4f0 * (float)uStack_4f0;
              fStack_6cc = uStack_4f0._4_4_ * uStack_4f0._4_4_;
              local_328 = 0x3d9021bb3d9021bb;
              uStack_320 = 0x3d9021bb3d9021bb;
              local_338 = local_668;
              uStack_330 = uStack_660;
              local_6e8 = CONCAT44(local_4f8._4_4_ * 0.070376836,(float)local_4f8 * 0.070376836);
              uStack_6e0 = CONCAT44(uStack_4f0._4_4_ * 0.070376836,(float)uStack_4f0 * 0.070376836);
              local_508 = local_6e8;
              uStack_500 = uStack_6e0;
              local_518 = 0xbdebd1b8bdebd1b8;
              uStack_510 = 0xbdebd1b8bdebd1b8;
              fVar60 = (float)local_4f8 * 0.070376836 + -0.1151461;
              fVar63 = local_4f8._4_4_ * 0.070376836 + -0.1151461;
              fVar64 = (float)uStack_4f0 * 0.070376836 + -0.1151461;
              fVar67 = uStack_4f0._4_4_ * 0.070376836 + -0.1151461;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_348 = local_6e8;
              uStack_340 = uStack_6e0;
              local_358 = local_668;
              uStack_350 = uStack_660;
              fVar60 = fVar60 * (float)local_4f8;
              fVar63 = fVar63 * local_4f8._4_4_;
              fVar64 = fVar64 * (float)uStack_4f0;
              fVar67 = fVar67 * uStack_4f0._4_4_;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_528 = local_6e8;
              uStack_520 = uStack_6e0;
              local_538 = 0x3def251a3def251a;
              uStack_530 = 0x3def251a3def251a;
              fVar60 = fVar60 + 0.116769984;
              fVar63 = fVar63 + 0.116769984;
              fVar64 = fVar64 + 0.116769984;
              fVar67 = fVar67 + 0.116769984;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_368 = local_6e8;
              uStack_360 = uStack_6e0;
              local_378 = local_668;
              uStack_370 = uStack_660;
              fVar60 = fVar60 * (float)local_4f8;
              fVar63 = fVar63 * local_4f8._4_4_;
              fVar64 = fVar64 * (float)uStack_4f0;
              fVar67 = fVar67 * uStack_4f0._4_4_;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_548 = local_6e8;
              uStack_540 = uStack_6e0;
              local_558 = 0xbdfe5d4fbdfe5d4f;
              uStack_550 = 0xbdfe5d4fbdfe5d4f;
              fVar60 = fVar60 + -0.12420141;
              fVar63 = fVar63 + -0.12420141;
              fVar64 = fVar64 + -0.12420141;
              fVar67 = fVar67 + -0.12420141;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_388 = local_6e8;
              uStack_380 = uStack_6e0;
              local_398 = local_668;
              uStack_390 = uStack_660;
              fVar60 = fVar60 * (float)local_4f8;
              fVar63 = fVar63 * local_4f8._4_4_;
              fVar64 = fVar64 * (float)uStack_4f0;
              fVar67 = fVar67 * uStack_4f0._4_4_;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_568 = local_6e8;
              uStack_560 = uStack_6e0;
              local_578 = 0x3e11e9bf3e11e9bf;
              uStack_570 = 0x3e11e9bf3e11e9bf;
              fVar60 = fVar60 + 0.14249323;
              fVar63 = fVar63 + 0.14249323;
              fVar64 = fVar64 + 0.14249323;
              fVar67 = fVar67 + 0.14249323;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_3a8 = local_6e8;
              uStack_3a0 = uStack_6e0;
              local_3b8 = local_668;
              uStack_3b0 = uStack_660;
              fVar60 = fVar60 * (float)local_4f8;
              fVar63 = fVar63 * local_4f8._4_4_;
              fVar64 = fVar64 * (float)uStack_4f0;
              fVar67 = fVar67 * uStack_4f0._4_4_;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_588 = local_6e8;
              uStack_580 = uStack_6e0;
              local_598 = 0xbe2aae50be2aae50;
              uStack_590 = 0xbe2aae50be2aae50;
              fVar60 = fVar60 + -0.16668057;
              fVar63 = fVar63 + -0.16668057;
              fVar64 = fVar64 + -0.16668057;
              fVar67 = fVar67 + -0.16668057;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_3c8 = local_6e8;
              uStack_3c0 = uStack_6e0;
              local_3d8 = local_668;
              uStack_3d0 = uStack_660;
              fVar60 = fVar60 * (float)local_4f8;
              fVar63 = fVar63 * local_4f8._4_4_;
              fVar64 = fVar64 * (float)uStack_4f0;
              fVar67 = fVar67 * uStack_4f0._4_4_;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_5a8 = local_6e8;
              uStack_5a0 = uStack_6e0;
              local_5b8 = 0x3e4cceac3e4cceac;
              uStack_5b0 = 0x3e4cceac3e4cceac;
              fVar60 = fVar60 + 0.20000714;
              fVar63 = fVar63 + 0.20000714;
              fVar64 = fVar64 + 0.20000714;
              fVar67 = fVar67 + 0.20000714;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_3e8 = local_6e8;
              uStack_3e0 = uStack_6e0;
              local_3f8 = local_668;
              uStack_3f0 = uStack_660;
              fVar60 = fVar60 * (float)local_4f8;
              fVar63 = fVar63 * local_4f8._4_4_;
              fVar64 = fVar64 * (float)uStack_4f0;
              fVar67 = fVar67 * uStack_4f0._4_4_;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_5c8 = local_6e8;
              uStack_5c0 = uStack_6e0;
              local_5d8 = 0xbe7ffffcbe7ffffc;
              uStack_5d0 = 0xbe7ffffcbe7ffffc;
              fVar60 = fVar60 + -0.24999994;
              fVar63 = fVar63 + -0.24999994;
              fVar64 = fVar64 + -0.24999994;
              fVar67 = fVar67 + -0.24999994;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_408 = local_6e8;
              uStack_400 = uStack_6e0;
              local_418 = local_668;
              uStack_410 = uStack_660;
              fVar60 = fVar60 * (float)local_4f8;
              fVar63 = fVar63 * local_4f8._4_4_;
              fVar64 = fVar64 * (float)uStack_4f0;
              fVar67 = fVar67 * uStack_4f0._4_4_;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_5e8 = local_6e8;
              uStack_5e0 = uStack_6e0;
              local_5f8 = 0x3eaaaaaa3eaaaaaa;
              uStack_5f0 = 0x3eaaaaaa3eaaaaaa;
              fVar60 = fVar60 + 0.3333333;
              fVar63 = fVar63 + 0.3333333;
              fVar64 = fVar64 + 0.3333333;
              fVar67 = fVar67 + 0.3333333;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_428 = local_6e8;
              uStack_420 = uStack_6e0;
              local_438 = local_668;
              uStack_430 = uStack_660;
              fVar60 = fVar60 * (float)local_4f8;
              fVar63 = fVar63 * local_4f8._4_4_;
              fVar64 = fVar64 * (float)uStack_4f0;
              fVar67 = fVar67 * uStack_4f0._4_4_;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_458 = CONCAT44(fStack_6d4,local_6d8);
              uStack_450 = CONCAT44(fStack_6cc,fStack_6d0);
              local_448 = local_6e8;
              uStack_440 = uStack_6e0;
              fVar60 = fVar60 * local_6d8;
              fVar63 = fVar63 * fStack_6d4;
              fVar64 = fVar64 * fStack_6d0;
              fVar67 = fVar67 * fStack_6cc;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_468 = CONCAT44(fStack_6a4,local_6a8);
              uStack_460 = CONCAT44(fStack_69c,fStack_6a0);
              local_478 = 0xb95e8083b95e8083;
              uStack_470 = 0xb95e8083b95e8083;
              local_6c8 = CONCAT44(fStack_6a4 * -0.00021219444,local_6a8 * -0.00021219444);
              uStack_6c0 = CONCAT44(fStack_69c * -0.00021219444,fStack_6a0 * -0.00021219444);
              local_608 = local_6e8;
              uStack_600 = uStack_6e0;
              local_618 = local_6c8;
              uStack_610 = uStack_6c0;
              fVar60 = fVar60 + local_6a8 * -0.00021219444;
              fVar63 = fVar63 + fStack_6a4 * -0.00021219444;
              fVar64 = fVar64 + fStack_6a0 * -0.00021219444;
              fVar67 = fVar67 + fStack_69c * -0.00021219444;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_488 = CONCAT44(fStack_6d4,local_6d8);
              uStack_480 = CONCAT44(fStack_6cc,fStack_6d0);
              local_498 = 0x3f0000003f000000;
              uStack_490 = 0x3f0000003f000000;
              local_6c8 = CONCAT44(fStack_6d4 * 0.5,local_6d8 * 0.5);
              uStack_6c0 = CONCAT44(fStack_6cc * 0.5,fStack_6d0 * 0.5);
              local_2b8 = local_6e8;
              uStack_2b0 = uStack_6e0;
              local_2c8 = local_6c8;
              uStack_2c0 = uStack_6c0;
              fVar60 = fVar60 - local_6d8 * 0.5;
              fVar63 = fVar63 - fStack_6d4 * 0.5;
              fVar64 = fVar64 - fStack_6d0 * 0.5;
              fVar67 = fVar67 - fStack_6cc * 0.5;
              local_6e8 = CONCAT44(fVar63,fVar60);
              uStack_6e0 = CONCAT44(fVar67,fVar64);
              local_4a8 = CONCAT44(fStack_6a4,local_6a8);
              uStack_4a0 = CONCAT44(fStack_69c,fStack_6a0);
              local_4b8 = 0x3f3180003f318000;
              uStack_4b0 = 0x3f3180003f318000;
              local_6c8 = CONCAT44(fStack_6a4 * 0.6933594,local_6a8 * 0.6933594);
              uStack_6c0 = CONCAT44(fStack_69c * 0.6933594,fStack_6a0 * 0.6933594);
              local_628 = local_668;
              uStack_620 = uStack_660;
              local_638 = local_6e8;
              uStack_630 = uStack_6e0;
              local_4f8._0_4_ = (float)local_4f8 + fVar60;
              local_4f8._4_4_ = local_4f8._4_4_ + fVar63;
              uStack_4f0._0_4_ = (float)uStack_4f0 + fVar64;
              uStack_4f0._4_4_ = uStack_4f0._4_4_ + fVar67;
              local_668 = CONCAT44(local_4f8._4_4_,(float)local_4f8);
              uStack_660._0_4_ = (float)uStack_4f0;
              uStack_660._4_4_ = uStack_4f0._4_4_;
              local_648 = local_668;
              uStack_640 = uStack_660;
              local_658 = local_6c8;
              uStack_650 = uStack_6c0;
              local_668 = CONCAT44(local_4f8._4_4_ + fStack_6a4 * 0.6933594,
                                   (float)local_4f8 + local_6a8 * 0.6933594);
              uStack_660._0_4_ = (float)uStack_4f0 + fStack_6a0 * 0.6933594;
              uStack_660._4_4_ = uStack_4f0._4_4_ + fStack_69c * 0.6933594;
              local_158 = CONCAT44(iStack_694,local_698);
              uStack_150 = CONCAT44(iStack_68c,iStack_690);
              local_148 = local_668;
              uStack_140 = uStack_660;
              local_1198 = local_668 | local_158;
              uStack_1190 = uStack_660 | uStack_150;
              uStack_660 = uStack_1190;
              local_668 = local_1198;
              local_114c = 0x3f800000;
              local_1168 = 0x3f800000;
              uStack_1164 = 0x3f800000;
              uStack_1160 = 0x3f800000;
              uStack_115c = 0x3f800000;
              local_11a8 = 0x3f8000003f800000;
              uStack_11a0 = 0x3f8000003f800000;
              local_116c = 0x40000000;
              local_1188 = 0x40000000;
              uStack_1184 = 0x40000000;
              uStack_1180 = 0x40000000;
              uStack_117c = 0x40000000;
              local_11b8 = 0x4000000040000000;
              uStack_11b0 = 0x4000000040000000;
              local_1118._0_4_ = (float)local_1198;
              local_1118._4_4_ = (float)(local_1198 >> 0x20);
              uStack_1110._0_4_ = (float)uStack_1190;
              uStack_1110._4_4_ = (float)(uStack_1190 >> 0x20);
              local_10f8 = (float)local_1118 * 2.0;
              fStack_10f4 = local_1118._4_4_ * 2.0;
              fStack_10f0 = (float)uStack_1110 * 2.0;
              fStack_10ec = uStack_1110._4_4_ * 2.0;
              local_10cc = 0x3f800000;
              local_10e8 = 0x3f800000;
              uStack_10e4 = 0x3f800000;
              uStack_10e0 = 0x3f800000;
              uStack_10dc = 0x3f800000;
              local_1108 = 0x3f8000003f800000;
              uStack_1100 = 0x3f8000003f800000;
              local_10a8 = 0;
              uStack_10a0 = 0;
              local_cd8 = CONCAT44(fStack_10f4,local_10f8);
              uStack_cd0 = CONCAT44(fStack_10ec,fStack_10f0);
              local_cc8 = 0;
              uStack_cc0 = 0;
              local_ff8 = CONCAT44(0.0 - fStack_10f4,0.0 - local_10f8);
              uStack_ff0._0_4_ = 0.0 - fStack_10f0;
              uStack_ff0._4_4_ = 0.0 - fStack_10ec;
              local_d68 = 0;
              uStack_d60 = 0;
              local_1038 = 0x3f8000003f800000;
              uStack_1030 = 0x3f8000003f800000;
              local_d48 = local_ff8;
              uStack_d40 = uStack_ff0;
              local_d58 = 0x42b0c0a542b0c0a5;
              uStack_d50 = 0x42b0c0a542b0c0a5;
              auVar43._8_8_ = uStack_ff0;
              auVar43._0_8_ = local_ff8;
              auVar42._8_8_ = 0x42b0c0a542b0c0a5;
              auVar42._0_8_ = 0x42b0c0a542b0c0a5;
              auVar55 = minps(auVar43,auVar42);
              local_ff8 = auVar55._0_8_;
              uStack_ff0 = auVar55._8_8_;
              local_d78 = local_ff8;
              uStack_d70 = uStack_ff0;
              local_d88 = 0xc2b0c0a5c2b0c0a5;
              uStack_d80 = 0xc2b0c0a5c2b0c0a5;
              auVar41._8_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar55 = maxps(auVar55,auVar41);
              local_ff8 = auVar55._0_8_;
              uStack_ff0 = auVar55._8_8_;
              local_d98 = local_ff8;
              uVar3 = local_d98;
              uStack_d90 = uStack_ff0;
              uVar4 = uStack_d90;
              local_da8 = 0x3fb8aa3b3fb8aa3b;
              uStack_da0 = 0x3fb8aa3b3fb8aa3b;
              local_d98._0_4_ = auVar55._0_4_;
              local_d98._4_4_ = auVar55._4_4_;
              uStack_d90._0_4_ = auVar55._8_4_;
              uStack_d90._4_4_ = auVar55._12_4_;
              local_ef8 = CONCAT44(local_d98._4_4_ * 1.442695,(float)local_d98 * 1.442695);
              uStack_ef0 = CONCAT44(uStack_d90._4_4_ * 1.442695,(float)uStack_d90 * 1.442695);
              local_f08 = 0x3f0000003f000000;
              uStack_f00 = 0x3f0000003f000000;
              fVar60 = (float)local_d98 * 1.442695 + 0.5;
              fVar63 = local_d98._4_4_ * 1.442695 + 0.5;
              fVar64 = (float)uStack_d90 * 1.442695 + 0.5;
              fVar67 = uStack_d90._4_4_ * 1.442695 + 0.5;
              local_c88 = CONCAT44(fVar63,fVar60);
              uStack_c80 = CONCAT44(fVar67,fVar64);
              local_c78 = CONCAT44((int)fVar63,(int)fVar60);
              uStack_c70 = CONCAT44((int)fVar67,(int)fVar64);
              local_1018 = (float)(int)fVar60;
              fStack_1014 = (float)(int)fVar63;
              fStack_1010 = (float)(int)fVar64;
              fStack_100c = (float)(int)fVar67;
              local_1008 = CONCAT44(fStack_1014,local_1018);
              uStack_1000 = CONCAT44(fStack_100c,fStack_1010);
              local_c68 = CONCAT44(fVar63,fVar60);
              uStack_c60 = CONCAT44(fVar67,fVar64);
              local_c58 = local_1008;
              uStack_c50 = uStack_1000;
              local_1048 = CONCAT44(-(uint)(fVar63 < fStack_1014),-(uint)(fVar60 < local_1018));
              uStack_1040 = CONCAT44(-(uint)(fVar67 < fStack_100c),-(uint)(fVar64 < fStack_1010));
              local_c38 = local_1048;
              uStack_c30 = uStack_1040;
              local_c48 = 0x3f8000003f800000;
              uStack_c40 = 0x3f8000003f800000;
              local_1048 = local_1048 & 0x3f8000003f800000;
              uStack_1040 = uStack_1040 & 0x3f8000003f800000;
              local_ce8 = local_1008;
              uStack_ce0 = uStack_1000;
              local_cf8._0_4_ = (float)local_1048;
              local_cf8._4_4_ = (float)(local_1048 >> 0x20);
              uStack_cf0._0_4_ = (float)uStack_1040;
              uStack_cf0._4_4_ = (float)(uStack_1040 >> 0x20);
              local_1018 = local_1018 - (float)local_cf8;
              fStack_1014 = fStack_1014 - local_cf8._4_4_;
              fStack_1010 = fStack_1010 - (float)uStack_cf0;
              fStack_100c = fStack_100c - uStack_cf0._4_4_;
              local_db8 = CONCAT44(fStack_1014,local_1018);
              uStack_db0 = CONCAT44(fStack_100c,fStack_1010);
              local_dc8 = 0x3f3180003f318000;
              uStack_dc0 = 0x3f3180003f318000;
              local_1008 = CONCAT44(fStack_1014 * 0.6933594,local_1018 * 0.6933594);
              uStack_1000 = CONCAT44(fStack_100c * 0.6933594,fStack_1010 * 0.6933594);
              local_dd8 = CONCAT44(fStack_1014,local_1018);
              uStack_dd0 = CONCAT44(fStack_100c,fStack_1010);
              local_de8 = 0xb95e8083b95e8083;
              uStack_de0 = 0xb95e8083b95e8083;
              local_d08 = local_ff8;
              uStack_d00 = uStack_ff0;
              local_d18 = local_1008;
              uStack_d10 = uStack_1000;
              local_d98._0_4_ = (float)local_d98 - local_1018 * 0.6933594;
              local_d98._4_4_ = local_d98._4_4_ - fStack_1014 * 0.6933594;
              uStack_d90._0_4_ = (float)uStack_d90 - fStack_1010 * 0.6933594;
              uStack_d90._4_4_ = uStack_d90._4_4_ - fStack_100c * 0.6933594;
              local_ff8 = CONCAT44(local_d98._4_4_,(float)local_d98);
              uStack_ff0._0_4_ = (float)uStack_d90;
              uStack_ff0._4_4_ = uStack_d90._4_4_;
              local_d38 = CONCAT44(fStack_1014 * -0.00021219444,local_1018 * -0.00021219444);
              uStack_d30 = CONCAT44(fStack_100c * -0.00021219444,fStack_1010 * -0.00021219444);
              local_d28 = local_ff8;
              uStack_d20 = uStack_ff0;
              local_d98._0_4_ = (float)local_d98 - local_1018 * -0.00021219444;
              local_d98._4_4_ = local_d98._4_4_ - fStack_1014 * -0.00021219444;
              uStack_d90._0_4_ = (float)uStack_d90 - fStack_1010 * -0.00021219444;
              uStack_d90._4_4_ = uStack_d90._4_4_ - fStack_100c * -0.00021219444;
              local_ff8 = CONCAT44(local_d98._4_4_,(float)local_d98);
              uStack_ff0._0_4_ = (float)uStack_d90;
              uStack_ff0._4_4_ = uStack_d90._4_4_;
              local_df8 = local_ff8;
              uStack_df0 = uStack_ff0;
              local_e08 = local_ff8;
              uStack_e00 = uStack_ff0;
              local_1058 = (float)local_d98 * (float)local_d98;
              fStack_1054 = local_d98._4_4_ * local_d98._4_4_;
              fStack_1050 = (float)uStack_d90 * (float)uStack_d90;
              fStack_104c = uStack_d90._4_4_ * uStack_d90._4_4_;
              local_e18 = 0x3950696739506967;
              uStack_e10 = 0x3950696739506967;
              local_e28 = local_ff8;
              uStack_e20 = uStack_ff0;
              local_1068 = CONCAT44(local_d98._4_4_ * 0.00019875691,(float)local_d98 * 0.00019875691
                                   );
              uStack_1060 = CONCAT44(uStack_d90._4_4_ * 0.00019875691,
                                     (float)uStack_d90 * 0.00019875691);
              local_f18 = local_1068;
              uStack_f10 = uStack_1060;
              local_f28 = 0x3ab743ce3ab743ce;
              uStack_f20 = 0x3ab743ce3ab743ce;
              local_1098 = (float)local_d98 * 0.00019875691 + 0.0013981999;
              fStack_1094 = local_d98._4_4_ * 0.00019875691 + 0.0013981999;
              fStack_1090 = (float)uStack_d90 * 0.00019875691 + 0.0013981999;
              fStack_108c = uStack_d90._4_4_ * 0.00019875691 + 0.0013981999;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_e38 = local_1068;
              uStack_e30 = uStack_1060;
              local_e48 = local_ff8;
              uStack_e40 = uStack_ff0;
              local_1098 = local_1098 * (float)local_d98;
              fStack_1094 = fStack_1094 * local_d98._4_4_;
              fStack_1090 = fStack_1090 * (float)uStack_d90;
              fStack_108c = fStack_108c * uStack_d90._4_4_;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_f38 = local_1068;
              uStack_f30 = uStack_1060;
              local_f48 = 0x3c0889083c088908;
              uStack_f40 = 0x3c0889083c088908;
              local_1098 = local_1098 + 0.008333452;
              fStack_1094 = fStack_1094 + 0.008333452;
              fStack_1090 = fStack_1090 + 0.008333452;
              fStack_108c = fStack_108c + 0.008333452;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_e58 = local_1068;
              uStack_e50 = uStack_1060;
              local_e68 = local_ff8;
              uStack_e60 = uStack_ff0;
              local_1098 = local_1098 * (float)local_d98;
              fStack_1094 = fStack_1094 * local_d98._4_4_;
              fStack_1090 = fStack_1090 * (float)uStack_d90;
              fStack_108c = fStack_108c * uStack_d90._4_4_;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_f58 = local_1068;
              uStack_f50 = uStack_1060;
              local_f68 = 0x3d2aa9c13d2aa9c1;
              uStack_f60 = 0x3d2aa9c13d2aa9c1;
              local_1098 = local_1098 + 0.041665796;
              fStack_1094 = fStack_1094 + 0.041665796;
              fStack_1090 = fStack_1090 + 0.041665796;
              fStack_108c = fStack_108c + 0.041665796;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_e78 = local_1068;
              uStack_e70 = uStack_1060;
              local_e88 = local_ff8;
              uStack_e80 = uStack_ff0;
              local_1098 = local_1098 * (float)local_d98;
              fStack_1094 = fStack_1094 * local_d98._4_4_;
              fStack_1090 = fStack_1090 * (float)uStack_d90;
              fStack_108c = fStack_108c * uStack_d90._4_4_;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_f78 = local_1068;
              uStack_f70 = uStack_1060;
              local_f88 = 0x3e2aaaaa3e2aaaaa;
              uStack_f80 = 0x3e2aaaaa3e2aaaaa;
              local_1098 = local_1098 + 0.16666666;
              fStack_1094 = fStack_1094 + 0.16666666;
              fStack_1090 = fStack_1090 + 0.16666666;
              fStack_108c = fStack_108c + 0.16666666;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_e98 = local_1068;
              uStack_e90 = uStack_1060;
              local_ea8 = local_ff8;
              uStack_ea0 = uStack_ff0;
              local_1098 = local_1098 * (float)local_d98;
              fStack_1094 = fStack_1094 * local_d98._4_4_;
              fStack_1090 = fStack_1090 * (float)uStack_d90;
              fStack_108c = fStack_108c * uStack_d90._4_4_;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_f98 = local_1068;
              uStack_f90 = uStack_1060;
              local_fa8 = 0x3f0000003f000000;
              uStack_fa0 = 0x3f0000003f000000;
              local_1098 = local_1098 + 0.5;
              fStack_1094 = fStack_1094 + 0.5;
              fStack_1090 = fStack_1090 + 0.5;
              fStack_108c = fStack_108c + 0.5;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_ec8 = CONCAT44(fStack_1054,local_1058);
              uStack_ec0 = CONCAT44(fStack_104c,fStack_1050);
              local_eb8 = local_1068;
              uStack_eb0 = uStack_1060;
              local_1098 = local_1098 * local_1058;
              fStack_1094 = fStack_1094 * fStack_1054;
              fStack_1090 = fStack_1090 * fStack_1050;
              fStack_108c = fStack_108c * fStack_104c;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_fb8 = local_1068;
              uStack_fb0 = uStack_1060;
              local_fc8 = local_ff8;
              uStack_fc0 = uStack_ff0;
              local_1098 = local_1098 + (float)local_d98;
              fStack_1094 = fStack_1094 + local_d98._4_4_;
              fStack_1090 = fStack_1090 + (float)uStack_d90;
              fStack_108c = fStack_108c + uStack_d90._4_4_;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_fd8 = local_1068;
              uStack_fd0 = uStack_1060;
              local_fe8 = 0x3f8000003f800000;
              uStack_fe0 = 0x3f8000003f800000;
              local_1098 = local_1098 + 1.0;
              fStack_1094 = fStack_1094 + 1.0;
              fStack_1090 = fStack_1090 + 1.0;
              fStack_108c = fStack_108c + 1.0;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_c98 = CONCAT44(fStack_1014,local_1018);
              uStack_c90 = CONCAT44(fStack_100c,fStack_1010);
              local_c18 = CONCAT44((int)fStack_1014,(int)local_1018);
              uStack_c10 = CONCAT44((int)fStack_100c,(int)fStack_1010);
              local_c28 = 0x7f0000007f;
              uStack_c20 = 0x7f0000007f;
              iVar53 = (int)local_1018 + 0x7f;
              fStack_1024 = (float)((int)fStack_1014 + 0x7f);
              fStack_1020 = (float)((int)fStack_1010 + 0x7f);
              fStack_101c = (float)((int)fStack_100c + 0x7f);
              local_bf8 = CONCAT44(fStack_1024,iVar53);
              uStack_bf0 = CONCAT44(fStack_101c,fStack_1020);
              local_bfc = 0x17;
              local_1028 = (float)(iVar53 * 0x800000);
              local_1078 = CONCAT44(fStack_1024,local_1028);
              uStack_1070 = CONCAT44(fStack_101c,fStack_1020);
              local_ed8 = local_1068;
              uStack_ed0 = uStack_1060;
              local_1098 = local_1098 * local_1028;
              fStack_1094 = fStack_1094 * fStack_1024;
              fStack_1090 = fStack_1090 * fStack_1020;
              fStack_108c = fStack_108c * fStack_101c;
              local_1068 = CONCAT44(fStack_1094,local_1098);
              uStack_1060 = CONCAT44(fStack_108c,fStack_1090);
              local_10c8 = local_1068;
              uStack_10c0 = uStack_1060;
              local_1098 = local_1098 + 1.0;
              fStack_1094 = fStack_1094 + 1.0;
              fStack_1090 = fStack_1090 + 1.0;
              fStack_108c = fStack_108c + 1.0;
              auVar40._8_8_ = 0x3f8000003f800000;
              auVar40._0_8_ = 0x3f8000003f800000;
              auVar39._4_4_ = fStack_1094;
              auVar39._0_4_ = local_1098;
              auVar39._8_4_ = fStack_1090;
              auVar39._12_4_ = fStack_108c;
              _local_1138 = divps(auVar40,auVar39);
              local_ca8 = (float)local_1138._0_4_ * 2.0;
              fStack_ca4 = (float)local_1138._4_4_ * 2.0;
              fStack_ca0 = fStack_1130 * 2.0;
              fStack_c9c = fStack_112c * 2.0;
              local_2c48 = CONCAT44(fStack_ca4 - 1.0,local_ca8 - 1.0);
              uStack_2c40 = CONCAT44(fStack_c9c - 1.0,fStack_ca0 - 1.0);
              local_2c38._8_8_ = uStack_3680;
              local_2c38._0_8_ = local_3688;
              local_31d8._4_4_ = local_1ab8._4_4_ * (fStack_ca4 - 1.0);
              local_31d8._0_4_ = (float)local_1ab8 * (local_ca8 - 1.0);
              uStack_31d0._4_4_ = uStack_1ab0._4_4_ * (fStack_c9c - 1.0);
              uStack_31d0._0_4_ = (float)uStack_1ab0 * (fStack_ca0 - 1.0);
              local_2488 = local_2618;
              uStack_2480 = uStack_2610;
              local_2338 = uVar1;
              uStack_2330 = uVar2;
              local_1b58 = local_25e8;
              uStack_1b50 = uStack_25e0;
              local_17b8 = local_2618;
              uStack_17b0 = uStack_2610;
              local_1148 = local_11b8;
              uStack_1140 = uStack_11b0;
              local_1128 = local_11b8;
              uStack_1120 = uStack_11b0;
              local_1118 = local_1198;
              uStack_1110 = uStack_1190;
              local_10b8 = local_1108;
              uStack_10b0 = uStack_1100;
              local_1088 = local_1108;
              uStack_1080 = uStack_1100;
              local_ee8 = local_1078;
              uStack_ee0 = uStack_1070;
              local_d98 = uVar3;
              uStack_d90 = uVar4;
              local_cf8 = local_1048;
              uStack_cf0 = uStack_1040;
              local_cb8 = local_11a8;
              uStack_cb0 = uStack_11a0;
              local_be8 = local_1078;
              uStack_be0 = uStack_1070;
              local_4f8 = uVar61;
              uStack_4f0 = uVar65;
              local_2a8 = uVar62;
              uStack_2a0 = uVar66;
              local_228 = local_278;
              uStack_220 = uStack_270;
              local_1a8 = uVar48;
              uStack_1a0 = uVar49;
              local_88 = local_278;
              uStack_80 = uStack_270;
              break;
            case 6:
              pfVar51 = ncnn::Mat::operator[](local_31f8,0);
              local_31a8 = *pfVar51;
              local_3228 = CONCAT44(local_31a8,local_31a8);
              uStack_3220 = CONCAT44(local_31a8,local_31a8);
              fStack_31a4 = local_31a8;
              fStack_31a0 = local_31a8;
              fStack_319c = local_31a8;
              local_318c = local_31a8;
              pfVar51 = ncnn::Mat::operator[](local_31f8,1);
              local_31c8 = *pfVar51;
              local_3238 = CONCAT44(local_31c8,local_31c8);
              uStack_3230 = CONCAT44(local_31c8,local_31c8);
              local_2b88 = local_31e8;
              uStack_2b80 = uStack_31e0;
              local_2b98 = local_3228;
              uStack_2b90 = uStack_3220;
              local_2b5c = 0x3f800000;
              local_2b78 = 0x3f800000;
              uStack_2b74 = 0x3f800000;
              uStack_2b70 = 0x3f800000;
              uStack_2b6c = 0x3f800000;
              local_2bb8 = 0x3f8000003f800000;
              uStack_2bb0 = 0x3f8000003f800000;
              local_2b08 = local_31e8;
              uVar3 = local_2b08;
              uStack_2b00 = uStack_31e0;
              uVar4 = uStack_2b00;
              local_2b18 = local_3228;
              uVar1 = local_2b18;
              uStack_2b10 = uStack_3220;
              uVar2 = uStack_2b10;
              local_2b08._0_4_ = (float)local_31e8;
              local_2b08._4_4_ = (float)((ulong)local_31e8 >> 0x20);
              uStack_2b00._0_4_ = (float)uStack_31e0;
              uStack_2b00._4_4_ = (float)((ulong)uStack_31e0 >> 0x20);
              local_2b18._0_4_ = (float)local_3228;
              local_2b18._4_4_ = (float)((ulong)local_3228 >> 0x20);
              uStack_2b10._0_4_ = (float)uStack_3220;
              uStack_2b10._4_4_ = (float)((ulong)uStack_3220 >> 0x20);
              local_2b48 = (float)local_2b08 * (float)local_2b18;
              fStack_2b44 = local_2b08._4_4_ * local_2b18._4_4_;
              fStack_2b40 = (float)uStack_2b00 * (float)uStack_2b10;
              fStack_2b3c = uStack_2b00._4_4_ * uStack_2b10._4_4_;
              local_2ba8._4_4_ = fStack_2b44 + local_31c8;
              local_2ba8._0_4_ = local_2b48 + local_31c8;
              uStack_2ba0._0_4_ = fStack_2b40 + local_31c8;
              uStack_2ba0._4_4_ = fStack_2b3c + local_31c8;
              local_2ad8 = 0;
              uStack_2ad0 = 0;
              local_2ae8 = local_2ba8;
              uStack_2ae0 = uStack_2ba0;
              local_2af8 = 0;
              uStack_2af0 = 0;
              auVar55._8_8_ = uStack_2ba0;
              auVar55._0_8_ = local_2ba8;
              auVar55 = maxps(auVar55,ZEXT816(0));
              local_2ba8 = auVar55._0_8_;
              uStack_2ba0 = auVar55._8_8_;
              local_2ab8 = local_2ba8;
              uStack_2ab0 = uStack_2ba0;
              auVar17._8_8_ = 0x3f8000003f800000;
              auVar17._0_8_ = 0x3f8000003f800000;
              _local_2ba8 = minps(auVar55,auVar17);
              local_2b38 = local_31e8;
              uStack_2b30 = uStack_31e0;
              local_2b28._0_4_ = local_2ba8._0_4_;
              local_2b28._4_4_ = local_2ba8._4_4_;
              fStack_2b20 = local_2ba8._8_4_;
              fStack_2b1c = local_2ba8._12_4_;
              local_31d8._4_4_ = (float)local_2b28._4_4_ * local_2b08._4_4_;
              local_31d8._0_4_ = (float)local_2b28._0_4_ * (float)local_2b08;
              uStack_31d0._0_4_ = fStack_2b20 * (float)uStack_2b00;
              uStack_31d0._4_4_ = fStack_2b1c * uStack_2b00._4_4_;
              fStack_31c4 = local_31c8;
              fStack_31c0 = local_31c8;
              fStack_31bc = local_31c8;
              local_31ac = local_31c8;
              local_2b58 = local_3238;
              uStack_2b50 = uStack_3230;
              _local_2b28 = _local_2ba8;
              local_2b18 = uVar1;
              uStack_2b10 = uVar2;
              local_2b08 = uVar3;
              uStack_2b00 = uVar4;
              local_2ac8 = local_2bb8;
              uStack_2ac0 = uStack_2bb0;
              break;
            default:
              uStack_31d0 = uStack_3680;
              local_31d8 = (undefined1  [8])local_3688;
            }
            local_3688 = local_31d8;
            uStack_3680 = uStack_31d0;
            local_3110 = local_3668;
            local_3128 = local_31d8;
            uStack_3120 = uStack_31d0;
            *(undefined1 (*) [8])local_3668 = local_31d8;
            *(undefined8 *)(local_3668 + 2) = uStack_31d0;
            local_3668 = local_3668 + 4;
          }
        }
      }
      if ((local_35e4 == 1) && (local_3644 == 4)) {
        for (local_377c = 0; local_377c < local_3658; local_377c = local_377c + 1) {
          local_3788 = ncnn::Mat::row(local_35c8,local_377c);
          for (local_378c = 0; local_378c < local_3654; local_378c = local_378c + 1) {
            local_3578 = 0;
            local_3588 = 0;
            uStack_3584 = 0;
            uStack_3580 = 0;
            uStack_357c = 0;
            local_37a8 = 0;
            uStack_37a0 = 0;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) != 0) {
              local_34b8 = ncnn::Mat::operator_cast_to_float_
                                     ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 400));
              local_34b8 = local_34b8 + (local_377c << 2);
              local_37a8 = *(undefined8 *)local_34b8;
              uStack_37a0 = *(undefined8 *)(local_34b8 + 2);
            }
            ncnn::Mat::channel(in_stack_ffffffffffffc2c8,
                               (int)((ulong)in_stack_ffffffffffffc2c0 >> 0x20));
            pfVar51 = ncnn::Mat::operator_cast_to_float_(&local_37f8);
            ncnn::Mat::~Mat((Mat *)0x916938);
            local_37b0 = pfVar51;
            for (local_37fc = 0; uVar4 = uStack_1ad0, uVar3 = local_1ad8, uVar2 = uStack_37a0,
                uVar1 = local_37a8, local_37fc < local_35d8; local_37fc = local_37fc + 1) {
              local_3808 = ncnn::Mat::row(&local_3630,local_37fc);
              local_3808 = local_3808 +
                           local_378c * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
              for (local_380c = 0;
                  local_380c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_380c = local_380c + 1) {
                local_35a8 = *local_3808;
                local_3828 = CONCAT44(local_35a8,local_35a8);
                uStack_3820 = CONCAT44(local_35a8,local_35a8);
                local_34c0 = local_37b0;
                local_3838 = *(undefined8 *)local_37b0;
                uStack_3830 = *(undefined8 *)(local_37b0 + 2);
                local_33c8._0_4_ = (float)local_3838;
                local_33c8._4_4_ = (float)((ulong)local_3838 >> 0x20);
                uStack_33c0._0_4_ = (float)uStack_3830;
                uStack_33c0._4_4_ = (float)((ulong)uStack_3830 >> 0x20);
                local_3478._4_4_ = local_35a8 * local_33c8._4_4_;
                local_3478._0_4_ = local_35a8 * (float)local_33c8;
                local_3478._8_4_ = local_35a8 * (float)uStack_33c0;
                local_3478._12_4_ = local_35a8 * uStack_33c0._4_4_;
                uVar1 = local_37a8;
                uVar2 = uStack_37a0;
                local_3488._0_4_ = (float)local_37a8;
                local_3488._4_4_ = (float)((ulong)local_37a8 >> 0x20);
                uStack_3480._0_4_ = (float)uStack_37a0;
                uStack_3480._4_4_ = (float)((ulong)uStack_37a0 >> 0x20);
                local_37a8 = CONCAT44(local_35a8 * local_33c8._4_4_ + local_3488._4_4_,
                                      local_35a8 * (float)local_33c8 + (float)local_3488);
                uStack_37a0 = CONCAT44(local_35a8 * uStack_33c0._4_4_ + uStack_3480._4_4_,
                                       local_35a8 * (float)uStack_33c0 + (float)uStack_3480);
                local_3808 = local_3808 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)
                ;
                local_37b0 = local_37b0 + 4;
                fStack_35a4 = local_35a8;
                fStack_35a0 = local_35a8;
                fStack_359c = local_35a8;
                local_3598 = local_35a8;
                local_3488 = uVar1;
                uStack_3480 = uVar2;
                local_33c8 = local_3838;
                uStack_33c0 = uStack_3830;
                local_33b8 = local_3828;
                uStack_33b0 = uStack_3820;
              }
            }
            local_32dc = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
            local_32e8 = (Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
            local_32d8 = local_37a8;
            uStack_32d0 = uStack_37a0;
            uStack_1ad0._0_4_ = (float)uStack_37a0;
            fVar64 = (float)uStack_1ad0;
            uStack_1ad0._4_4_ = (float)((ulong)uStack_37a0 >> 0x20);
            fVar67 = uStack_1ad0._4_4_;
            local_1ad8._0_4_ = (float)local_37a8;
            fVar60 = (float)local_1ad8;
            local_1ad8._4_4_ = (float)((ulong)local_37a8 >> 0x20);
            fVar63 = local_1ad8._4_4_;
            local_1ad8 = uVar3;
            uStack_1ad0 = uVar4;
            switch(local_32dc) {
            case 1:
              local_2fc8 = 0;
              uStack_2fc0 = 0;
              local_3008 = local_37a8;
              uStack_3000 = uStack_37a0;
              local_3018 = 0;
              uStack_3010 = 0;
              auVar8._8_8_ = uStack_37a0;
              auVar8._0_8_ = local_37a8;
              _local_32c8 = maxps(auVar8,ZEXT816(0));
              break;
            case 2:
              pfVar51 = ncnn::Mat::operator[](local_32e8,0);
              local_2eac = *pfVar51;
              local_2ea8 = uVar1;
              uStack_2ea0 = uVar2;
              local_2e08 = 0;
              uStack_2e00 = 0;
              local_2e28 = 0;
              uStack_2e20 = 0;
              local_2e38 = uVar1;
              uStack_2e30 = uVar2;
              auVar12._8_8_ = uVar2;
              auVar12._0_8_ = uVar1;
              local_2ec8 = maxps(ZEXT816(0),auVar12);
              local_2e18 = 0;
              uStack_2e10 = 0;
              local_2de8 = 0;
              uStack_2de0 = 0;
              local_2df8 = uVar1;
              uStack_2df0 = uVar2;
              auVar13._8_8_ = uVar2;
              auVar13._0_8_ = uVar1;
              local_2ed8 = minps(ZEXT816(0),auVar13);
              local_2e48 = CONCAT44(local_2eac,local_2eac);
              uStack_2e40 = CONCAT44(local_2eac,local_2eac);
              local_2e58 = local_2ed8._0_8_;
              uVar1 = local_2e58;
              uStack_2e50 = local_2ed8._8_8_;
              uVar2 = uStack_2e50;
              local_2e58._0_4_ = local_2ed8._0_4_;
              local_2e58._4_4_ = local_2ed8._4_4_;
              uStack_2e50._0_4_ = local_2ed8._8_4_;
              uStack_2e50._4_4_ = local_2ed8._12_4_;
              local_2e78 = local_2eac * (float)local_2e58;
              fStack_2e74 = local_2eac * local_2e58._4_4_;
              fStack_2e70 = local_2eac * (float)uStack_2e50;
              fStack_2e6c = local_2eac * uStack_2e50._4_4_;
              local_2e68._0_4_ = local_2ec8._0_4_;
              local_2e68._4_4_ = local_2ec8._4_4_;
              fStack_2e60 = local_2ec8._8_4_;
              fStack_2e5c = local_2ec8._12_4_;
              local_32c8._4_4_ = (float)local_2e68._4_4_ + fStack_2e74;
              local_32c8._0_4_ = (float)local_2e68._0_4_ + local_2e78;
              uStack_32c0._4_4_ = fStack_2e5c + fStack_2e6c;
              uStack_32c0._0_4_ = fStack_2e60 + fStack_2e70;
              local_2e98 = local_2eac;
              fStack_2e94 = local_2eac;
              fStack_2e90 = local_2eac;
              fStack_2e8c = local_2eac;
              local_2e88 = local_2eac;
              _local_2e68 = local_2ec8;
              local_2e58 = uVar1;
              uStack_2e50 = uVar2;
              break;
            case 3:
              pfVar51 = ncnn::Mat::operator[](local_32e8,0);
              local_3258 = *pfVar51;
              local_32f8 = CONCAT44(local_3258,local_3258);
              uStack_32f0 = CONCAT44(local_3258,local_3258);
              fStack_3254 = local_3258;
              fStack_3250 = local_3258;
              fStack_324c = local_3258;
              local_323c = local_3258;
              pfVar51 = ncnn::Mat::operator[](local_32e8,1);
              local_3278 = *pfVar51;
              local_3308 = CONCAT44(local_3278,local_3278);
              uStack_3300 = CONCAT44(local_3278,local_3278);
              local_2fe8 = local_32d8;
              uStack_2fe0 = uStack_32d0;
              local_2ff8 = local_32f8;
              uStack_2ff0 = uStack_32f0;
              auVar10._8_8_ = uStack_32d0;
              auVar10._0_8_ = local_32d8;
              auVar9._8_8_ = uStack_32f0;
              auVar9._0_8_ = local_32f8;
              local_2d88 = maxps(auVar10,auVar9);
              auVar16._8_8_ = uStack_3300;
              auVar16._0_8_ = local_3308;
              _local_32c8 = minps(local_2d88,auVar16);
              fStack_3274 = local_3278;
              fStack_3270 = local_3278;
              fStack_326c = local_3278;
              local_3268 = local_3278;
              local_2d98 = local_3308;
              uStack_2d90 = uStack_3300;
              break;
            case 4:
              local_2cf8 = local_37a8;
              uStack_2cf0 = uStack_37a0;
              local_2ccc = 0x3f800000;
              local_2ce8 = 0x3f800000;
              uStack_2ce4 = 0x3f800000;
              uStack_2ce0 = 0x3f800000;
              uStack_2cdc = 0x3f800000;
              local_2d08 = 0x3f8000003f800000;
              uStack_2d00 = 0x3f8000003f800000;
              local_2ca8 = 0;
              uStack_2ca0 = 0;
              local_1ac8 = 0;
              uStack_1ac0 = 0;
              local_1ad8 = local_37a8;
              uStack_1ad0 = uStack_37a0;
              local_2258 = CONCAT44(0.0 - fVar63,0.0 - fVar60);
              uStack_2250._0_4_ = 0.0 - fVar64;
              uStack_2250._4_4_ = 0.0 - fVar67;
              local_1fc8 = 0;
              uStack_1fc0 = 0;
              local_2298 = 0x3f8000003f800000;
              uStack_2290 = 0x3f8000003f800000;
              local_1fa8 = local_2258;
              uStack_1fa0 = uStack_2250;
              local_1fb8 = 0x42b0c0a542b0c0a5;
              uStack_1fb0 = 0x42b0c0a542b0c0a5;
              auVar30._8_8_ = uStack_2250;
              auVar30._0_8_ = local_2258;
              auVar29._8_8_ = 0x42b0c0a542b0c0a5;
              auVar29._0_8_ = 0x42b0c0a542b0c0a5;
              auVar55 = minps(auVar30,auVar29);
              local_2258 = auVar55._0_8_;
              uStack_2250 = auVar55._8_8_;
              local_1fd8 = local_2258;
              uStack_1fd0 = uStack_2250;
              local_1fe8 = 0xc2b0c0a5c2b0c0a5;
              uStack_1fe0 = 0xc2b0c0a5c2b0c0a5;
              auVar28._8_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar55 = maxps(auVar55,auVar28);
              local_2258 = auVar55._0_8_;
              uStack_2250 = auVar55._8_8_;
              local_1ff8 = local_2258;
              uVar1 = local_1ff8;
              uStack_1ff0 = uStack_2250;
              uVar2 = uStack_1ff0;
              local_2008 = 0x3fb8aa3b3fb8aa3b;
              uStack_2000 = 0x3fb8aa3b3fb8aa3b;
              local_1ff8._0_4_ = auVar55._0_4_;
              local_1ff8._4_4_ = auVar55._4_4_;
              uStack_1ff0._0_4_ = auVar55._8_4_;
              uStack_1ff0._4_4_ = auVar55._12_4_;
              local_2158 = CONCAT44(local_1ff8._4_4_ * 1.442695,(float)local_1ff8 * 1.442695);
              uStack_2150 = CONCAT44(uStack_1ff0._4_4_ * 1.442695,(float)uStack_1ff0 * 1.442695);
              local_2168 = 0x3f0000003f000000;
              uStack_2160 = 0x3f0000003f000000;
              fVar60 = (float)local_1ff8 * 1.442695 + 0.5;
              fVar63 = local_1ff8._4_4_ * 1.442695 + 0.5;
              fVar64 = (float)uStack_1ff0 * 1.442695 + 0.5;
              fVar67 = uStack_1ff0._4_4_ * 1.442695 + 0.5;
              local_1a68 = CONCAT44(fVar63,fVar60);
              uStack_1a60 = CONCAT44(fVar67,fVar64);
              local_1a08 = CONCAT44((int)fVar63,(int)fVar60);
              uStack_1a00 = CONCAT44((int)fVar67,(int)fVar64);
              local_2278 = (float)(int)fVar60;
              fStack_2274 = (float)(int)fVar63;
              fStack_2270 = (float)(int)fVar64;
              fStack_226c = (float)(int)fVar67;
              local_2268 = CONCAT44(fStack_2274,local_2278);
              uStack_2260 = CONCAT44(fStack_226c,fStack_2270);
              local_19b8 = CONCAT44(fVar63,fVar60);
              uStack_19b0 = CONCAT44(fVar67,fVar64);
              local_19a8 = local_2268;
              uStack_19a0 = uStack_2260;
              local_22a8 = CONCAT44(-(uint)(fVar63 < fStack_2274),-(uint)(fVar60 < local_2278));
              uStack_22a0 = CONCAT44(-(uint)(fVar67 < fStack_226c),-(uint)(fVar64 < fStack_2270));
              local_1928 = local_22a8;
              uStack_1920 = uStack_22a0;
              local_1938 = 0x3f8000003f800000;
              uStack_1930 = 0x3f8000003f800000;
              local_22a8 = local_22a8 & 0x3f8000003f800000;
              uStack_22a0 = uStack_22a0 & 0x3f8000003f800000;
              local_1ba8 = local_2268;
              uStack_1ba0 = uStack_2260;
              local_1bb8._0_4_ = (float)local_22a8;
              local_1bb8._4_4_ = (float)(local_22a8 >> 0x20);
              uStack_1bb0._0_4_ = (float)uStack_22a0;
              uStack_1bb0._4_4_ = (float)(uStack_22a0 >> 0x20);
              local_2278 = local_2278 - (float)local_1bb8;
              fStack_2274 = fStack_2274 - local_1bb8._4_4_;
              fStack_2270 = fStack_2270 - (float)uStack_1bb0;
              fStack_226c = fStack_226c - uStack_1bb0._4_4_;
              local_2018 = CONCAT44(fStack_2274,local_2278);
              uStack_2010 = CONCAT44(fStack_226c,fStack_2270);
              local_2028 = 0x3f3180003f318000;
              uStack_2020 = 0x3f3180003f318000;
              local_2268 = CONCAT44(fStack_2274 * 0.6933594,local_2278 * 0.6933594);
              uStack_2260 = CONCAT44(fStack_226c * 0.6933594,fStack_2270 * 0.6933594);
              local_2038 = CONCAT44(fStack_2274,local_2278);
              uStack_2030 = CONCAT44(fStack_226c,fStack_2270);
              local_2048 = 0xb95e8083b95e8083;
              uStack_2040 = 0xb95e8083b95e8083;
              local_1bc8 = local_2258;
              uStack_1bc0 = uStack_2250;
              local_1bd8 = local_2268;
              uStack_1bd0 = uStack_2260;
              local_1ff8._0_4_ = (float)local_1ff8 - local_2278 * 0.6933594;
              local_1ff8._4_4_ = local_1ff8._4_4_ - fStack_2274 * 0.6933594;
              uStack_1ff0._0_4_ = (float)uStack_1ff0 - fStack_2270 * 0.6933594;
              uStack_1ff0._4_4_ = uStack_1ff0._4_4_ - fStack_226c * 0.6933594;
              local_2258 = CONCAT44(local_1ff8._4_4_,(float)local_1ff8);
              uStack_2250._0_4_ = (float)uStack_1ff0;
              uStack_2250._4_4_ = uStack_1ff0._4_4_;
              local_1bf8 = CONCAT44(fStack_2274 * -0.00021219444,local_2278 * -0.00021219444);
              uStack_1bf0 = CONCAT44(fStack_226c * -0.00021219444,fStack_2270 * -0.00021219444);
              local_1be8 = local_2258;
              uStack_1be0 = uStack_2250;
              local_1ff8._0_4_ = (float)local_1ff8 - local_2278 * -0.00021219444;
              local_1ff8._4_4_ = local_1ff8._4_4_ - fStack_2274 * -0.00021219444;
              uStack_1ff0._0_4_ = (float)uStack_1ff0 - fStack_2270 * -0.00021219444;
              uStack_1ff0._4_4_ = uStack_1ff0._4_4_ - fStack_226c * -0.00021219444;
              local_2258 = CONCAT44(local_1ff8._4_4_,(float)local_1ff8);
              uStack_2250._0_4_ = (float)uStack_1ff0;
              uStack_2250._4_4_ = uStack_1ff0._4_4_;
              local_2058 = local_2258;
              uStack_2050 = uStack_2250;
              local_2068 = local_2258;
              uStack_2060 = uStack_2250;
              local_22b8 = (float)local_1ff8 * (float)local_1ff8;
              fStack_22b4 = local_1ff8._4_4_ * local_1ff8._4_4_;
              fStack_22b0 = (float)uStack_1ff0 * (float)uStack_1ff0;
              fStack_22ac = uStack_1ff0._4_4_ * uStack_1ff0._4_4_;
              local_2078 = 0x3950696739506967;
              uStack_2070 = 0x3950696739506967;
              local_2088 = local_2258;
              uStack_2080 = uStack_2250;
              local_22c8 = CONCAT44(local_1ff8._4_4_ * 0.00019875691,
                                    (float)local_1ff8 * 0.00019875691);
              uStack_22c0 = CONCAT44(uStack_1ff0._4_4_ * 0.00019875691,
                                     (float)uStack_1ff0 * 0.00019875691);
              local_2178 = local_22c8;
              uStack_2170 = uStack_22c0;
              local_2188 = 0x3ab743ce3ab743ce;
              uStack_2180 = 0x3ab743ce3ab743ce;
              local_2998 = (float)local_1ff8 * 0.00019875691 + 0.0013981999;
              fStack_2994 = local_1ff8._4_4_ * 0.00019875691 + 0.0013981999;
              fStack_2990 = (float)uStack_1ff0 * 0.00019875691 + 0.0013981999;
              fStack_298c = uStack_1ff0._4_4_ * 0.00019875691 + 0.0013981999;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_2098 = local_22c8;
              uStack_2090 = uStack_22c0;
              local_20a8 = local_2258;
              uStack_20a0 = uStack_2250;
              local_2998 = local_2998 * (float)local_1ff8;
              fStack_2994 = fStack_2994 * local_1ff8._4_4_;
              fStack_2990 = fStack_2990 * (float)uStack_1ff0;
              fStack_298c = fStack_298c * uStack_1ff0._4_4_;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_2198 = local_22c8;
              uStack_2190 = uStack_22c0;
              local_21a8 = 0x3c0889083c088908;
              uStack_21a0 = 0x3c0889083c088908;
              local_2998 = local_2998 + 0.008333452;
              fStack_2994 = fStack_2994 + 0.008333452;
              fStack_2990 = fStack_2990 + 0.008333452;
              fStack_298c = fStack_298c + 0.008333452;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_20b8 = local_22c8;
              uStack_20b0 = uStack_22c0;
              local_20c8 = local_2258;
              uStack_20c0 = uStack_2250;
              local_2998 = local_2998 * (float)local_1ff8;
              fStack_2994 = fStack_2994 * local_1ff8._4_4_;
              fStack_2990 = fStack_2990 * (float)uStack_1ff0;
              fStack_298c = fStack_298c * uStack_1ff0._4_4_;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_21b8 = local_22c8;
              uStack_21b0 = uStack_22c0;
              local_21c8 = 0x3d2aa9c13d2aa9c1;
              uStack_21c0 = 0x3d2aa9c13d2aa9c1;
              local_2998 = local_2998 + 0.041665796;
              fStack_2994 = fStack_2994 + 0.041665796;
              fStack_2990 = fStack_2990 + 0.041665796;
              fStack_298c = fStack_298c + 0.041665796;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_20d8 = local_22c8;
              uStack_20d0 = uStack_22c0;
              local_20e8 = local_2258;
              uStack_20e0 = uStack_2250;
              local_2998 = local_2998 * (float)local_1ff8;
              fStack_2994 = fStack_2994 * local_1ff8._4_4_;
              fStack_2990 = fStack_2990 * (float)uStack_1ff0;
              fStack_298c = fStack_298c * uStack_1ff0._4_4_;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_21d8 = local_22c8;
              uStack_21d0 = uStack_22c0;
              local_21e8 = 0x3e2aaaaa3e2aaaaa;
              uStack_21e0 = 0x3e2aaaaa3e2aaaaa;
              local_2998 = local_2998 + 0.16666666;
              fStack_2994 = fStack_2994 + 0.16666666;
              fStack_2990 = fStack_2990 + 0.16666666;
              fStack_298c = fStack_298c + 0.16666666;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_20f8 = local_22c8;
              uStack_20f0 = uStack_22c0;
              local_2108 = local_2258;
              uStack_2100 = uStack_2250;
              local_2998 = local_2998 * (float)local_1ff8;
              fStack_2994 = fStack_2994 * local_1ff8._4_4_;
              fStack_2990 = fStack_2990 * (float)uStack_1ff0;
              fStack_298c = fStack_298c * uStack_1ff0._4_4_;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_21f8 = local_22c8;
              uStack_21f0 = uStack_22c0;
              local_2208 = 0x3f0000003f000000;
              uStack_2200 = 0x3f0000003f000000;
              local_2998 = local_2998 + 0.5;
              fStack_2994 = fStack_2994 + 0.5;
              fStack_2990 = fStack_2990 + 0.5;
              fStack_298c = fStack_298c + 0.5;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_2128 = CONCAT44(fStack_22b4,local_22b8);
              uStack_2120 = CONCAT44(fStack_22ac,fStack_22b0);
              local_2118 = local_22c8;
              uStack_2110 = uStack_22c0;
              local_2998 = local_2998 * local_22b8;
              fStack_2994 = fStack_2994 * fStack_22b4;
              fStack_2990 = fStack_2990 * fStack_22b0;
              fStack_298c = fStack_298c * fStack_22ac;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_2218 = local_22c8;
              uStack_2210 = uStack_22c0;
              local_2228 = local_2258;
              uStack_2220 = uStack_2250;
              local_2998 = local_2998 + (float)local_1ff8;
              fStack_2994 = fStack_2994 + local_1ff8._4_4_;
              fStack_2990 = fStack_2990 + (float)uStack_1ff0;
              fStack_298c = fStack_298c + uStack_1ff0._4_4_;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_2238 = local_22c8;
              uStack_2230 = uStack_22c0;
              local_2248 = 0x3f8000003f800000;
              uStack_2240 = 0x3f8000003f800000;
              local_2998 = local_2998 + 1.0;
              fStack_2994 = fStack_2994 + 1.0;
              fStack_2990 = fStack_2990 + 1.0;
              fStack_298c = fStack_298c + 1.0;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_1a78 = CONCAT44(fStack_2274,local_2278);
              uStack_1a70 = CONCAT44(fStack_226c,fStack_2270);
              local_18a8 = CONCAT44((int)fStack_2274,(int)local_2278);
              uStack_18a0 = CONCAT44((int)fStack_226c,(int)fStack_2270);
              local_18b8 = 0x7f0000007f;
              uStack_18b0 = 0x7f0000007f;
              iVar53 = (int)local_2278 + 0x7f;
              fStack_2284 = (float)((int)fStack_2274 + 0x7f);
              fStack_2280 = (float)((int)fStack_2270 + 0x7f);
              fStack_227c = (float)((int)fStack_226c + 0x7f);
              local_1828 = CONCAT44(fStack_2284,iVar53);
              uStack_1820 = CONCAT44(fStack_227c,fStack_2280);
              local_182c = 0x17;
              local_2288 = (float)(iVar53 * 0x800000);
              local_22d8 = CONCAT44(fStack_2284,local_2288);
              uStack_22d0 = CONCAT44(fStack_227c,fStack_2280);
              local_2138 = local_22c8;
              uStack_2130 = uStack_22c0;
              local_2998 = local_2998 * local_2288;
              fStack_2994 = fStack_2994 * fStack_2284;
              fStack_2990 = fStack_2990 * fStack_2280;
              fStack_298c = fStack_298c * fStack_227c;
              local_22c8 = CONCAT44(fStack_2994,local_2998);
              uStack_22c0 = CONCAT44(fStack_298c,fStack_2990);
              local_2988._8_8_ = 0x3f8000003f800000;
              local_2988._0_8_ = 0x3f8000003f800000;
              local_2cc8 = local_22c8;
              uStack_2cc0 = uStack_22c0;
              local_2998 = local_2998 + 1.0;
              fStack_2994 = fStack_2994 + 1.0;
              fStack_2990 = fStack_2990 + 1.0;
              fStack_298c = fStack_298c + 1.0;
              auVar20._4_4_ = fStack_2994;
              auVar20._0_4_ = local_2998;
              auVar20._8_4_ = fStack_2990;
              auVar20._12_4_ = fStack_298c;
              _local_32c8 = divps(local_2988,auVar20);
              local_2cb8 = local_2d08;
              uStack_2cb0 = uStack_2d00;
              local_2148 = local_22d8;
              uStack_2140 = uStack_22d0;
              local_1ff8 = uVar1;
              uStack_1ff0 = uVar2;
              local_1bb8 = local_22a8;
              uStack_1bb0 = uStack_22a0;
              local_17c8 = local_22d8;
              uStack_17c0 = uStack_22d0;
              break;
            case 5:
              local_2c28 = local_37a8;
              uStack_2c20 = uStack_37a0;
              local_2648 = 0;
              uStack_2640 = 0;
              local_2918 = 0x3f8000003f800000;
              uStack_2910 = 0x3f8000003f800000;
              local_2628 = local_37a8;
              uStack_2620 = uStack_37a0;
              local_2638 = 0x42b0c0a542b0c0a5;
              uStack_2630 = 0x42b0c0a542b0c0a5;
              auVar24._8_8_ = uStack_37a0;
              auVar24._0_8_ = local_37a8;
              auVar23._8_8_ = 0x42b0c0a542b0c0a5;
              auVar23._0_8_ = 0x42b0c0a542b0c0a5;
              auVar55 = minps(auVar24,auVar23);
              local_28d8 = auVar55._0_8_;
              uStack_28d0 = auVar55._8_8_;
              local_2658 = local_28d8;
              uStack_2650 = uStack_28d0;
              local_2668 = 0xc2b0c0a5c2b0c0a5;
              uStack_2660 = 0xc2b0c0a5c2b0c0a5;
              auVar22._8_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar55 = maxps(auVar55,auVar22);
              local_28d8 = auVar55._0_8_;
              uStack_28d0 = auVar55._8_8_;
              local_2678 = local_28d8;
              uVar1 = local_2678;
              uStack_2670 = uStack_28d0;
              uVar2 = uStack_2670;
              local_2688 = 0x3fb8aa3b3fb8aa3b;
              uStack_2680 = 0x3fb8aa3b3fb8aa3b;
              local_2678._0_4_ = auVar55._0_4_;
              local_2678._4_4_ = auVar55._4_4_;
              uStack_2670._0_4_ = auVar55._8_4_;
              uStack_2670._4_4_ = auVar55._12_4_;
              local_27d8 = CONCAT44(local_2678._4_4_ * 1.442695,(float)local_2678 * 1.442695);
              uStack_27d0 = CONCAT44(uStack_2670._4_4_ * 1.442695,(float)uStack_2670 * 1.442695);
              local_27e8 = 0x3f0000003f000000;
              uStack_27e0 = 0x3f0000003f000000;
              fVar60 = (float)local_2678 * 1.442695 + 0.5;
              fVar63 = local_2678._4_4_ * 1.442695 + 0.5;
              fVar64 = (float)uStack_2670 * 1.442695 + 0.5;
              fVar67 = uStack_2670._4_4_ * 1.442695 + 0.5;
              local_1a28 = CONCAT44(fVar63,fVar60);
              uStack_1a20 = CONCAT44(fVar67,fVar64);
              local_19e8 = CONCAT44((int)fVar63,(int)fVar60);
              uStack_19e0 = CONCAT44((int)fVar67,(int)fVar64);
              local_28f8 = (float)(int)fVar60;
              fStack_28f4 = (float)(int)fVar63;
              fStack_28f0 = (float)(int)fVar64;
              fStack_28ec = (float)(int)fVar67;
              local_28e8 = CONCAT44(fStack_28f4,local_28f8);
              uStack_28e0 = CONCAT44(fStack_28ec,fStack_28f0);
              local_1978 = CONCAT44(fVar63,fVar60);
              uStack_1970 = CONCAT44(fVar67,fVar64);
              local_1968 = local_28e8;
              uStack_1960 = uStack_28e0;
              local_2928 = CONCAT44(-(uint)(fVar63 < fStack_28f4),-(uint)(fVar60 < local_28f8));
              uStack_2920 = CONCAT44(-(uint)(fVar67 < fStack_28ec),-(uint)(fVar64 < fStack_28f0));
              local_18e8 = local_2928;
              uStack_18e0 = uStack_2920;
              local_18f8 = 0x3f8000003f800000;
              uStack_18f0 = 0x3f8000003f800000;
              local_2928 = local_2928 & 0x3f8000003f800000;
              uStack_2920 = uStack_2920 & 0x3f8000003f800000;
              local_1ae8 = local_28e8;
              uStack_1ae0 = uStack_28e0;
              local_1af8._0_4_ = (float)local_2928;
              local_1af8._4_4_ = (float)(local_2928 >> 0x20);
              uStack_1af0._0_4_ = (float)uStack_2920;
              uStack_1af0._4_4_ = (float)(uStack_2920 >> 0x20);
              local_28f8 = local_28f8 - (float)local_1af8;
              fStack_28f4 = fStack_28f4 - local_1af8._4_4_;
              fStack_28f0 = fStack_28f0 - (float)uStack_1af0;
              fStack_28ec = fStack_28ec - uStack_1af0._4_4_;
              local_2698 = CONCAT44(fStack_28f4,local_28f8);
              uStack_2690 = CONCAT44(fStack_28ec,fStack_28f0);
              local_26a8 = 0x3f3180003f318000;
              uStack_26a0 = 0x3f3180003f318000;
              local_28e8 = CONCAT44(fStack_28f4 * 0.6933594,local_28f8 * 0.6933594);
              uStack_28e0 = CONCAT44(fStack_28ec * 0.6933594,fStack_28f0 * 0.6933594);
              local_26b8 = CONCAT44(fStack_28f4,local_28f8);
              uStack_26b0 = CONCAT44(fStack_28ec,fStack_28f0);
              local_26c8 = 0xb95e8083b95e8083;
              uStack_26c0 = 0xb95e8083b95e8083;
              local_1b08 = local_28d8;
              uStack_1b00 = uStack_28d0;
              local_1b18 = local_28e8;
              uStack_1b10 = uStack_28e0;
              local_2678._0_4_ = (float)local_2678 - local_28f8 * 0.6933594;
              local_2678._4_4_ = local_2678._4_4_ - fStack_28f4 * 0.6933594;
              uStack_2670._0_4_ = (float)uStack_2670 - fStack_28f0 * 0.6933594;
              uStack_2670._4_4_ = uStack_2670._4_4_ - fStack_28ec * 0.6933594;
              local_28d8 = CONCAT44(local_2678._4_4_,(float)local_2678);
              uStack_28d0._0_4_ = (float)uStack_2670;
              uStack_28d0._4_4_ = uStack_2670._4_4_;
              local_1b38 = CONCAT44(fStack_28f4 * -0.00021219444,local_28f8 * -0.00021219444);
              uStack_1b30 = CONCAT44(fStack_28ec * -0.00021219444,fStack_28f0 * -0.00021219444);
              local_1b28 = local_28d8;
              uStack_1b20 = uStack_28d0;
              local_2678._0_4_ = (float)local_2678 - local_28f8 * -0.00021219444;
              local_2678._4_4_ = local_2678._4_4_ - fStack_28f4 * -0.00021219444;
              uStack_2670._0_4_ = (float)uStack_2670 - fStack_28f0 * -0.00021219444;
              uStack_2670._4_4_ = uStack_2670._4_4_ - fStack_28ec * -0.00021219444;
              local_28d8 = CONCAT44(local_2678._4_4_,(float)local_2678);
              uStack_28d0._0_4_ = (float)uStack_2670;
              uStack_28d0._4_4_ = uStack_2670._4_4_;
              local_26d8 = local_28d8;
              uStack_26d0 = uStack_28d0;
              local_26e8 = local_28d8;
              uStack_26e0 = uStack_28d0;
              local_2938 = (float)local_2678 * (float)local_2678;
              fStack_2934 = local_2678._4_4_ * local_2678._4_4_;
              fStack_2930 = (float)uStack_2670 * (float)uStack_2670;
              fStack_292c = uStack_2670._4_4_ * uStack_2670._4_4_;
              local_26f8 = 0x3950696739506967;
              uStack_26f0 = 0x3950696739506967;
              local_2708 = local_28d8;
              uStack_2700 = uStack_28d0;
              local_2948 = CONCAT44(local_2678._4_4_ * 0.00019875691,
                                    (float)local_2678 * 0.00019875691);
              uStack_2940 = CONCAT44(uStack_2670._4_4_ * 0.00019875691,
                                     (float)uStack_2670 * 0.00019875691);
              local_27f8 = local_2948;
              uStack_27f0 = uStack_2940;
              local_2808 = 0x3ab743ce3ab743ce;
              uStack_2800 = 0x3ab743ce3ab743ce;
              fVar60 = (float)local_2678 * 0.00019875691 + 0.0013981999;
              fVar63 = local_2678._4_4_ * 0.00019875691 + 0.0013981999;
              fVar64 = (float)uStack_2670 * 0.00019875691 + 0.0013981999;
              fVar67 = uStack_2670._4_4_ * 0.00019875691 + 0.0013981999;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2718 = local_2948;
              uStack_2710 = uStack_2940;
              local_2728 = local_28d8;
              uStack_2720 = uStack_28d0;
              fVar60 = fVar60 * (float)local_2678;
              fVar63 = fVar63 * local_2678._4_4_;
              fVar64 = fVar64 * (float)uStack_2670;
              fVar67 = fVar67 * uStack_2670._4_4_;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2818 = local_2948;
              uStack_2810 = uStack_2940;
              local_2828 = 0x3c0889083c088908;
              uStack_2820 = 0x3c0889083c088908;
              fVar60 = fVar60 + 0.008333452;
              fVar63 = fVar63 + 0.008333452;
              fVar64 = fVar64 + 0.008333452;
              fVar67 = fVar67 + 0.008333452;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2738 = local_2948;
              uStack_2730 = uStack_2940;
              local_2748 = local_28d8;
              uStack_2740 = uStack_28d0;
              fVar60 = fVar60 * (float)local_2678;
              fVar63 = fVar63 * local_2678._4_4_;
              fVar64 = fVar64 * (float)uStack_2670;
              fVar67 = fVar67 * uStack_2670._4_4_;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2838 = local_2948;
              uStack_2830 = uStack_2940;
              local_2848 = 0x3d2aa9c13d2aa9c1;
              uStack_2840 = 0x3d2aa9c13d2aa9c1;
              fVar60 = fVar60 + 0.041665796;
              fVar63 = fVar63 + 0.041665796;
              fVar64 = fVar64 + 0.041665796;
              fVar67 = fVar67 + 0.041665796;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2758 = local_2948;
              uStack_2750 = uStack_2940;
              local_2768 = local_28d8;
              uStack_2760 = uStack_28d0;
              fVar60 = fVar60 * (float)local_2678;
              fVar63 = fVar63 * local_2678._4_4_;
              fVar64 = fVar64 * (float)uStack_2670;
              fVar67 = fVar67 * uStack_2670._4_4_;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2858 = local_2948;
              uStack_2850 = uStack_2940;
              local_2868 = 0x3e2aaaaa3e2aaaaa;
              uStack_2860 = 0x3e2aaaaa3e2aaaaa;
              fVar60 = fVar60 + 0.16666666;
              fVar63 = fVar63 + 0.16666666;
              fVar64 = fVar64 + 0.16666666;
              fVar67 = fVar67 + 0.16666666;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2778 = local_2948;
              uStack_2770 = uStack_2940;
              local_2788 = local_28d8;
              uStack_2780 = uStack_28d0;
              fVar60 = fVar60 * (float)local_2678;
              fVar63 = fVar63 * local_2678._4_4_;
              fVar64 = fVar64 * (float)uStack_2670;
              fVar67 = fVar67 * uStack_2670._4_4_;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2878 = local_2948;
              uStack_2870 = uStack_2940;
              local_2888 = 0x3f0000003f000000;
              uStack_2880 = 0x3f0000003f000000;
              fVar60 = fVar60 + 0.5;
              fVar63 = fVar63 + 0.5;
              fVar64 = fVar64 + 0.5;
              fVar67 = fVar67 + 0.5;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_27a8 = CONCAT44(fStack_2934,local_2938);
              uStack_27a0 = CONCAT44(fStack_292c,fStack_2930);
              local_2798 = local_2948;
              uStack_2790 = uStack_2940;
              fVar60 = fVar60 * local_2938;
              fVar63 = fVar63 * fStack_2934;
              fVar64 = fVar64 * fStack_2930;
              fVar67 = fVar67 * fStack_292c;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2898 = local_2948;
              uStack_2890 = uStack_2940;
              local_28a8 = local_28d8;
              uStack_28a0 = uStack_28d0;
              fVar60 = fVar60 + (float)local_2678;
              fVar63 = fVar63 + local_2678._4_4_;
              fVar64 = fVar64 + (float)uStack_2670;
              fVar67 = fVar67 + uStack_2670._4_4_;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_28b8 = local_2948;
              uStack_28b0 = uStack_2940;
              local_28c8 = 0x3f8000003f800000;
              uStack_28c0 = 0x3f8000003f800000;
              fVar60 = fVar60 + 1.0;
              fVar63 = fVar63 + 1.0;
              fVar64 = fVar64 + 1.0;
              fVar67 = fVar67 + 1.0;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_1a38 = CONCAT44(fStack_28f4,local_28f8);
              uStack_1a30 = CONCAT44(fStack_28ec,fStack_28f0);
              local_1868 = CONCAT44((int)fStack_28f4,(int)local_28f8);
              uStack_1860 = CONCAT44((int)fStack_28ec,(int)fStack_28f0);
              local_1878 = 0x7f0000007f;
              uStack_1870 = 0x7f0000007f;
              iVar53 = (int)local_28f8 + 0x7f;
              fStack_2904 = (float)((int)fStack_28f4 + 0x7f);
              fStack_2900 = (float)((int)fStack_28f0 + 0x7f);
              fStack_28fc = (float)((int)fStack_28ec + 0x7f);
              local_17e8 = CONCAT44(fStack_2904,iVar53);
              uStack_17e0 = CONCAT44(fStack_28fc,fStack_2900);
              local_17ec = 0x17;
              local_2908 = (float)(iVar53 * 0x800000);
              local_2958 = CONCAT44(fStack_2904,local_2908);
              uStack_2950 = CONCAT44(fStack_28fc,fStack_2900);
              local_27b8 = local_2948;
              uStack_27b0 = uStack_2940;
              fVar60 = fVar60 * local_2908;
              fVar63 = fVar63 * fStack_2904;
              fVar64 = fVar64 * fStack_2900;
              fVar67 = fVar67 * fStack_28fc;
              local_2948 = CONCAT44(fVar63,fVar60);
              uStack_2940 = CONCAT44(fVar67,fVar64);
              local_2bfc = 0x3f800000;
              local_2c18 = 0x3f800000;
              uStack_2c14 = 0x3f800000;
              uStack_2c10 = 0x3f800000;
              uStack_2c0c = 0x3f800000;
              local_2bf8 = 0x3f8000003f800000;
              uStack_2bf0 = 0x3f8000003f800000;
              local_2be8 = local_2948;
              uStack_2be0 = uStack_2940;
              fVar60 = fVar60 + 1.0;
              fVar63 = fVar63 + 1.0;
              fVar64 = fVar64 + 1.0;
              fVar67 = fVar67 + 1.0;
              local_b58 = CONCAT44(fVar63,fVar60);
              uStack_b50._0_4_ = fVar64;
              uStack_b50._4_4_ = fVar67;
              local_b78 = 0x3f8000003f800000;
              uStack_b70 = 0x3f8000003f800000;
              local_7c8 = 0;
              uStack_7c0 = 0;
              local_1c8 = local_b58;
              uStack_1c0 = uStack_b50;
              local_1d8 = 0;
              uStack_1d0 = 0;
              local_b88 = -(uint)(fVar60 <= 0.0);
              iStack_b84 = -(uint)(fVar63 <= 0.0);
              iStack_b80 = -(uint)(fVar64 <= 0.0);
              iStack_b7c = -(uint)(fVar67 <= 0.0);
              local_7d8 = local_b58;
              uStack_7d0 = uStack_b50;
              local_7e8 = 0x80000000800000;
              uStack_7e0 = 0x80000000800000;
              auVar45._8_8_ = uStack_b50;
              auVar45._0_8_ = local_b58;
              auVar44._8_8_ = 0x80000000800000;
              auVar44._0_8_ = 0x80000000800000;
              auVar55 = maxps(auVar45,auVar44);
              local_b58 = auVar55._0_8_;
              uStack_b50 = auVar55._8_8_;
              local_168 = local_b58;
              uStack_160 = uStack_b50;
              local_188 = local_b58;
              uVar48 = local_188;
              uStack_180 = uStack_b50;
              uVar49 = uStack_180;
              local_18c = 0x17;
              local_188._0_4_ = auVar55._0_4_;
              local_188._4_4_ = auVar55._4_4_;
              uStack_180._0_4_ = auVar55._8_4_;
              uStack_180._4_4_ = auVar55._12_4_;
              local_6f8 = local_b58;
              uStack_6f0 = uStack_b50;
              local_708 = 0x807fffff807fffff;
              uStack_700 = 0x807fffff807fffff;
              local_e8 = local_b58 & 0x807fffff807fffff;
              uStack_e0 = uStack_b50 & 0x807fffff807fffff;
              local_f8 = 0x3f0000003f000000;
              uStack_f0 = 0x3f0000003f000000;
              local_768 = local_e8 | 0x3f0000003f000000;
              uStack_760 = uStack_e0 | 0x3f0000003f000000;
              local_a8 = CONCAT44(local_188._4_4_ >> 0x17,(uint)local_188 >> 0x17);
              uStack_a0 = CONCAT44(uStack_180._4_4_ >> 0x17,(uint)uStack_180 >> 0x17);
              local_b8 = 0x7f0000007f;
              uStack_b0 = 0x7f0000007f;
              local_b68 = ((uint)local_188 >> 0x17) - 0x7f;
              iStack_b64 = (local_188._4_4_ >> 0x17) - 0x7f;
              iStack_b60 = ((uint)uStack_180 >> 0x17) - 0x7f;
              iStack_b5c = (uStack_180._4_4_ >> 0x17) - 0x7f;
              local_758 = CONCAT44(iStack_b64,local_b68);
              uStack_750 = CONCAT44(iStack_b5c,iStack_b60);
              local_9b8 = CONCAT44((float)iStack_b64,(float)local_b68);
              uStack_9b0 = CONCAT44((float)iStack_b5c,(float)iStack_b60);
              local_9c8 = 0x3f8000003f800000;
              uStack_9c0 = 0x3f8000003f800000;
              local_b98 = (float)local_b68 + 1.0;
              fStack_b94 = (float)iStack_b64 + 1.0;
              fStack_b90 = (float)iStack_b60 + 1.0;
              fStack_b8c = (float)iStack_b5c + 1.0;
              local_78 = 0x3f3504f33f3504f3;
              uStack_70 = 0x3f3504f33f3504f3;
              local_68._0_4_ = (float)local_768;
              local_68._4_4_ = (float)(local_768 >> 0x20);
              uStack_60._0_4_ = (float)uStack_760;
              uStack_60._4_4_ = (float)(uStack_760 >> 0x20);
              local_ba8 = -(uint)((float)local_68 < 0.70710677);
              iStack_ba4 = -(uint)(local_68._4_4_ < 0.70710677);
              iStack_ba0 = -(uint)((float)uStack_60 < 0.70710677);
              iStack_b9c = -(uint)(uStack_60._4_4_ < 0.70710677);
              local_728 = CONCAT44(iStack_ba4,local_ba8);
              uStack_720 = CONCAT44(iStack_b9c,iStack_ba0);
              uVar61 = local_768 & local_728;
              uVar65 = uStack_760 & uStack_720;
              local_778 = 0x3f8000003f800000;
              uStack_770 = 0x3f8000003f800000;
              local_b58 = CONCAT44(local_68._4_4_ - 1.0,(float)local_68 - 1.0);
              uStack_b50._0_4_ = (float)uStack_60 - 1.0;
              uStack_b50._4_4_ = uStack_60._4_4_ - 1.0;
              local_788 = CONCAT44(fStack_b94,local_b98);
              uStack_780 = CONCAT44(fStack_b8c,fStack_b90);
              local_748 = CONCAT44(iStack_ba4,local_ba8);
              uStack_740 = CONCAT44(iStack_b9c,iStack_ba0);
              local_738 = 0x3f8000003f800000;
              uStack_730 = 0x3f8000003f800000;
              uVar62 = local_748 & 0x3f8000003f800000;
              uVar66 = uStack_740 & 0x3f8000003f800000;
              local_798._0_4_ = (float)uVar62;
              local_798._4_4_ = (float)(uVar62 >> 0x20);
              uStack_790._0_4_ = (float)uVar66;
              uStack_790._4_4_ = (float)(uVar66 >> 0x20);
              local_b98 = local_b98 - (float)local_798;
              fStack_b94 = fStack_b94 - local_798._4_4_;
              fStack_b90 = fStack_b90 - (float)uStack_790;
              fStack_b8c = fStack_b8c - uStack_790._4_4_;
              local_9d8 = local_b58;
              uStack_9d0 = uStack_b50;
              local_9e8._0_4_ = (float)uVar61;
              local_9e8._4_4_ = (float)(uVar61 >> 0x20);
              uStack_9e0._0_4_ = (float)uVar65;
              uStack_9e0._4_4_ = (float)(uVar65 >> 0x20);
              local_9e8._0_4_ = ((float)local_68 - 1.0) + (float)local_9e8;
              local_9e8._4_4_ = (local_68._4_4_ - 1.0) + local_9e8._4_4_;
              uStack_9e0._0_4_ = ((float)uStack_60 - 1.0) + (float)uStack_9e0;
              uStack_9e0._4_4_ = (uStack_60._4_4_ - 1.0) + uStack_9e0._4_4_;
              local_b58 = CONCAT44(local_9e8._4_4_,(float)local_9e8);
              uStack_b50._0_4_ = (float)uStack_9e0;
              uStack_b50._4_4_ = uStack_9e0._4_4_;
              local_7f8 = local_b58;
              uStack_7f0 = uStack_b50;
              local_808 = local_b58;
              uStack_800 = uStack_b50;
              local_bc8 = (float)local_9e8 * (float)local_9e8;
              fStack_bc4 = local_9e8._4_4_ * local_9e8._4_4_;
              fStack_bc0 = (float)uStack_9e0 * (float)uStack_9e0;
              fStack_bbc = uStack_9e0._4_4_ * uStack_9e0._4_4_;
              local_818 = 0x3d9021bb3d9021bb;
              uStack_810 = 0x3d9021bb3d9021bb;
              local_828 = local_b58;
              uStack_820 = uStack_b50;
              local_bd8 = CONCAT44(local_9e8._4_4_ * 0.070376836,(float)local_9e8 * 0.070376836);
              uStack_bd0 = CONCAT44(uStack_9e0._4_4_ * 0.070376836,(float)uStack_9e0 * 0.070376836);
              local_9f8 = local_bd8;
              uStack_9f0 = uStack_bd0;
              local_a08 = 0xbdebd1b8bdebd1b8;
              uStack_a00 = 0xbdebd1b8bdebd1b8;
              fVar60 = (float)local_9e8 * 0.070376836 + -0.1151461;
              fVar63 = local_9e8._4_4_ * 0.070376836 + -0.1151461;
              fVar64 = (float)uStack_9e0 * 0.070376836 + -0.1151461;
              fVar67 = uStack_9e0._4_4_ * 0.070376836 + -0.1151461;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_838 = local_bd8;
              uStack_830 = uStack_bd0;
              local_848 = local_b58;
              uStack_840 = uStack_b50;
              fVar60 = fVar60 * (float)local_9e8;
              fVar63 = fVar63 * local_9e8._4_4_;
              fVar64 = fVar64 * (float)uStack_9e0;
              fVar67 = fVar67 * uStack_9e0._4_4_;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_a18 = local_bd8;
              uStack_a10 = uStack_bd0;
              local_a28 = 0x3def251a3def251a;
              uStack_a20 = 0x3def251a3def251a;
              fVar60 = fVar60 + 0.116769984;
              fVar63 = fVar63 + 0.116769984;
              fVar64 = fVar64 + 0.116769984;
              fVar67 = fVar67 + 0.116769984;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_858 = local_bd8;
              uStack_850 = uStack_bd0;
              local_868 = local_b58;
              uStack_860 = uStack_b50;
              fVar60 = fVar60 * (float)local_9e8;
              fVar63 = fVar63 * local_9e8._4_4_;
              fVar64 = fVar64 * (float)uStack_9e0;
              fVar67 = fVar67 * uStack_9e0._4_4_;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_a38 = local_bd8;
              uStack_a30 = uStack_bd0;
              local_a48 = 0xbdfe5d4fbdfe5d4f;
              uStack_a40 = 0xbdfe5d4fbdfe5d4f;
              fVar60 = fVar60 + -0.12420141;
              fVar63 = fVar63 + -0.12420141;
              fVar64 = fVar64 + -0.12420141;
              fVar67 = fVar67 + -0.12420141;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_878 = local_bd8;
              uStack_870 = uStack_bd0;
              local_888 = local_b58;
              uStack_880 = uStack_b50;
              fVar60 = fVar60 * (float)local_9e8;
              fVar63 = fVar63 * local_9e8._4_4_;
              fVar64 = fVar64 * (float)uStack_9e0;
              fVar67 = fVar67 * uStack_9e0._4_4_;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_a58 = local_bd8;
              uStack_a50 = uStack_bd0;
              local_a68 = 0x3e11e9bf3e11e9bf;
              uStack_a60 = 0x3e11e9bf3e11e9bf;
              fVar60 = fVar60 + 0.14249323;
              fVar63 = fVar63 + 0.14249323;
              fVar64 = fVar64 + 0.14249323;
              fVar67 = fVar67 + 0.14249323;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_898 = local_bd8;
              uStack_890 = uStack_bd0;
              local_8a8 = local_b58;
              uStack_8a0 = uStack_b50;
              fVar60 = fVar60 * (float)local_9e8;
              fVar63 = fVar63 * local_9e8._4_4_;
              fVar64 = fVar64 * (float)uStack_9e0;
              fVar67 = fVar67 * uStack_9e0._4_4_;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_a78 = local_bd8;
              uStack_a70 = uStack_bd0;
              local_a88 = 0xbe2aae50be2aae50;
              uStack_a80 = 0xbe2aae50be2aae50;
              fVar60 = fVar60 + -0.16668057;
              fVar63 = fVar63 + -0.16668057;
              fVar64 = fVar64 + -0.16668057;
              fVar67 = fVar67 + -0.16668057;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_8b8 = local_bd8;
              uStack_8b0 = uStack_bd0;
              local_8c8 = local_b58;
              uStack_8c0 = uStack_b50;
              fVar60 = fVar60 * (float)local_9e8;
              fVar63 = fVar63 * local_9e8._4_4_;
              fVar64 = fVar64 * (float)uStack_9e0;
              fVar67 = fVar67 * uStack_9e0._4_4_;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_a98 = local_bd8;
              uStack_a90 = uStack_bd0;
              local_aa8 = 0x3e4cceac3e4cceac;
              uStack_aa0 = 0x3e4cceac3e4cceac;
              fVar60 = fVar60 + 0.20000714;
              fVar63 = fVar63 + 0.20000714;
              fVar64 = fVar64 + 0.20000714;
              fVar67 = fVar67 + 0.20000714;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_8d8 = local_bd8;
              uStack_8d0 = uStack_bd0;
              local_8e8 = local_b58;
              uStack_8e0 = uStack_b50;
              fVar60 = fVar60 * (float)local_9e8;
              fVar63 = fVar63 * local_9e8._4_4_;
              fVar64 = fVar64 * (float)uStack_9e0;
              fVar67 = fVar67 * uStack_9e0._4_4_;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_ab8 = local_bd8;
              uStack_ab0 = uStack_bd0;
              local_ac8 = 0xbe7ffffcbe7ffffc;
              uStack_ac0 = 0xbe7ffffcbe7ffffc;
              fVar60 = fVar60 + -0.24999994;
              fVar63 = fVar63 + -0.24999994;
              fVar64 = fVar64 + -0.24999994;
              fVar67 = fVar67 + -0.24999994;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_8f8 = local_bd8;
              uStack_8f0 = uStack_bd0;
              local_908 = local_b58;
              uStack_900 = uStack_b50;
              fVar60 = fVar60 * (float)local_9e8;
              fVar63 = fVar63 * local_9e8._4_4_;
              fVar64 = fVar64 * (float)uStack_9e0;
              fVar67 = fVar67 * uStack_9e0._4_4_;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_ad8 = local_bd8;
              uStack_ad0 = uStack_bd0;
              local_ae8 = 0x3eaaaaaa3eaaaaaa;
              uStack_ae0 = 0x3eaaaaaa3eaaaaaa;
              fVar60 = fVar60 + 0.3333333;
              fVar63 = fVar63 + 0.3333333;
              fVar64 = fVar64 + 0.3333333;
              fVar67 = fVar67 + 0.3333333;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_918 = local_bd8;
              uStack_910 = uStack_bd0;
              local_928 = local_b58;
              uStack_920 = uStack_b50;
              fVar60 = fVar60 * (float)local_9e8;
              fVar63 = fVar63 * local_9e8._4_4_;
              fVar64 = fVar64 * (float)uStack_9e0;
              fVar67 = fVar67 * uStack_9e0._4_4_;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_948 = CONCAT44(fStack_bc4,local_bc8);
              uStack_940 = CONCAT44(fStack_bbc,fStack_bc0);
              local_938 = local_bd8;
              uStack_930 = uStack_bd0;
              fVar60 = fVar60 * local_bc8;
              fVar63 = fVar63 * fStack_bc4;
              fVar64 = fVar64 * fStack_bc0;
              fVar67 = fVar67 * fStack_bbc;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_958 = CONCAT44(fStack_b94,local_b98);
              uStack_950 = CONCAT44(fStack_b8c,fStack_b90);
              local_968 = 0xb95e8083b95e8083;
              uStack_960 = 0xb95e8083b95e8083;
              local_bb8 = CONCAT44(fStack_b94 * -0.00021219444,local_b98 * -0.00021219444);
              uStack_bb0 = CONCAT44(fStack_b8c * -0.00021219444,fStack_b90 * -0.00021219444);
              local_af8 = local_bd8;
              uStack_af0 = uStack_bd0;
              local_b08 = local_bb8;
              uStack_b00 = uStack_bb0;
              fVar60 = fVar60 + local_b98 * -0.00021219444;
              fVar63 = fVar63 + fStack_b94 * -0.00021219444;
              fVar64 = fVar64 + fStack_b90 * -0.00021219444;
              fVar67 = fVar67 + fStack_b8c * -0.00021219444;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_978 = CONCAT44(fStack_bc4,local_bc8);
              uStack_970 = CONCAT44(fStack_bbc,fStack_bc0);
              local_988 = 0x3f0000003f000000;
              uStack_980 = 0x3f0000003f000000;
              local_bb8 = CONCAT44(fStack_bc4 * 0.5,local_bc8 * 0.5);
              uStack_bb0 = CONCAT44(fStack_bbc * 0.5,fStack_bc0 * 0.5);
              local_7a8 = local_bd8;
              uStack_7a0 = uStack_bd0;
              local_7b8 = local_bb8;
              uStack_7b0 = uStack_bb0;
              fVar60 = fVar60 - local_bc8 * 0.5;
              fVar63 = fVar63 - fStack_bc4 * 0.5;
              fVar64 = fVar64 - fStack_bc0 * 0.5;
              fVar67 = fVar67 - fStack_bbc * 0.5;
              local_bd8 = CONCAT44(fVar63,fVar60);
              uStack_bd0 = CONCAT44(fVar67,fVar64);
              local_998 = CONCAT44(fStack_b94,local_b98);
              uStack_990 = CONCAT44(fStack_b8c,fStack_b90);
              local_9a8 = 0x3f3180003f318000;
              uStack_9a0 = 0x3f3180003f318000;
              local_bb8 = CONCAT44(fStack_b94 * 0.6933594,local_b98 * 0.6933594);
              uStack_bb0 = CONCAT44(fStack_b8c * 0.6933594,fStack_b90 * 0.6933594);
              local_b18 = local_b58;
              uStack_b10 = uStack_b50;
              local_b28 = local_bd8;
              uStack_b20 = uStack_bd0;
              local_9e8._0_4_ = (float)local_9e8 + fVar60;
              local_9e8._4_4_ = local_9e8._4_4_ + fVar63;
              uStack_9e0._0_4_ = (float)uStack_9e0 + fVar64;
              uStack_9e0._4_4_ = uStack_9e0._4_4_ + fVar67;
              local_b58 = CONCAT44(local_9e8._4_4_,(float)local_9e8);
              uStack_b50._0_4_ = (float)uStack_9e0;
              uStack_b50._4_4_ = uStack_9e0._4_4_;
              local_b38 = local_b58;
              uStack_b30 = uStack_b50;
              local_b48 = local_bb8;
              uStack_b40 = uStack_bb0;
              local_b58 = CONCAT44(local_9e8._4_4_ + fStack_b94 * 0.6933594,
                                   (float)local_9e8 + local_b98 * 0.6933594);
              uStack_b50._0_4_ = (float)uStack_9e0 + fStack_b90 * 0.6933594;
              uStack_b50._4_4_ = uStack_9e0._4_4_ + fStack_b8c * 0.6933594;
              local_118 = CONCAT44(iStack_b84,local_b88);
              uStack_110 = CONCAT44(iStack_b7c,iStack_b80);
              local_108 = local_b58;
              uStack_100 = uStack_b50;
              local_1778 = local_b58 | local_118;
              uStack_1770 = uStack_b50 | uStack_110;
              uStack_b50 = uStack_1770;
              local_b58 = local_1778;
              local_172c = 0x3f800000;
              local_1748 = 0x3f800000;
              uStack_1744 = 0x3f800000;
              uStack_1740 = 0x3f800000;
              uStack_173c = 0x3f800000;
              local_1788 = 0x3f8000003f800000;
              uStack_1780 = 0x3f8000003f800000;
              local_174c = 0x40000000;
              local_1768 = 0x40000000;
              uStack_1764 = 0x40000000;
              uStack_1760 = 0x40000000;
              uStack_175c = 0x40000000;
              local_1798 = 0x4000000040000000;
              uStack_1790 = 0x4000000040000000;
              local_16f8._0_4_ = (float)local_1778;
              local_16f8._4_4_ = (float)(local_1778 >> 0x20);
              uStack_16f0._0_4_ = (float)uStack_1770;
              uStack_16f0._4_4_ = (float)(uStack_1770 >> 0x20);
              local_16d8 = (float)local_16f8 * 2.0;
              fStack_16d4 = local_16f8._4_4_ * 2.0;
              fStack_16d0 = (float)uStack_16f0 * 2.0;
              fStack_16cc = uStack_16f0._4_4_ * 2.0;
              local_16ac = 0x3f800000;
              local_16c8 = 0x3f800000;
              uStack_16c4 = 0x3f800000;
              uStack_16c0 = 0x3f800000;
              uStack_16bc = 0x3f800000;
              local_16e8 = 0x3f8000003f800000;
              uStack_16e0 = 0x3f8000003f800000;
              local_1688 = 0;
              uStack_1680 = 0;
              local_12b8 = CONCAT44(fStack_16d4,local_16d8);
              uStack_12b0 = CONCAT44(fStack_16cc,fStack_16d0);
              local_12a8 = 0;
              uStack_12a0 = 0;
              local_15d8 = CONCAT44(0.0 - fStack_16d4,0.0 - local_16d8);
              uStack_15d0._0_4_ = 0.0 - fStack_16d0;
              uStack_15d0._4_4_ = 0.0 - fStack_16cc;
              local_1348 = 0;
              uStack_1340 = 0;
              local_1618 = 0x3f8000003f800000;
              uStack_1610 = 0x3f8000003f800000;
              local_1328 = local_15d8;
              uStack_1320 = uStack_15d0;
              local_1338 = 0x42b0c0a542b0c0a5;
              uStack_1330 = 0x42b0c0a542b0c0a5;
              auVar38._8_8_ = uStack_15d0;
              auVar38._0_8_ = local_15d8;
              auVar37._8_8_ = 0x42b0c0a542b0c0a5;
              auVar37._0_8_ = 0x42b0c0a542b0c0a5;
              auVar55 = minps(auVar38,auVar37);
              local_15d8 = auVar55._0_8_;
              uStack_15d0 = auVar55._8_8_;
              local_1358 = local_15d8;
              uStack_1350 = uStack_15d0;
              local_1368 = 0xc2b0c0a5c2b0c0a5;
              uStack_1360 = 0xc2b0c0a5c2b0c0a5;
              auVar36._8_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar55 = maxps(auVar55,auVar36);
              local_15d8 = auVar55._0_8_;
              uStack_15d0 = auVar55._8_8_;
              local_1378 = local_15d8;
              uVar3 = local_1378;
              uStack_1370 = uStack_15d0;
              uVar4 = uStack_1370;
              local_1388 = 0x3fb8aa3b3fb8aa3b;
              uStack_1380 = 0x3fb8aa3b3fb8aa3b;
              local_1378._0_4_ = auVar55._0_4_;
              local_1378._4_4_ = auVar55._4_4_;
              uStack_1370._0_4_ = auVar55._8_4_;
              uStack_1370._4_4_ = auVar55._12_4_;
              local_14d8 = CONCAT44(local_1378._4_4_ * 1.442695,(float)local_1378 * 1.442695);
              uStack_14d0 = CONCAT44(uStack_1370._4_4_ * 1.442695,(float)uStack_1370 * 1.442695);
              local_14e8 = 0x3f0000003f000000;
              uStack_14e0 = 0x3f0000003f000000;
              fVar60 = (float)local_1378 * 1.442695 + 0.5;
              fVar63 = local_1378._4_4_ * 1.442695 + 0.5;
              fVar64 = (float)uStack_1370 * 1.442695 + 0.5;
              fVar67 = uStack_1370._4_4_ * 1.442695 + 0.5;
              local_1268 = CONCAT44(fVar63,fVar60);
              uStack_1260 = CONCAT44(fVar67,fVar64);
              local_1258 = CONCAT44((int)fVar63,(int)fVar60);
              uStack_1250 = CONCAT44((int)fVar67,(int)fVar64);
              local_15f8 = (float)(int)fVar60;
              fStack_15f4 = (float)(int)fVar63;
              fStack_15f0 = (float)(int)fVar64;
              fStack_15ec = (float)(int)fVar67;
              local_15e8 = CONCAT44(fStack_15f4,local_15f8);
              uStack_15e0 = CONCAT44(fStack_15ec,fStack_15f0);
              local_1248 = CONCAT44(fVar63,fVar60);
              uStack_1240 = CONCAT44(fVar67,fVar64);
              local_1238 = local_15e8;
              uStack_1230 = uStack_15e0;
              local_1628 = CONCAT44(-(uint)(fVar63 < fStack_15f4),-(uint)(fVar60 < local_15f8));
              uStack_1620 = CONCAT44(-(uint)(fVar67 < fStack_15ec),-(uint)(fVar64 < fStack_15f0));
              local_1218 = local_1628;
              uStack_1210 = uStack_1620;
              local_1228 = 0x3f8000003f800000;
              uStack_1220 = 0x3f8000003f800000;
              local_1628 = local_1628 & 0x3f8000003f800000;
              uStack_1620 = uStack_1620 & 0x3f8000003f800000;
              local_12c8 = local_15e8;
              uStack_12c0 = uStack_15e0;
              local_12d8._0_4_ = (float)local_1628;
              local_12d8._4_4_ = (float)(local_1628 >> 0x20);
              uStack_12d0._0_4_ = (float)uStack_1620;
              uStack_12d0._4_4_ = (float)(uStack_1620 >> 0x20);
              local_15f8 = local_15f8 - (float)local_12d8;
              fStack_15f4 = fStack_15f4 - local_12d8._4_4_;
              fStack_15f0 = fStack_15f0 - (float)uStack_12d0;
              fStack_15ec = fStack_15ec - uStack_12d0._4_4_;
              local_1398 = CONCAT44(fStack_15f4,local_15f8);
              uStack_1390 = CONCAT44(fStack_15ec,fStack_15f0);
              local_13a8 = 0x3f3180003f318000;
              uStack_13a0 = 0x3f3180003f318000;
              local_15e8 = CONCAT44(fStack_15f4 * 0.6933594,local_15f8 * 0.6933594);
              uStack_15e0 = CONCAT44(fStack_15ec * 0.6933594,fStack_15f0 * 0.6933594);
              local_13b8 = CONCAT44(fStack_15f4,local_15f8);
              uStack_13b0 = CONCAT44(fStack_15ec,fStack_15f0);
              local_13c8 = 0xb95e8083b95e8083;
              uStack_13c0 = 0xb95e8083b95e8083;
              local_12e8 = local_15d8;
              uStack_12e0 = uStack_15d0;
              local_12f8 = local_15e8;
              uStack_12f0 = uStack_15e0;
              local_1378._0_4_ = (float)local_1378 - local_15f8 * 0.6933594;
              local_1378._4_4_ = local_1378._4_4_ - fStack_15f4 * 0.6933594;
              uStack_1370._0_4_ = (float)uStack_1370 - fStack_15f0 * 0.6933594;
              uStack_1370._4_4_ = uStack_1370._4_4_ - fStack_15ec * 0.6933594;
              local_15d8 = CONCAT44(local_1378._4_4_,(float)local_1378);
              uStack_15d0._0_4_ = (float)uStack_1370;
              uStack_15d0._4_4_ = uStack_1370._4_4_;
              local_1318 = CONCAT44(fStack_15f4 * -0.00021219444,local_15f8 * -0.00021219444);
              uStack_1310 = CONCAT44(fStack_15ec * -0.00021219444,fStack_15f0 * -0.00021219444);
              local_1308 = local_15d8;
              uStack_1300 = uStack_15d0;
              local_1378._0_4_ = (float)local_1378 - local_15f8 * -0.00021219444;
              local_1378._4_4_ = local_1378._4_4_ - fStack_15f4 * -0.00021219444;
              uStack_1370._0_4_ = (float)uStack_1370 - fStack_15f0 * -0.00021219444;
              uStack_1370._4_4_ = uStack_1370._4_4_ - fStack_15ec * -0.00021219444;
              local_15d8 = CONCAT44(local_1378._4_4_,(float)local_1378);
              uStack_15d0._0_4_ = (float)uStack_1370;
              uStack_15d0._4_4_ = uStack_1370._4_4_;
              local_13d8 = local_15d8;
              uStack_13d0 = uStack_15d0;
              local_13e8 = local_15d8;
              uStack_13e0 = uStack_15d0;
              local_1638 = (float)local_1378 * (float)local_1378;
              fStack_1634 = local_1378._4_4_ * local_1378._4_4_;
              fStack_1630 = (float)uStack_1370 * (float)uStack_1370;
              fStack_162c = uStack_1370._4_4_ * uStack_1370._4_4_;
              local_13f8 = 0x3950696739506967;
              uStack_13f0 = 0x3950696739506967;
              local_1408 = local_15d8;
              uStack_1400 = uStack_15d0;
              local_1648 = CONCAT44(local_1378._4_4_ * 0.00019875691,
                                    (float)local_1378 * 0.00019875691);
              uStack_1640 = CONCAT44(uStack_1370._4_4_ * 0.00019875691,
                                     (float)uStack_1370 * 0.00019875691);
              local_14f8 = local_1648;
              uStack_14f0 = uStack_1640;
              local_1508 = 0x3ab743ce3ab743ce;
              uStack_1500 = 0x3ab743ce3ab743ce;
              local_1678 = (float)local_1378 * 0.00019875691 + 0.0013981999;
              fStack_1674 = local_1378._4_4_ * 0.00019875691 + 0.0013981999;
              fStack_1670 = (float)uStack_1370 * 0.00019875691 + 0.0013981999;
              fStack_166c = uStack_1370._4_4_ * 0.00019875691 + 0.0013981999;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1418 = local_1648;
              uStack_1410 = uStack_1640;
              local_1428 = local_15d8;
              uStack_1420 = uStack_15d0;
              local_1678 = local_1678 * (float)local_1378;
              fStack_1674 = fStack_1674 * local_1378._4_4_;
              fStack_1670 = fStack_1670 * (float)uStack_1370;
              fStack_166c = fStack_166c * uStack_1370._4_4_;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1518 = local_1648;
              uStack_1510 = uStack_1640;
              local_1528 = 0x3c0889083c088908;
              uStack_1520 = 0x3c0889083c088908;
              local_1678 = local_1678 + 0.008333452;
              fStack_1674 = fStack_1674 + 0.008333452;
              fStack_1670 = fStack_1670 + 0.008333452;
              fStack_166c = fStack_166c + 0.008333452;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1438 = local_1648;
              uStack_1430 = uStack_1640;
              local_1448 = local_15d8;
              uStack_1440 = uStack_15d0;
              local_1678 = local_1678 * (float)local_1378;
              fStack_1674 = fStack_1674 * local_1378._4_4_;
              fStack_1670 = fStack_1670 * (float)uStack_1370;
              fStack_166c = fStack_166c * uStack_1370._4_4_;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1538 = local_1648;
              uStack_1530 = uStack_1640;
              local_1548 = 0x3d2aa9c13d2aa9c1;
              uStack_1540 = 0x3d2aa9c13d2aa9c1;
              local_1678 = local_1678 + 0.041665796;
              fStack_1674 = fStack_1674 + 0.041665796;
              fStack_1670 = fStack_1670 + 0.041665796;
              fStack_166c = fStack_166c + 0.041665796;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1458 = local_1648;
              uStack_1450 = uStack_1640;
              local_1468 = local_15d8;
              uStack_1460 = uStack_15d0;
              local_1678 = local_1678 * (float)local_1378;
              fStack_1674 = fStack_1674 * local_1378._4_4_;
              fStack_1670 = fStack_1670 * (float)uStack_1370;
              fStack_166c = fStack_166c * uStack_1370._4_4_;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1558 = local_1648;
              uStack_1550 = uStack_1640;
              local_1568 = 0x3e2aaaaa3e2aaaaa;
              uStack_1560 = 0x3e2aaaaa3e2aaaaa;
              local_1678 = local_1678 + 0.16666666;
              fStack_1674 = fStack_1674 + 0.16666666;
              fStack_1670 = fStack_1670 + 0.16666666;
              fStack_166c = fStack_166c + 0.16666666;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1478 = local_1648;
              uStack_1470 = uStack_1640;
              local_1488 = local_15d8;
              uStack_1480 = uStack_15d0;
              local_1678 = local_1678 * (float)local_1378;
              fStack_1674 = fStack_1674 * local_1378._4_4_;
              fStack_1670 = fStack_1670 * (float)uStack_1370;
              fStack_166c = fStack_166c * uStack_1370._4_4_;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1578 = local_1648;
              uStack_1570 = uStack_1640;
              local_1588 = 0x3f0000003f000000;
              uStack_1580 = 0x3f0000003f000000;
              local_1678 = local_1678 + 0.5;
              fStack_1674 = fStack_1674 + 0.5;
              fStack_1670 = fStack_1670 + 0.5;
              fStack_166c = fStack_166c + 0.5;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_14a8 = CONCAT44(fStack_1634,local_1638);
              uStack_14a0 = CONCAT44(fStack_162c,fStack_1630);
              local_1498 = local_1648;
              uStack_1490 = uStack_1640;
              local_1678 = local_1678 * local_1638;
              fStack_1674 = fStack_1674 * fStack_1634;
              fStack_1670 = fStack_1670 * fStack_1630;
              fStack_166c = fStack_166c * fStack_162c;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1598 = local_1648;
              uStack_1590 = uStack_1640;
              local_15a8 = local_15d8;
              uStack_15a0 = uStack_15d0;
              local_1678 = local_1678 + (float)local_1378;
              fStack_1674 = fStack_1674 + local_1378._4_4_;
              fStack_1670 = fStack_1670 + (float)uStack_1370;
              fStack_166c = fStack_166c + uStack_1370._4_4_;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_15b8 = local_1648;
              uStack_15b0 = uStack_1640;
              local_15c8 = 0x3f8000003f800000;
              uStack_15c0 = 0x3f8000003f800000;
              local_1678 = local_1678 + 1.0;
              fStack_1674 = fStack_1674 + 1.0;
              fStack_1670 = fStack_1670 + 1.0;
              fStack_166c = fStack_166c + 1.0;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_1278 = CONCAT44(fStack_15f4,local_15f8);
              uStack_1270 = CONCAT44(fStack_15ec,fStack_15f0);
              local_11f8 = CONCAT44((int)fStack_15f4,(int)local_15f8);
              uStack_11f0 = CONCAT44((int)fStack_15ec,(int)fStack_15f0);
              local_1208 = 0x7f0000007f;
              uStack_1200 = 0x7f0000007f;
              iVar53 = (int)local_15f8 + 0x7f;
              fStack_1604 = (float)((int)fStack_15f4 + 0x7f);
              fStack_1600 = (float)((int)fStack_15f0 + 0x7f);
              fStack_15fc = (float)((int)fStack_15ec + 0x7f);
              local_11d8 = CONCAT44(fStack_1604,iVar53);
              uStack_11d0 = CONCAT44(fStack_15fc,fStack_1600);
              local_11dc = 0x17;
              local_1608 = (float)(iVar53 * 0x800000);
              local_1658 = CONCAT44(fStack_1604,local_1608);
              uStack_1650 = CONCAT44(fStack_15fc,fStack_1600);
              local_14b8 = local_1648;
              uStack_14b0 = uStack_1640;
              local_1678 = local_1678 * local_1608;
              fStack_1674 = fStack_1674 * fStack_1604;
              fStack_1670 = fStack_1670 * fStack_1600;
              fStack_166c = fStack_166c * fStack_15fc;
              local_1648 = CONCAT44(fStack_1674,local_1678);
              uStack_1640 = CONCAT44(fStack_166c,fStack_1670);
              local_16a8 = local_1648;
              uStack_16a0 = uStack_1640;
              local_1678 = local_1678 + 1.0;
              fStack_1674 = fStack_1674 + 1.0;
              fStack_1670 = fStack_1670 + 1.0;
              fStack_166c = fStack_166c + 1.0;
              auVar35._8_8_ = 0x3f8000003f800000;
              auVar35._0_8_ = 0x3f8000003f800000;
              auVar34._4_4_ = fStack_1674;
              auVar34._0_4_ = local_1678;
              auVar34._8_4_ = fStack_1670;
              auVar34._12_4_ = fStack_166c;
              _local_1718 = divps(auVar35,auVar34);
              local_1288 = (float)local_1718._0_4_ * 2.0;
              fStack_1284 = (float)local_1718._4_4_ * 2.0;
              fStack_1280 = fStack_1710 * 2.0;
              fStack_127c = fStack_170c * 2.0;
              local_2bd8 = CONCAT44(fStack_1284 - 1.0,local_1288 - 1.0);
              uStack_2bd0 = CONCAT44(fStack_127c - 1.0,fStack_1280 - 1.0);
              local_2bc8._8_8_ = uStack_37a0;
              local_2bc8._0_8_ = local_37a8;
              local_32c8._4_4_ = local_1ad8._4_4_ * (fStack_1284 - 1.0);
              local_32c8._0_4_ = (float)local_1ad8 * (local_1288 - 1.0);
              uStack_32c0._4_4_ = uStack_1ad0._4_4_ * (fStack_127c - 1.0);
              uStack_32c0._0_4_ = (float)uStack_1ad0 * (fStack_1280 - 1.0);
              local_27c8 = local_2958;
              uStack_27c0 = uStack_2950;
              local_2678 = uVar1;
              uStack_2670 = uVar2;
              local_1af8 = local_2928;
              uStack_1af0 = uStack_2920;
              local_17a8 = local_2958;
              uStack_17a0 = uStack_2950;
              local_1728 = local_1798;
              uStack_1720 = uStack_1790;
              local_1708 = local_1798;
              uStack_1700 = uStack_1790;
              local_16f8 = local_1778;
              uStack_16f0 = uStack_1770;
              local_1698 = local_16e8;
              uStack_1690 = uStack_16e0;
              local_1668 = local_16e8;
              uStack_1660 = uStack_16e0;
              local_14c8 = local_1658;
              uStack_14c0 = uStack_1650;
              local_1378 = uVar3;
              uStack_1370 = uVar4;
              local_12d8 = local_1628;
              uStack_12d0 = uStack_1620;
              local_1298 = local_1788;
              uStack_1290 = uStack_1780;
              local_11c8 = local_1658;
              uStack_11c0 = uStack_1650;
              local_9e8 = uVar61;
              uStack_9e0 = uVar65;
              local_798 = uVar62;
              uStack_790 = uVar66;
              local_718 = local_768;
              uStack_710 = uStack_760;
              local_188 = uVar48;
              uStack_180 = uVar49;
              local_68 = local_768;
              uStack_60 = uStack_760;
              break;
            case 6:
              pfVar51 = ncnn::Mat::operator[](local_32e8,0);
              local_3298 = *pfVar51;
              local_3318 = CONCAT44(local_3298,local_3298);
              uStack_3310 = CONCAT44(local_3298,local_3298);
              fStack_3294 = local_3298;
              fStack_3290 = local_3298;
              fStack_328c = local_3298;
              local_327c = local_3298;
              pfVar51 = ncnn::Mat::operator[](local_32e8,1);
              local_32b8 = *pfVar51;
              local_3328 = CONCAT44(local_32b8,local_32b8);
              uStack_3320 = CONCAT44(local_32b8,local_32b8);
              local_2a78 = local_32d8;
              uStack_2a70 = uStack_32d0;
              local_2a88 = local_3318;
              uStack_2a80 = uStack_3310;
              local_2a4c = 0x3f800000;
              local_2a68 = 0x3f800000;
              uStack_2a64 = 0x3f800000;
              uStack_2a60 = 0x3f800000;
              uStack_2a5c = 0x3f800000;
              local_2aa8 = 0x3f8000003f800000;
              uStack_2aa0 = 0x3f8000003f800000;
              local_29f8 = local_32d8;
              uVar3 = local_29f8;
              uStack_29f0 = uStack_32d0;
              uVar4 = uStack_29f0;
              local_2a08 = local_3318;
              uVar1 = local_2a08;
              uStack_2a00 = uStack_3310;
              uVar2 = uStack_2a00;
              local_29f8._0_4_ = (float)local_32d8;
              local_29f8._4_4_ = (float)((ulong)local_32d8 >> 0x20);
              uStack_29f0._0_4_ = (float)uStack_32d0;
              uStack_29f0._4_4_ = (float)((ulong)uStack_32d0 >> 0x20);
              local_2a08._0_4_ = (float)local_3318;
              local_2a08._4_4_ = (float)((ulong)local_3318 >> 0x20);
              uStack_2a00._0_4_ = (float)uStack_3310;
              uStack_2a00._4_4_ = (float)((ulong)uStack_3310 >> 0x20);
              local_2a38 = (float)local_29f8 * (float)local_2a08;
              fStack_2a34 = local_29f8._4_4_ * local_2a08._4_4_;
              fStack_2a30 = (float)uStack_29f0 * (float)uStack_2a00;
              fStack_2a2c = uStack_29f0._4_4_ * uStack_2a00._4_4_;
              local_2a98._4_4_ = fStack_2a34 + local_32b8;
              local_2a98._0_4_ = local_2a38 + local_32b8;
              uStack_2a90._0_4_ = fStack_2a30 + local_32b8;
              uStack_2a90._4_4_ = fStack_2a2c + local_32b8;
              local_29c8 = 0;
              uStack_29c0 = 0;
              local_29d8 = local_2a98;
              uStack_29d0 = uStack_2a90;
              local_29e8 = 0;
              uStack_29e0 = 0;
              auVar18._8_8_ = uStack_2a90;
              auVar18._0_8_ = local_2a98;
              auVar55 = maxps(auVar18,ZEXT816(0));
              local_2a98 = auVar55._0_8_;
              uStack_2a90 = auVar55._8_8_;
              local_29a8 = local_2a98;
              uStack_29a0 = uStack_2a90;
              auVar19._8_8_ = 0x3f8000003f800000;
              auVar19._0_8_ = 0x3f8000003f800000;
              _local_2a98 = minps(auVar55,auVar19);
              local_2a28 = local_32d8;
              uStack_2a20 = uStack_32d0;
              local_2a18._0_4_ = local_2a98._0_4_;
              local_2a18._4_4_ = local_2a98._4_4_;
              fStack_2a10 = local_2a98._8_4_;
              fStack_2a0c = local_2a98._12_4_;
              local_32c8._4_4_ = (float)local_2a18._4_4_ * local_29f8._4_4_;
              local_32c8._0_4_ = (float)local_2a18._0_4_ * (float)local_29f8;
              uStack_32c0._0_4_ = fStack_2a10 * (float)uStack_29f0;
              uStack_32c0._4_4_ = fStack_2a0c * uStack_29f0._4_4_;
              fStack_32b4 = local_32b8;
              fStack_32b0 = local_32b8;
              fStack_32ac = local_32b8;
              local_329c = local_32b8;
              local_2a48 = local_3328;
              uStack_2a40 = uStack_3320;
              _local_2a18 = _local_2a98;
              local_2a08 = uVar1;
              uStack_2a00 = uVar2;
              local_29f8 = uVar3;
              uStack_29f0 = uVar4;
              local_29b8 = local_2aa8;
              uStack_29b0 = uStack_2aa0;
              break;
            default:
              uStack_32c0 = uStack_37a0;
              local_32c8 = (undefined1  [8])local_37a8;
            }
            local_37a8 = local_32c8;
            uStack_37a0 = uStack_32c0;
            local_3130 = local_3788;
            local_3148 = local_32c8;
            uStack_3140 = uStack_32c0;
            *(undefined1 (*) [8])local_3788 = local_32c8;
            *(undefined8 *)(local_3788 + 2) = uStack_32c0;
            local_3788 = local_3788 + 4;
          }
        }
      }
      if ((local_35e4 == 4) && (local_3644 == 1)) {
        for (local_383c = 0; local_383c < local_3658; local_383c = local_383c + 1) {
          local_3848 = ncnn::Mat::row(local_35c8,local_383c);
          for (local_384c = 0; local_384c < local_3654; local_384c = local_384c + 1) {
            local_3850 = 0.0;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) != 0) {
              pfVar51 = ncnn::Mat::operator[]
                                  ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 400),
                                   (long)local_383c);
              local_3850 = *pfVar51;
            }
            ncnn::Mat::channel(in_stack_ffffffffffffc2c8,
                               (int)((ulong)in_stack_ffffffffffffc2c0 >> 0x20));
            pfVar51 = ncnn::Mat::operator_cast_to_float_(&local_38a0);
            ncnn::Mat::~Mat((Mat *)0x919501);
            local_3858 = pfVar51;
            for (local_38a4 = 0; fVar60 = local_3850, local_38a4 < local_35d8;
                local_38a4 = local_38a4 + 1) {
              local_38b0 = ncnn::Mat::row(&local_3630,local_38a4);
              local_38b0 = local_38b0 +
                           local_384c * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
                           4;
              for (local_38b4 = 0;
                  local_38b4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_38b4 = local_38b4 + 1) {
                local_34c8 = local_38b0;
                uVar1 = *(undefined8 *)local_38b0;
                uVar2 = *(undefined8 *)(local_38b0 + 2);
                pfStack_34d0 = local_3858;
                uVar3 = *(undefined8 *)local_3858;
                uVar4 = *(undefined8 *)(local_3858 + 2);
                local_33d8._0_4_ = (float)uVar1;
                local_33d8._4_4_ = (float)((ulong)uVar1 >> 0x20);
                uStack_33d0._0_4_ = (float)uVar2;
                uStack_33d0._4_4_ = (float)((ulong)uVar2 >> 0x20);
                local_33e8._0_4_ = (float)uVar3;
                local_33e8._4_4_ = (float)((ulong)uVar3 >> 0x20);
                uStack_33e0._0_4_ = (float)uVar4;
                uStack_33e0._4_4_ = (float)((ulong)uVar4 >> 0x20);
                uStack_33d0._0_4_ = (float)uStack_33d0 * (float)uStack_33e0;
                uStack_33d0._4_4_ = uStack_33d0._4_4_ * uStack_33e0._4_4_;
                local_30e8 = CONCAT44(local_33d8._4_4_ * local_33e8._4_4_,
                                      (float)local_33d8 * (float)local_33e8);
                uStack_30e0 = CONCAT44(uStack_33d0._4_4_,(float)uStack_33d0);
                local_30f8 = (float)local_33d8 * (float)local_33e8 + (float)uStack_33d0;
                fStack_30f4 = local_33d8._4_4_ * local_33e8._4_4_ + uStack_33d0._4_4_;
                fStack_30f0 = (float)uStack_33d0 + (float)uStack_33d0;
                fStack_30ec = uStack_33d0._4_4_ + uStack_33d0._4_4_;
                local_28 = local_30f8 + fStack_30f4;
                local_3108 = CONCAT44(fStack_30f4,local_28);
                uStack_3100 = CONCAT44(fStack_30ec,fStack_30f0);
                local_3850 = local_28 + local_3850;
                local_38b0 = local_38b0 +
                             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) << 2);
                local_3858 = local_3858 + 4;
                local_33e8 = uVar3;
                uStack_33e0 = uVar4;
                local_33d8 = uVar1;
                uStack_33d0 = uVar2;
                local_30d8 = uStack_30e0;
                uStack_30d0 = uStack_30e0;
                local_30c8 = local_30e8;
                uStack_30c0 = uStack_30e0;
                local_58 = local_30e8;
                uStack_50 = uStack_30e0;
                local_48 = local_30e8;
                uStack_40 = uStack_30e0;
                local_38 = fStack_30f4;
                fStack_34 = fStack_30f4;
                fStack_30 = fStack_30f4;
                fStack_2c = fStack_30f4;
                fStack_24 = fStack_30f4;
                fStack_20 = fStack_30f0;
                fStack_1c = fStack_30ec;
                local_18 = local_3108;
                uStack_10 = uStack_3100;
              }
            }
            local_3060 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
            local_3068 = (Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
            local_305c = local_3850;
            switch(local_3060) {
            case 1:
              dVar54 = std::fmax((double)(ulong)(uint)local_3850,0.0);
              local_305c = SUB84(dVar54,0);
              break;
            case 2:
              pfVar51 = ncnn::Mat::operator[](local_3068,0);
              local_306c = *pfVar51;
              if (local_305c <= 0.0) {
                local_3d1c = local_305c * local_306c;
              }
              else {
                local_3d1c = local_305c;
              }
              local_305c = local_3d1c;
              break;
            case 3:
              pfVar51 = ncnn::Mat::operator[](local_3068,0);
              local_3070 = *pfVar51;
              pfVar51 = ncnn::Mat::operator[](local_3068,1);
              local_3074 = *pfVar51;
              if (local_305c < local_3070) {
                local_305c = local_3070;
              }
              if (local_3074 < local_305c) {
                local_305c = local_3074;
              }
              break;
            case 4:
              dVar54 = std::exp((double)(ulong)(uint)-local_3850);
              local_305c = 1.0 / (SUB84(dVar54,0) + 1.0);
              break;
            case 5:
              auVar56._0_8_ = std::exp((double)(ulong)(uint)local_3850);
              auVar56._8_8_ = extraout_XMM0_Qb;
              auVar57._4_12_ = auVar56._4_12_;
              auVar57._0_4_ = SUB84(auVar56._0_8_,0) + 1.0;
              dVar54 = std::log(auVar57._0_8_);
              dVar54 = std::tanh(dVar54);
              local_305c = fVar60 * SUB84(dVar54,0);
              break;
            case 6:
              pfVar51 = ncnn::Mat::operator[](local_3068,0);
              local_3078 = *pfVar51;
              pfVar51 = ncnn::Mat::operator[](local_3068,1);
              local_307c = *pfVar51;
              local_3080 = -local_307c / local_3078;
              local_3084 = 1.0 / local_3078 + local_3080;
              if (local_3080 <= local_305c) {
                if (local_305c <= local_3084) {
                  local_305c = local_305c * (local_305c * local_3078 + local_307c);
                }
              }
              else {
                local_305c = 0.0;
              }
            }
            local_3850 = local_305c;
            local_3848[local_384c] = local_305c;
          }
        }
      }
      if ((local_35e4 == 1) && (local_3644 == 1)) {
        for (local_38ec = 0; local_38ec < local_3658; local_38ec = local_38ec + 1) {
          pfVar51 = ncnn::Mat::row(local_35c8,local_38ec);
          for (local_38fc = 0; local_38fc < local_3654; local_38fc = local_38fc + 1) {
            local_3900 = 0.0;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) != 0) {
              pfVar52 = ncnn::Mat::operator[]
                                  ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 400),
                                   (long)local_38ec);
              local_3900 = *pfVar52;
            }
            local_3908 = ncnn::Mat::operator_cast_to_float_
                                   ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x148));
            local_3908 = local_3908 +
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) * local_35d8 *
                         local_38ec;
            for (local_390c = 0; local_390c < local_35d8; local_390c = local_390c + 1) {
              local_3918 = ncnn::Mat::row(&local_3630,local_390c);
              local_3918 = local_3918 +
                           local_38fc * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
              for (local_391c = 0;
                  local_391c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_391c = local_391c + 1) {
                local_3900 = *local_3918 * *local_3908 + local_3900;
                local_3918 = local_3918 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)
                ;
                local_3908 = local_3908 + 1;
              }
            }
            local_308c = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
            local_3098 = (Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
            local_3088 = local_3900;
            switch(local_308c) {
            case 1:
              dVar54 = std::fmax((double)(ulong)(uint)local_3900,0.0);
              local_3088 = SUB84(dVar54,0);
              break;
            case 2:
              pfVar52 = ncnn::Mat::operator[](local_3098,0);
              local_309c = *pfVar52;
              if (local_3088 <= 0.0) {
                local_3088 = local_3088 * local_309c;
              }
              break;
            case 3:
              pfVar52 = ncnn::Mat::operator[](local_3098,0);
              local_30a0 = *pfVar52;
              pfVar52 = ncnn::Mat::operator[](local_3098,1);
              local_30a4 = *pfVar52;
              if (local_3088 < local_30a0) {
                local_3088 = local_30a0;
              }
              if (local_30a4 < local_3088) {
                local_3088 = local_30a4;
              }
              break;
            case 4:
              dVar54 = std::exp((double)(ulong)(uint)-local_3900);
              local_3088 = 1.0 / (SUB84(dVar54,0) + 1.0);
              break;
            case 5:
              auVar58._0_8_ = std::exp((double)(ulong)(uint)local_3900);
              auVar58._8_8_ = extraout_XMM0_Qb_00;
              auVar59._4_12_ = auVar58._4_12_;
              auVar59._0_4_ = SUB84(auVar58._0_8_,0) + 1.0;
              dVar54 = std::log(auVar59._0_8_);
              dVar54 = std::tanh(dVar54);
              local_3088 = local_3900 * SUB84(dVar54,0);
              break;
            case 6:
              pfVar52 = ncnn::Mat::operator[](local_3098,0);
              local_30a8 = *pfVar52;
              pfVar52 = ncnn::Mat::operator[](local_3098,1);
              local_30ac = *pfVar52;
              local_30b0 = -local_30ac / local_30a8;
              local_30b4 = 1.0 / local_30a8 + local_30b0;
              if (local_30b0 <= local_3088) {
                if (local_3088 <= local_30b4) {
                  local_3088 = local_3088 * (local_3088 * local_30a8 + local_30ac);
                }
              }
              else {
                local_3088 = 0.0;
              }
            }
            pfVar51[local_38fc] = local_3088;
          }
        }
      }
      local_35ac = 0;
    }
  }
  local_3640 = 1;
  ncnn::Mat::~Mat((Mat *)0x91a199);
  return local_35ac;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}